

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O2

void embree::avx512::CurveNiMBIntersectorK<4,16>::
     intersect_t<embree::avx512::RibbonCurve1IntersectorK<embree::BezierCurveT,16,8>,embree::avx512::Intersect1KEpilogMU<8,16,true>>
               (Precalculations *pre,RayHitK<16> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  int iVar1;
  int iVar2;
  float *pfVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  undefined1 auVar6 [16];
  uint uVar7;
  int iVar8;
  undefined4 uVar9;
  __int_type_conflict _Var10;
  long lVar11;
  RTCFilterFunctionN p_Var12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  bool bVar26;
  float fVar27;
  undefined1 auVar28 [16];
  ulong uVar29;
  undefined8 uVar30;
  uint uVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  float fVar65;
  float fVar66;
  float fVar67;
  int iVar68;
  int iVar69;
  int iVar70;
  int iVar71;
  int iVar72;
  int iVar73;
  int iVar74;
  int iVar75;
  int iVar76;
  int iVar77;
  int iVar78;
  int iVar79;
  int iVar80;
  undefined1 auVar81 [32];
  byte bVar82;
  ulong uVar83;
  uint uVar84;
  ulong uVar85;
  long lVar86;
  long lVar87;
  Geometry *pGVar88;
  long lVar89;
  byte bVar90;
  uint uVar91;
  ulong uVar92;
  float fVar93;
  float fVar94;
  float fVar156;
  float fVar158;
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar113 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  float fVar157;
  float fVar159;
  float fVar161;
  float fVar162;
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar114 [16];
  float fVar160;
  float fVar163;
  float fVar164;
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [64];
  vint4 bi_2;
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [64];
  undefined4 uVar178;
  float fVar179;
  undefined8 uVar180;
  vint4 bi_1;
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [32];
  float fVar185;
  float fVar186;
  float fVar194;
  vint4 bi;
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  vint4 ai_2;
  undefined1 auVar207 [16];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  undefined1 auVar212 [64];
  vint4 ai;
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [64];
  undefined1 auVar220 [64];
  vint4 ai_1;
  undefined1 auVar221 [16];
  undefined1 auVar222 [64];
  undefined1 auVar223 [64];
  float fVar225;
  float fVar226;
  undefined1 auVar224 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [32];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [32];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [32];
  undefined1 auVar238 [32];
  undefined1 auVar239 [16];
  undefined1 auVar240 [64];
  RTCFilterFunctionNArguments args;
  vint<16> mask;
  undefined8 local_870;
  undefined8 uStack_868;
  undefined8 local_860;
  undefined8 uStack_858;
  undefined8 local_850;
  undefined8 uStack_848;
  undefined8 local_840;
  undefined8 uStack_838;
  RTCFilterFunctionNArguments local_830;
  undefined1 local_800 [16];
  Geometry *local_7f0;
  undefined1 (*local_7e8) [32];
  Precalculations *local_7e0;
  ulong local_7d8;
  LinearSpace3fa *local_7d0;
  ulong local_7c8;
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined4 local_760;
  undefined4 uStack_75c;
  undefined4 uStack_758;
  undefined4 uStack_754;
  undefined4 uStack_750;
  undefined4 uStack_74c;
  undefined4 uStack_748;
  undefined4 uStack_744;
  undefined1 local_740 [64];
  undefined1 local_6e0 [8];
  float fStack_6d8;
  float fStack_6d4;
  float fStack_6d0;
  float fStack_6cc;
  float fStack_6c8;
  undefined4 uStack_6c4;
  undefined1 local_6c0 [8];
  float fStack_6b8;
  float fStack_6b4;
  float fStack_6b0;
  float fStack_6ac;
  float fStack_6a8;
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined4 local_580;
  int local_57c;
  undefined8 local_570;
  undefined8 uStack_568;
  undefined8 local_560;
  undefined8 uStack_558;
  undefined8 local_550;
  undefined8 uStack_548;
  undefined8 local_540;
  undefined8 uStack_538;
  float local_520 [4];
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  float fStack_504;
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4b0 [16];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  float local_420;
  float fStack_41c;
  float fStack_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  float fStack_404;
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [64];
  undefined1 local_340 [64];
  undefined1 local_300 [64];
  RTCHitN local_2c0 [64];
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  undefined1 local_1c0 [64];
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 uStack_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined1 local_140 [64];
  undefined1 local_100 [64];
  undefined1 local_c0 [64];
  
  uVar83 = (ulong)(byte)prim[1];
  lVar89 = uVar83 * 0x25;
  auVar28 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar83 * 4 + 6)));
  auVar103 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar83 * 5 + 6)));
  auVar99 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar83 * 6 + 6)));
  auVar100 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar83 * 0xf + 6)));
  auVar101 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)prim[1] * 0x10 + 6)));
  auVar102 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar83 * 0x11 + 6)));
  auVar104 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar83 * 0x1a + 6)));
  auVar105 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar83 * 0x1b + 6)));
  auVar106 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar83 * 0x1c + 6)));
  uVar178 = *(undefined4 *)(prim + lVar89 + 0x12);
  auVar236._4_4_ = uVar178;
  auVar236._0_4_ = uVar178;
  auVar236._8_4_ = uVar178;
  auVar236._12_4_ = uVar178;
  auVar107 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                           0x10);
  auVar107 = vinsertps_avx(auVar107,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x20);
  auVar95 = vsubps_avx512vl(auVar107,*(undefined1 (*) [16])(prim + lVar89 + 6));
  fVar27 = (*(float *)(ray + k * 4 + 0x1c0) - *(float *)(prim + lVar89 + 0x16)) *
           *(float *)(prim + lVar89 + 0x1a);
  auVar107._8_8_ = 0;
  auVar107._0_8_ = *(ulong *)(prim + uVar83 * 7 + 6);
  auVar239 = vpmovsxwd_avx(auVar107);
  auVar110._8_8_ = 0;
  auVar110._0_8_ = *(ulong *)(prim + uVar83 * 0xb + 6);
  auVar113 = vpmovsxwd_avx(auVar110);
  auVar109._8_8_ = 0;
  auVar109._0_8_ = *(ulong *)(prim + uVar83 * 9 + 6);
  auVar114 = vpmovsxwd_avx(auVar109);
  auVar108._8_8_ = 0;
  auVar108._0_8_ = *(ulong *)(prim + uVar83 * 0xd + 6);
  auVar182 = vpmovsxwd_avx(auVar108);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + uVar83 * 0x12 + 6);
  auVar6 = vpmovsxwd_avx(auVar6);
  auVar107 = vinsertps_avx512f(ZEXT416(*(uint *)(ray + k * 4 + 0x100)),
                               ZEXT416(*(uint *)(ray + k * 4 + 0x140)),0x10);
  auVar107 = vinsertps_avx512f(auVar107,ZEXT416(*(uint *)(ray + k * 4 + 0x180)),0x20);
  auVar95 = vmulps_avx512vl(auVar236,auVar95);
  auVar96 = vmulps_avx512vl(auVar236,auVar107);
  auVar97 = vcvtdq2ps_avx512vl(auVar28);
  auVar98 = vcvtdq2ps_avx512vl(auVar103);
  auVar99 = vcvtdq2ps_avx512vl(auVar99);
  auVar100 = vcvtdq2ps_avx512vl(auVar100);
  auVar101 = vcvtdq2ps_avx512vl(auVar101);
  auVar107 = vcvtdq2ps_avx(auVar102);
  auVar110 = vcvtdq2ps_avx(auVar104);
  auVar109 = vcvtdq2ps_avx(auVar105);
  auVar108 = vcvtdq2ps_avx(auVar106);
  uVar178 = auVar96._0_4_;
  auVar207._4_4_ = uVar178;
  auVar207._0_4_ = uVar178;
  auVar207._8_4_ = uVar178;
  auVar207._12_4_ = uVar178;
  auVar28 = vshufps_avx(auVar96,auVar96,0x55);
  auVar103 = vshufps_avx(auVar96,auVar96,0xaa);
  auVar102 = vmulps_avx512vl(auVar103,auVar99);
  auVar181._0_4_ = auVar103._0_4_ * auVar107._0_4_;
  auVar181._4_4_ = auVar103._4_4_ * auVar107._4_4_;
  auVar181._8_4_ = auVar103._8_4_ * auVar107._8_4_;
  auVar181._12_4_ = auVar103._12_4_ * auVar107._12_4_;
  auVar96._0_4_ = auVar108._0_4_ * auVar103._0_4_;
  auVar96._4_4_ = auVar108._4_4_ * auVar103._4_4_;
  auVar96._8_4_ = auVar108._8_4_ * auVar103._8_4_;
  auVar96._12_4_ = auVar108._12_4_ * auVar103._12_4_;
  auVar103 = vfmadd231ps_avx512vl(auVar102,auVar28,auVar98);
  auVar102 = vfmadd231ps_avx512vl(auVar181,auVar28,auVar101);
  auVar28 = vfmadd231ps_fma(auVar96,auVar109,auVar28);
  auVar103 = vfmadd231ps_avx512vl(auVar103,auVar207,auVar97);
  auVar102 = vfmadd231ps_avx512vl(auVar102,auVar207,auVar100);
  auVar28 = vfmadd231ps_fma(auVar28,auVar110,auVar207);
  auVar104 = vbroadcastss_avx512vl(auVar95);
  auVar105 = vshufps_avx512vl(auVar95,auVar95,0x55);
  auVar106 = vshufps_avx512vl(auVar95,auVar95,0xaa);
  auVar99 = vmulps_avx512vl(auVar106,auVar99);
  auVar107 = vmulps_avx512vl(auVar106,auVar107);
  auVar108 = vmulps_avx512vl(auVar106,auVar108);
  auVar99 = vfmadd231ps_avx512vl(auVar99,auVar105,auVar98);
  auVar107 = vfmadd231ps_avx512vl(auVar107,auVar105,auVar101);
  auVar109 = vfmadd231ps_avx512vl(auVar108,auVar105,auVar109);
  auVar96 = vfmadd231ps_avx512vl(auVar99,auVar104,auVar97);
  auVar97 = vfmadd231ps_avx512vl(auVar107,auVar104,auVar100);
  auVar95 = vfmadd231ps_fma(auVar109,auVar104,auVar110);
  auVar107 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar240 = ZEXT1664(auVar107);
  auVar110 = vandps_avx512vl(auVar103,auVar107);
  auVar234._8_4_ = 0x219392ef;
  auVar234._0_8_ = 0x219392ef219392ef;
  auVar234._12_4_ = 0x219392ef;
  uVar85 = vcmpps_avx512vl(auVar110,auVar234,1);
  bVar13 = (bool)((byte)uVar85 & 1);
  auVar98._0_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar103._0_4_;
  bVar13 = (bool)((byte)(uVar85 >> 1) & 1);
  auVar98._4_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar103._4_4_;
  bVar13 = (bool)((byte)(uVar85 >> 2) & 1);
  auVar98._8_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar103._8_4_;
  bVar13 = (bool)((byte)(uVar85 >> 3) & 1);
  auVar98._12_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar103._12_4_;
  auVar110 = vandps_avx512vl(auVar102,auVar107);
  uVar85 = vcmpps_avx512vl(auVar110,auVar234,1);
  bVar13 = (bool)((byte)uVar85 & 1);
  auVar111._0_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar102._0_4_;
  bVar13 = (bool)((byte)(uVar85 >> 1) & 1);
  auVar111._4_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar102._4_4_;
  bVar13 = (bool)((byte)(uVar85 >> 2) & 1);
  auVar111._8_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar102._8_4_;
  bVar13 = (bool)((byte)(uVar85 >> 3) & 1);
  auVar111._12_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar102._12_4_;
  auVar107 = vandps_avx512vl(auVar28,auVar107);
  uVar85 = vcmpps_avx512vl(auVar107,auVar234,1);
  bVar13 = (bool)((byte)uVar85 & 1);
  auVar112._0_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar28._0_4_;
  bVar13 = (bool)((byte)(uVar85 >> 1) & 1);
  auVar112._4_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar28._4_4_;
  bVar13 = (bool)((byte)(uVar85 >> 2) & 1);
  auVar112._8_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar28._8_4_;
  bVar13 = (bool)((byte)(uVar85 >> 3) & 1);
  auVar112._12_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar28._12_4_;
  auVar230._8_4_ = 0x3f800000;
  auVar230._0_8_ = 0x3f8000003f800000;
  auVar230._12_4_ = 0x3f800000;
  auVar110 = vrcp14ps_avx512vl(auVar98);
  auVar107 = vfnmadd213ps_fma(auVar98,auVar110,auVar230);
  auVar109 = vfmadd132ps_fma(auVar107,auVar110,auVar110);
  auVar110 = vrcp14ps_avx512vl(auVar111);
  auVar107 = vfnmadd213ps_fma(auVar111,auVar110,auVar230);
  auVar108 = vfmadd132ps_fma(auVar107,auVar110,auVar110);
  auVar110 = vrcp14ps_avx512vl(auVar112);
  auVar107 = vfnmadd213ps_fma(auVar112,auVar110,auVar230);
  auVar105 = vfmadd132ps_fma(auVar107,auVar110,auVar110);
  auVar213._4_4_ = fVar27;
  auVar213._0_4_ = fVar27;
  auVar213._8_4_ = fVar27;
  auVar213._12_4_ = fVar27;
  auVar107 = vcvtdq2ps_avx(auVar239);
  auVar110 = vcvtdq2ps_avx(auVar113);
  auVar110 = vsubps_avx(auVar110,auVar107);
  auVar106 = vfmadd213ps_fma(auVar110,auVar213,auVar107);
  auVar107 = vcvtdq2ps_avx(auVar114);
  auVar110 = vcvtdq2ps_avx(auVar182);
  auVar110 = vsubps_avx(auVar110,auVar107);
  auVar239 = vfmadd213ps_fma(auVar110,auVar213,auVar107);
  auVar107 = vcvtdq2ps_avx(auVar6);
  auVar28._8_8_ = 0;
  auVar28._0_8_ = *(ulong *)(prim + uVar83 * 0x16 + 6);
  auVar110 = vpmovsxwd_avx(auVar28);
  auVar110 = vcvtdq2ps_avx(auVar110);
  auVar110 = vsubps_avx(auVar110,auVar107);
  auVar6 = vfmadd213ps_fma(auVar110,auVar213,auVar107);
  auVar103._8_8_ = 0;
  auVar103._0_8_ = *(ulong *)(prim + uVar83 * 0x14 + 6);
  auVar107 = vpmovsxwd_avx(auVar103);
  auVar107 = vcvtdq2ps_avx(auVar107);
  auVar99._8_8_ = 0;
  auVar99._0_8_ = *(ulong *)(prim + uVar83 * 0x18 + 6);
  auVar110 = vpmovsxwd_avx(auVar99);
  auVar110 = vcvtdq2ps_avx(auVar110);
  auVar110 = vsubps_avx(auVar110,auVar107);
  auVar28 = vfmadd213ps_fma(auVar110,auVar213,auVar107);
  auVar100._8_8_ = 0;
  auVar100._0_8_ = *(ulong *)(prim + uVar83 * 0x1d + 6);
  auVar107 = vpmovsxwd_avx(auVar100);
  auVar101._8_8_ = 0;
  auVar101._0_8_ = *(ulong *)(prim + uVar83 * 0x21 + 6);
  auVar110 = vpmovsxwd_avx(auVar101);
  auVar107 = vcvtdq2ps_avx(auVar107);
  auVar110 = vcvtdq2ps_avx(auVar110);
  auVar110 = vsubps_avx(auVar110,auVar107);
  auVar103 = vfmadd213ps_fma(auVar110,auVar213,auVar107);
  auVar102._8_8_ = 0;
  auVar102._0_8_ = *(ulong *)(prim + uVar83 * 0x1f + 6);
  auVar107 = vpmovsxwd_avx(auVar102);
  auVar107 = vcvtdq2ps_avx(auVar107);
  auVar104._8_8_ = 0;
  auVar104._0_8_ = *(ulong *)(prim + uVar83 * 0x23 + 6);
  auVar110 = vpmovsxwd_avx(auVar104);
  auVar110 = vcvtdq2ps_avx(auVar110);
  auVar110 = vsubps_avx(auVar110,auVar107);
  auVar110 = vfmadd213ps_fma(auVar110,auVar213,auVar107);
  auVar107 = vsubps_avx(auVar106,auVar96);
  auVar214._0_4_ = auVar109._0_4_ * auVar107._0_4_;
  auVar214._4_4_ = auVar109._4_4_ * auVar107._4_4_;
  auVar214._8_4_ = auVar109._8_4_ * auVar107._8_4_;
  auVar214._12_4_ = auVar109._12_4_ * auVar107._12_4_;
  auVar107 = vsubps_avx(auVar239,auVar96);
  auVar187._0_4_ = auVar109._0_4_ * auVar107._0_4_;
  auVar187._4_4_ = auVar109._4_4_ * auVar107._4_4_;
  auVar187._8_4_ = auVar109._8_4_ * auVar107._8_4_;
  auVar187._12_4_ = auVar109._12_4_ * auVar107._12_4_;
  auVar107 = vsubps_avx(auVar6,auVar97);
  auVar221._0_4_ = auVar108._0_4_ * auVar107._0_4_;
  auVar221._4_4_ = auVar108._4_4_ * auVar107._4_4_;
  auVar221._8_4_ = auVar108._8_4_ * auVar107._8_4_;
  auVar221._12_4_ = auVar108._12_4_ * auVar107._12_4_;
  auVar107 = vsubps_avx(auVar28,auVar97);
  auVar182._0_4_ = auVar108._0_4_ * auVar107._0_4_;
  auVar182._4_4_ = auVar108._4_4_ * auVar107._4_4_;
  auVar182._8_4_ = auVar108._8_4_ * auVar107._8_4_;
  auVar182._12_4_ = auVar108._12_4_ * auVar107._12_4_;
  auVar107 = vsubps_avx(auVar103,auVar95);
  auVar97._0_4_ = auVar105._0_4_ * auVar107._0_4_;
  auVar97._4_4_ = auVar105._4_4_ * auVar107._4_4_;
  auVar97._8_4_ = auVar105._8_4_ * auVar107._8_4_;
  auVar97._12_4_ = auVar105._12_4_ * auVar107._12_4_;
  auVar107 = vsubps_avx(auVar110,auVar95);
  auVar114._0_4_ = auVar105._0_4_ * auVar107._0_4_;
  auVar114._4_4_ = auVar105._4_4_ * auVar107._4_4_;
  auVar114._8_4_ = auVar105._8_4_ * auVar107._8_4_;
  auVar114._12_4_ = auVar105._12_4_ * auVar107._12_4_;
  auVar107 = vpminsd_avx(auVar214,auVar187);
  auVar110 = vpminsd_avx(auVar221,auVar182);
  auVar107 = vmaxps_avx(auVar107,auVar110);
  auVar110 = vpminsd_avx(auVar97,auVar114);
  uVar178 = *(undefined4 *)(ray + k * 4 + 0xc0);
  auVar105._4_4_ = uVar178;
  auVar105._0_4_ = uVar178;
  auVar105._8_4_ = uVar178;
  auVar105._12_4_ = uVar178;
  auVar110 = vmaxps_avx512vl(auVar110,auVar105);
  auVar107 = vmaxps_avx(auVar107,auVar110);
  auVar106._8_4_ = 0x3f7ffffa;
  auVar106._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar106._12_4_ = 0x3f7ffffa;
  local_4b0 = vmulps_avx512vl(auVar107,auVar106);
  auVar107 = vpmaxsd_avx(auVar214,auVar187);
  auVar110 = vpmaxsd_avx(auVar221,auVar182);
  auVar107 = vminps_avx(auVar107,auVar110);
  auVar110 = vpmaxsd_avx(auVar97,auVar114);
  uVar178 = *(undefined4 *)(ray + k * 4 + 0x200);
  auVar239._4_4_ = uVar178;
  auVar239._0_4_ = uVar178;
  auVar239._8_4_ = uVar178;
  auVar239._12_4_ = uVar178;
  auVar110 = vminps_avx512vl(auVar110,auVar239);
  auVar107 = vminps_avx(auVar107,auVar110);
  auVar113._8_4_ = 0x3f800003;
  auVar113._0_8_ = 0x3f8000033f800003;
  auVar113._12_4_ = 0x3f800003;
  auVar107 = vmulps_avx512vl(auVar107,auVar113);
  auVar110 = vpbroadcastd_avx512vl();
  uVar180 = vcmpps_avx512vl(local_4b0,auVar107,2);
  uVar30 = vpcmpgtd_avx512vl(auVar110,_DAT_01f4ad30);
  local_7c8 = (ulong)((byte)uVar180 & 0xf & (byte)uVar30);
  local_7d0 = pre->ray_space + k;
  local_7e8 = (undefined1 (*) [32])local_100;
  auVar177 = vpmovm2d_avx512dq((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_380 = vmovdqa64_avx512f(auVar177);
  auVar177 = ZEXT464(0xbf800000);
  local_7e0 = pre;
  do {
    if (local_7c8 == 0) {
      return;
    }
    lVar89 = 0;
    for (uVar85 = local_7c8; (uVar85 & 1) == 0; uVar85 = uVar85 >> 1 | 0x8000000000000000) {
      lVar89 = lVar89 + 1;
    }
    uVar7 = *(uint *)(prim + 2);
    uVar91 = *(uint *)(prim + lVar89 * 4 + 6);
    uVar85 = (ulong)uVar91;
    pGVar88 = (context->scene->geometries).items[uVar7].ptr;
    uVar83 = (ulong)*(uint *)(*(long *)&pGVar88->field_0x58 +
                             uVar85 * pGVar88[1].super_RefCount.refCounter.
                                      super___atomic_base<unsigned_long>._M_i);
    fVar27 = (pGVar88->time_range).lower;
    fVar27 = pGVar88->fnumTimeSegments *
             ((*(float *)(ray + k * 4 + 0x1c0) - fVar27) / ((pGVar88->time_range).upper - fVar27));
    auVar107 = vroundss_avx(ZEXT416((uint)fVar27),ZEXT416((uint)fVar27),9);
    auVar110 = vaddss_avx512f(ZEXT416((uint)pGVar88->fnumTimeSegments),auVar177._0_16_);
    auVar107 = vminss_avx(auVar107,auVar110);
    auVar107 = vmaxss_avx(ZEXT816(0) << 0x20,auVar107);
    fVar27 = fVar27 - auVar107._0_4_;
    _Var10 = pGVar88[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    lVar87 = (long)(int)auVar107._0_4_ * 0x38;
    lVar89 = *(long *)(_Var10 + 0x10 + lVar87);
    lVar86 = *(long *)(_Var10 + 0x38 + lVar87);
    lVar11 = *(long *)(_Var10 + 0x48 + lVar87);
    auVar183._4_4_ = fVar27;
    auVar183._0_4_ = fVar27;
    auVar183._8_4_ = fVar27;
    auVar183._12_4_ = fVar27;
    pfVar3 = (float *)(lVar86 + uVar83 * lVar11);
    auVar231._0_4_ = fVar27 * *pfVar3;
    auVar231._4_4_ = fVar27 * pfVar3[1];
    auVar231._8_4_ = fVar27 * pfVar3[2];
    auVar231._12_4_ = fVar27 * pfVar3[3];
    pfVar3 = (float *)(lVar86 + (uVar83 + 1) * lVar11);
    auVar235._0_4_ = fVar27 * *pfVar3;
    auVar235._4_4_ = fVar27 * pfVar3[1];
    auVar235._8_4_ = fVar27 * pfVar3[2];
    auVar235._12_4_ = fVar27 * pfVar3[3];
    auVar107 = vmulps_avx512vl(auVar183,*(undefined1 (*) [16])(lVar86 + (uVar83 + 2) * lVar11));
    auVar110 = vmulps_avx512vl(auVar183,*(undefined1 (*) [16])(lVar86 + lVar11 * (uVar83 + 3)));
    lVar86 = *(long *)(_Var10 + lVar87);
    fVar27 = 1.0 - fVar27;
    auVar95._4_4_ = fVar27;
    auVar95._0_4_ = fVar27;
    auVar95._8_4_ = fVar27;
    auVar95._12_4_ = fVar27;
    auVar108 = vfmadd231ps_fma(auVar231,auVar95,*(undefined1 (*) [16])(lVar86 + lVar89 * uVar83));
    auVar6 = vfmadd231ps_fma(auVar235,auVar95,*(undefined1 (*) [16])(lVar86 + lVar89 * (uVar83 + 1))
                            );
    auVar104 = vfmadd231ps_avx512vl
                         (auVar107,auVar95,*(undefined1 (*) [16])(lVar86 + lVar89 * (uVar83 + 2)));
    auVar105 = vfmadd231ps_avx512vl
                         (auVar110,auVar95,*(undefined1 (*) [16])(lVar86 + lVar89 * (uVar83 + 3)));
    iVar8 = (int)pGVar88[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    auVar107 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                             0x1c);
    auVar107 = vinsertps_avx(auVar107,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x28);
    auVar109 = vsubps_avx(auVar108,auVar107);
    uVar178 = auVar109._0_4_;
    auVar195._4_4_ = uVar178;
    auVar195._0_4_ = uVar178;
    auVar195._8_4_ = uVar178;
    auVar195._12_4_ = uVar178;
    auVar110 = vshufps_avx(auVar109,auVar109,0x55);
    aVar4 = (local_7d0->vx).field_0;
    aVar5 = (local_7d0->vy).field_0;
    auVar109 = vshufps_avx(auVar109,auVar109,0xaa);
    fVar27 = (local_7d0->vz).field_0.m128[0];
    fVar65 = *(float *)((long)&(local_7d0->vz).field_0 + 4);
    fVar66 = *(float *)((long)&(local_7d0->vz).field_0 + 8);
    fVar67 = *(float *)((long)&(local_7d0->vz).field_0 + 0xc);
    auVar224._0_4_ = fVar27 * auVar109._0_4_;
    auVar224._4_4_ = fVar65 * auVar109._4_4_;
    auVar224._8_4_ = fVar66 * auVar109._8_4_;
    auVar224._12_4_ = fVar67 * auVar109._12_4_;
    auVar110 = vfmadd231ps_fma(auVar224,(undefined1  [16])aVar5,auVar110);
    auVar28 = vfmadd231ps_fma(auVar110,(undefined1  [16])aVar4,auVar195);
    auVar109 = vsubps_avx(auVar6,auVar107);
    uVar178 = auVar109._0_4_;
    auVar196._4_4_ = uVar178;
    auVar196._0_4_ = uVar178;
    auVar196._8_4_ = uVar178;
    auVar196._12_4_ = uVar178;
    auVar110 = vshufps_avx(auVar109,auVar109,0x55);
    auVar109 = vshufps_avx(auVar109,auVar109,0xaa);
    auVar227._0_4_ = fVar27 * auVar109._0_4_;
    auVar227._4_4_ = fVar65 * auVar109._4_4_;
    auVar227._8_4_ = fVar66 * auVar109._8_4_;
    auVar227._12_4_ = fVar67 * auVar109._12_4_;
    auVar110 = vfmadd231ps_fma(auVar227,(undefined1  [16])aVar5,auVar110);
    auVar103 = vfmadd231ps_fma(auVar110,(undefined1  [16])aVar4,auVar196);
    auVar109 = vsubps_avx512vl(auVar104,auVar107);
    uVar178 = auVar109._0_4_;
    auVar197._4_4_ = uVar178;
    auVar197._0_4_ = uVar178;
    auVar197._8_4_ = uVar178;
    auVar197._12_4_ = uVar178;
    auVar110 = vshufps_avx(auVar109,auVar109,0x55);
    auVar109 = vshufps_avx(auVar109,auVar109,0xaa);
    auVar229._0_4_ = fVar27 * auVar109._0_4_;
    auVar229._4_4_ = fVar65 * auVar109._4_4_;
    auVar229._8_4_ = fVar66 * auVar109._8_4_;
    auVar229._12_4_ = fVar67 * auVar109._12_4_;
    auVar110 = vfmadd231ps_fma(auVar229,(undefined1  [16])aVar5,auVar110);
    auVar109 = vfmadd231ps_fma(auVar110,(undefined1  [16])aVar4,auVar197);
    auVar110 = vsubps_avx512vl(auVar105,auVar107);
    uVar178 = auVar110._0_4_;
    auVar198._4_4_ = uVar178;
    auVar198._0_4_ = uVar178;
    auVar198._8_4_ = uVar178;
    auVar198._12_4_ = uVar178;
    auVar107 = vshufps_avx(auVar110,auVar110,0x55);
    auVar110 = vshufps_avx(auVar110,auVar110,0xaa);
    auVar233._0_4_ = fVar27 * auVar110._0_4_;
    auVar233._4_4_ = fVar65 * auVar110._4_4_;
    auVar233._8_4_ = fVar66 * auVar110._8_4_;
    auVar233._12_4_ = fVar67 * auVar110._12_4_;
    auVar107 = vfmadd231ps_fma(auVar233,(undefined1  [16])aVar5,auVar107);
    lVar89 = (long)iVar8 * 0x44;
    auVar129 = *(undefined1 (*) [32])(bezier_basis0 + lVar89);
    auVar99 = vfmadd231ps_fma(auVar107,(undefined1  [16])aVar4,auVar198);
    uVar178 = auVar28._0_4_;
    local_600._4_4_ = uVar178;
    local_600._0_4_ = uVar178;
    local_600._8_4_ = uVar178;
    local_600._12_4_ = uVar178;
    local_600._16_4_ = uVar178;
    local_600._20_4_ = uVar178;
    local_600._24_4_ = uVar178;
    local_600._28_4_ = uVar178;
    auVar115._8_4_ = 1;
    auVar115._0_8_ = 0x100000001;
    auVar115._12_4_ = 1;
    auVar115._16_4_ = 1;
    auVar115._20_4_ = 1;
    auVar115._24_4_ = 1;
    auVar115._28_4_ = 1;
    local_620 = vpermps_avx2(auVar115,ZEXT1632(auVar28));
    auVar130 = *(undefined1 (*) [32])(bezier_basis0 + lVar89 + 0x484);
    uVar178 = auVar103._0_4_;
    auVar199._4_4_ = uVar178;
    auVar199._0_4_ = uVar178;
    auVar199._8_4_ = uVar178;
    auVar199._12_4_ = uVar178;
    local_640._16_4_ = uVar178;
    local_640._0_16_ = auVar199;
    local_640._20_4_ = uVar178;
    local_640._24_4_ = uVar178;
    local_640._28_4_ = uVar178;
    local_660 = vpermps_avx512vl(auVar115,ZEXT1632(auVar103));
    auVar128 = *(undefined1 (*) [32])(bezier_basis0 + lVar89 + 0x908);
    local_680 = vbroadcastss_avx512vl(auVar109);
    auVar127 = *(undefined1 (*) [32])(bezier_basis0 + lVar89 + 0xd8c);
    local_6a0 = vpermps_avx512vl(auVar115,ZEXT1632(auVar109));
    uVar178 = auVar99._0_4_;
    local_6c0._4_4_ = uVar178;
    local_6c0._0_4_ = uVar178;
    fStack_6b8 = (float)uVar178;
    fStack_6b4 = (float)uVar178;
    fStack_6b0 = (float)uVar178;
    fStack_6ac = (float)uVar178;
    fStack_6a8 = (float)uVar178;
    register0x0000139c = uVar178;
    _local_6e0 = vpermps_avx512vl(auVar115,ZEXT1632(auVar99));
    auVar115 = vmulps_avx512vl(_local_6c0,auVar127);
    auVar116 = vmulps_avx512vl(_local_6e0,auVar127);
    auVar115 = vfmadd231ps_avx512vl(auVar115,auVar128,local_680);
    auVar116 = vfmadd231ps_avx512vl(auVar116,auVar128,local_6a0);
    auVar107 = vfmadd231ps_fma(auVar115,auVar130,local_640);
    auVar117 = vfmadd231ps_avx512vl(auVar116,auVar130,local_660);
    auVar118 = vfmadd231ps_avx512vl(ZEXT1632(auVar107),auVar129,local_600);
    auVar219 = ZEXT3264(auVar118);
    auVar115 = *(undefined1 (*) [32])(bezier_basis1 + lVar89);
    auVar116 = *(undefined1 (*) [32])(bezier_basis1 + lVar89 + 0x484);
    auVar126 = *(undefined1 (*) [32])(bezier_basis1 + lVar89 + 0x908);
    auVar125 = *(undefined1 (*) [32])(bezier_basis1 + lVar89 + 0xd8c);
    auVar117 = vfmadd231ps_avx512vl(auVar117,auVar129,local_620);
    auVar212 = ZEXT3264(auVar117);
    auVar119 = vmulps_avx512vl(_local_6c0,auVar125);
    auVar120 = vmulps_avx512vl(_local_6e0,auVar125);
    auVar119 = vfmadd231ps_avx512vl(auVar119,auVar126,local_680);
    auVar120 = vfmadd231ps_avx512vl(auVar120,auVar126,local_6a0);
    auVar119 = vfmadd231ps_avx512vl(auVar119,auVar116,local_640);
    auVar120 = vfmadd231ps_avx512vl(auVar120,auVar116,local_660);
    auVar100 = vfmadd231ps_fma(auVar119,auVar115,local_600);
    auVar222 = ZEXT1664(auVar100);
    auVar101 = vfmadd231ps_fma(auVar120,auVar115,local_620);
    auVar119 = vsubps_avx512vl(ZEXT1632(auVar100),auVar118);
    auVar120 = vsubps_avx512vl(ZEXT1632(auVar101),auVar117);
    auVar121 = vmulps_avx512vl(auVar117,auVar119);
    auVar122 = vmulps_avx512vl(auVar118,auVar120);
    auVar121 = vsubps_avx512vl(auVar121,auVar122);
    auVar107 = vshufps_avx(auVar108,auVar108,0xff);
    uVar180 = auVar107._0_8_;
    local_3a0._8_8_ = uVar180;
    local_3a0._0_8_ = uVar180;
    local_3a0._16_8_ = uVar180;
    local_3a0._24_8_ = uVar180;
    auVar107 = vshufps_avx(auVar6,auVar6,0xff);
    local_3c0 = vbroadcastsd_avx512vl(auVar107);
    auVar107 = vshufps_avx512vl(auVar104,auVar104,0xff);
    local_3e0 = vbroadcastsd_avx512vl(auVar107);
    auVar107 = vshufps_avx512vl(auVar105,auVar105,0xff);
    uVar180 = auVar107._0_8_;
    local_400._8_8_ = uVar180;
    local_400._0_8_ = uVar180;
    local_400._16_8_ = uVar180;
    local_400._24_8_ = uVar180;
    auVar122 = vmulps_avx512vl(local_400,auVar127);
    auVar122 = vfmadd231ps_avx512vl(auVar122,auVar128,local_3e0);
    auVar122 = vfmadd231ps_avx512vl(auVar122,auVar130,local_3c0);
    auVar122 = vfmadd231ps_avx512vl(auVar122,auVar129,local_3a0);
    auVar123 = vmulps_avx512vl(local_400,auVar125);
    auVar123 = vfmadd231ps_avx512vl(auVar123,auVar126,local_3e0);
    auVar123 = vfmadd231ps_avx512vl(auVar123,auVar116,local_3c0);
    auVar102 = vfmadd231ps_fma(auVar123,auVar115,local_3a0);
    auVar123 = vmulps_avx512vl(auVar120,auVar120);
    auVar123 = vfmadd231ps_avx512vl(auVar123,auVar119,auVar119);
    auVar124 = vmaxps_avx512vl(auVar122,ZEXT1632(auVar102));
    auVar124 = vmulps_avx512vl(auVar124,auVar124);
    auVar123 = vmulps_avx512vl(auVar124,auVar123);
    auVar121 = vmulps_avx512vl(auVar121,auVar121);
    uVar180 = vcmpps_avx512vl(auVar121,auVar123,2);
    auVar107 = vblendps_avx(auVar28,auVar108,8);
    auVar239 = auVar240._0_16_;
    auVar110 = vandps_avx512vl(auVar107,auVar239);
    auVar107 = vblendps_avx(auVar103,auVar6,8);
    auVar107 = vandps_avx512vl(auVar107,auVar239);
    auVar110 = vmaxps_avx(auVar110,auVar107);
    auVar107 = vblendps_avx(auVar109,auVar104,8);
    auVar106 = vandps_avx512vl(auVar107,auVar239);
    auVar107 = vblendps_avx(auVar99,auVar105,8);
    auVar107 = vandps_avx512vl(auVar107,auVar239);
    auVar107 = vmaxps_avx(auVar106,auVar107);
    auVar107 = vmaxps_avx(auVar110,auVar107);
    auVar110 = vmovshdup_avx(auVar107);
    auVar110 = vmaxss_avx(auVar110,auVar107);
    auVar107 = vshufpd_avx(auVar107,auVar107,1);
    auVar107 = vmaxss_avx(auVar107,auVar110);
    auVar110 = vcvtsi2ss_avx512f(auVar239,iVar8);
    local_7c0._0_16_ = auVar110;
    auVar123._0_4_ = auVar110._0_4_;
    auVar123._4_4_ = auVar123._0_4_;
    auVar123._8_4_ = auVar123._0_4_;
    auVar123._12_4_ = auVar123._0_4_;
    auVar123._16_4_ = auVar123._0_4_;
    auVar123._20_4_ = auVar123._0_4_;
    auVar123._24_4_ = auVar123._0_4_;
    auVar123._28_4_ = auVar123._0_4_;
    uVar30 = vcmpps_avx512vl(auVar123,_DAT_01f7b060,0xe);
    bVar90 = (byte)uVar180 & (byte)uVar30;
    local_800 = vmulss_avx512f(auVar107,SUB6416(ZEXT464(0x35000000),0));
    auVar121._8_4_ = 2;
    auVar121._0_8_ = 0x200000002;
    auVar121._12_4_ = 2;
    auVar121._16_4_ = 2;
    auVar121._20_4_ = 2;
    auVar121._24_4_ = 2;
    auVar121._28_4_ = 2;
    local_440 = vpermps_avx2(auVar121,ZEXT1632(auVar28));
    local_460 = vpermps_avx2(auVar121,ZEXT1632(auVar103));
    local_480 = vpermps_avx2(auVar121,ZEXT1632(auVar109));
    local_4a0 = vpermps_avx2(auVar121,ZEXT1632(auVar99));
    local_760 = *(undefined4 *)(ray + k * 4 + 0xc0);
    uStack_75c = 0;
    uStack_758 = 0;
    uStack_754 = 0;
    auVar155 = vpbroadcastd_avx512f();
    local_300 = vmovdqa64_avx512f(auVar155);
    auVar155 = vpbroadcastd_avx512f();
    local_340 = vmovdqa64_avx512f(auVar155);
    local_840 = auVar108._0_8_;
    uStack_838 = auVar108._8_8_;
    local_850 = auVar6._0_8_;
    uStack_848 = auVar6._8_8_;
    local_860 = auVar104._0_8_;
    uStack_858 = auVar104._8_8_;
    local_870._0_4_ = auVar105._0_4_;
    fVar27 = (float)local_870;
    local_870._4_4_ = auVar105._4_4_;
    fVar65 = local_870._4_4_;
    uStack_868._0_4_ = auVar105._8_4_;
    fVar66 = (float)uStack_868;
    uStack_868._4_4_ = auVar105._12_4_;
    fVar67 = uStack_868._4_4_;
    local_870 = auVar105._0_8_;
    uStack_868 = auVar105._8_8_;
    if (bVar90 != 0) {
      auVar125 = vmulps_avx512vl(local_4a0,auVar125);
      auVar126 = vfmadd213ps_avx512vl(auVar126,local_480,auVar125);
      auVar116 = vfmadd213ps_avx512vl(auVar116,local_460,auVar126);
      auVar125 = vfmadd213ps_avx512vl(auVar115,local_440,auVar116);
      auVar127 = vmulps_avx512vl(local_4a0,auVar127);
      auVar128 = vfmadd213ps_avx512vl(auVar128,local_480,auVar127);
      auVar116 = vfmadd213ps_avx512vl(auVar130,local_460,auVar128);
      auVar130 = *(undefined1 (*) [32])(bezier_basis0 + lVar89 + 0x1210);
      auVar128 = *(undefined1 (*) [32])(bezier_basis0 + lVar89 + 0x1694);
      auVar127 = *(undefined1 (*) [32])(bezier_basis0 + lVar89 + 0x1b18);
      auVar115 = *(undefined1 (*) [32])(bezier_basis0 + lVar89 + 0x1f9c);
      auVar121 = vfmadd213ps_avx512vl(auVar129,local_440,auVar116);
      auVar129 = vmulps_avx512vl(_local_6c0,auVar115);
      auVar116 = vmulps_avx512vl(_local_6e0,auVar115);
      auVar115 = vmulps_avx512vl(local_4a0,auVar115);
      auVar129 = vfmadd231ps_avx512vl(auVar129,auVar127,local_680);
      auVar116 = vfmadd231ps_avx512vl(auVar116,auVar127,local_6a0);
      auVar127 = vfmadd231ps_avx512vl(auVar115,local_480,auVar127);
      auVar129 = vfmadd231ps_avx512vl(auVar129,auVar128,local_640);
      auVar115 = vfmadd231ps_avx512vl(auVar116,auVar128,local_660);
      auVar116 = vfmadd231ps_avx512vl(auVar127,local_460,auVar128);
      auVar107 = vfmadd231ps_fma(auVar129,auVar130,local_600);
      auVar115 = vfmadd231ps_avx512vl(auVar115,auVar130,local_620);
      auVar129 = *(undefined1 (*) [32])(bezier_basis1 + lVar89 + 0x1210);
      auVar128 = *(undefined1 (*) [32])(bezier_basis1 + lVar89 + 0x1b18);
      auVar127 = *(undefined1 (*) [32])(bezier_basis1 + lVar89 + 0x1f9c);
      auVar116 = vfmadd231ps_avx512vl(auVar116,local_440,auVar130);
      auVar130 = vmulps_avx512vl(_local_6c0,auVar127);
      auVar126 = vmulps_avx512vl(_local_6e0,auVar127);
      auVar127 = vmulps_avx512vl(local_4a0,auVar127);
      auVar124 = vfmadd231ps_avx512vl(auVar130,auVar128,local_680);
      auVar126 = vfmadd231ps_avx512vl(auVar126,auVar128,local_6a0);
      auVar128 = vfmadd231ps_avx512vl(auVar127,local_480,auVar128);
      auVar240 = ZEXT1664(auVar239);
      auVar130 = *(undefined1 (*) [32])(bezier_basis1 + lVar89 + 0x1694);
      auVar127 = vfmadd231ps_avx512vl(auVar124,auVar130,local_640);
      auVar126 = vfmadd231ps_avx512vl(auVar126,auVar130,local_660);
      auVar130 = vfmadd231ps_avx512vl(auVar128,local_460,auVar130);
      auVar177 = ZEXT1664(auVar177._0_16_);
      auVar110 = vfmadd231ps_fma(auVar127,auVar129,local_600);
      auVar128 = vfmadd231ps_avx512vl(auVar126,auVar129,local_620);
      auVar127 = vfmadd231ps_avx512vl(auVar130,local_440,auVar129);
      auVar237._8_4_ = 0x7fffffff;
      auVar237._0_8_ = 0x7fffffff7fffffff;
      auVar237._12_4_ = 0x7fffffff;
      auVar237._16_4_ = 0x7fffffff;
      auVar237._20_4_ = 0x7fffffff;
      auVar237._24_4_ = 0x7fffffff;
      auVar237._28_4_ = 0x7fffffff;
      auVar129 = vandps_avx(ZEXT1632(auVar107),auVar237);
      auVar130 = vandps_avx(auVar115,auVar237);
      auVar130 = vmaxps_avx(auVar129,auVar130);
      auVar129 = vandps_avx(auVar116,auVar237);
      auVar129 = vmaxps_avx(auVar130,auVar129);
      auVar232._4_4_ = local_800._0_4_;
      auVar232._0_4_ = local_800._0_4_;
      auVar232._8_4_ = local_800._0_4_;
      auVar232._12_4_ = local_800._0_4_;
      auVar232._16_4_ = local_800._0_4_;
      auVar232._20_4_ = local_800._0_4_;
      auVar232._24_4_ = local_800._0_4_;
      auVar232._28_4_ = local_800._0_4_;
      uVar83 = vcmpps_avx512vl(auVar129,auVar232,1);
      bVar13 = (bool)((byte)uVar83 & 1);
      auVar124._0_4_ = (float)((uint)bVar13 * auVar119._0_4_ | (uint)!bVar13 * auVar107._0_4_);
      bVar13 = (bool)((byte)(uVar83 >> 1) & 1);
      auVar124._4_4_ = (float)((uint)bVar13 * auVar119._4_4_ | (uint)!bVar13 * auVar107._4_4_);
      bVar13 = (bool)((byte)(uVar83 >> 2) & 1);
      auVar124._8_4_ = (float)((uint)bVar13 * auVar119._8_4_ | (uint)!bVar13 * auVar107._8_4_);
      bVar13 = (bool)((byte)(uVar83 >> 3) & 1);
      auVar124._12_4_ = (float)((uint)bVar13 * auVar119._12_4_ | (uint)!bVar13 * auVar107._12_4_);
      fVar225 = (float)((uint)((byte)(uVar83 >> 4) & 1) * auVar119._16_4_);
      auVar124._16_4_ = fVar225;
      fVar186 = (float)((uint)((byte)(uVar83 >> 5) & 1) * auVar119._20_4_);
      auVar124._20_4_ = fVar186;
      fVar226 = (float)((uint)((byte)(uVar83 >> 6) & 1) * auVar119._24_4_);
      auVar124._24_4_ = fVar226;
      uVar84 = (uint)(byte)(uVar83 >> 7) * auVar119._28_4_;
      auVar124._28_4_ = uVar84;
      bVar13 = (bool)((byte)uVar83 & 1);
      auVar131._0_4_ = (float)((uint)bVar13 * auVar120._0_4_ | (uint)!bVar13 * auVar115._0_4_);
      bVar13 = (bool)((byte)(uVar83 >> 1) & 1);
      auVar131._4_4_ = (float)((uint)bVar13 * auVar120._4_4_ | (uint)!bVar13 * auVar115._4_4_);
      bVar13 = (bool)((byte)(uVar83 >> 2) & 1);
      auVar131._8_4_ = (float)((uint)bVar13 * auVar120._8_4_ | (uint)!bVar13 * auVar115._8_4_);
      bVar13 = (bool)((byte)(uVar83 >> 3) & 1);
      auVar131._12_4_ = (float)((uint)bVar13 * auVar120._12_4_ | (uint)!bVar13 * auVar115._12_4_);
      bVar13 = (bool)((byte)(uVar83 >> 4) & 1);
      auVar131._16_4_ = (float)((uint)bVar13 * auVar120._16_4_ | (uint)!bVar13 * auVar115._16_4_);
      bVar13 = (bool)((byte)(uVar83 >> 5) & 1);
      auVar131._20_4_ = (float)((uint)bVar13 * auVar120._20_4_ | (uint)!bVar13 * auVar115._20_4_);
      bVar13 = (bool)((byte)(uVar83 >> 6) & 1);
      auVar131._24_4_ = (float)((uint)bVar13 * auVar120._24_4_ | (uint)!bVar13 * auVar115._24_4_);
      bVar13 = SUB81(uVar83 >> 7,0);
      auVar131._28_4_ = (uint)bVar13 * auVar120._28_4_ | (uint)!bVar13 * auVar115._28_4_;
      auVar129 = vandps_avx(auVar237,ZEXT1632(auVar110));
      auVar130 = vandps_avx(auVar128,auVar237);
      auVar130 = vmaxps_avx(auVar129,auVar130);
      auVar129 = vandps_avx(auVar127,auVar237);
      auVar129 = vmaxps_avx(auVar130,auVar129);
      uVar83 = vcmpps_avx512vl(auVar129,auVar232,1);
      bVar13 = (bool)((byte)uVar83 & 1);
      auVar132._0_4_ = (float)((uint)bVar13 * auVar119._0_4_ | (uint)!bVar13 * auVar110._0_4_);
      bVar13 = (bool)((byte)(uVar83 >> 1) & 1);
      auVar132._4_4_ = (float)((uint)bVar13 * auVar119._4_4_ | (uint)!bVar13 * auVar110._4_4_);
      bVar13 = (bool)((byte)(uVar83 >> 2) & 1);
      auVar132._8_4_ = (float)((uint)bVar13 * auVar119._8_4_ | (uint)!bVar13 * auVar110._8_4_);
      bVar13 = (bool)((byte)(uVar83 >> 3) & 1);
      auVar132._12_4_ = (float)((uint)bVar13 * auVar119._12_4_ | (uint)!bVar13 * auVar110._12_4_);
      fVar179 = (float)((uint)((byte)(uVar83 >> 4) & 1) * auVar119._16_4_);
      auVar132._16_4_ = fVar179;
      fVar185 = (float)((uint)((byte)(uVar83 >> 5) & 1) * auVar119._20_4_);
      auVar132._20_4_ = fVar185;
      fVar194 = (float)((uint)((byte)(uVar83 >> 6) & 1) * auVar119._24_4_);
      auVar132._24_4_ = fVar194;
      auVar132._28_4_ = (uint)(byte)(uVar83 >> 7) * auVar119._28_4_;
      bVar13 = (bool)((byte)uVar83 & 1);
      auVar133._0_4_ = (float)((uint)bVar13 * auVar120._0_4_ | (uint)!bVar13 * auVar128._0_4_);
      bVar13 = (bool)((byte)(uVar83 >> 1) & 1);
      auVar133._4_4_ = (float)((uint)bVar13 * auVar120._4_4_ | (uint)!bVar13 * auVar128._4_4_);
      bVar13 = (bool)((byte)(uVar83 >> 2) & 1);
      auVar133._8_4_ = (float)((uint)bVar13 * auVar120._8_4_ | (uint)!bVar13 * auVar128._8_4_);
      bVar13 = (bool)((byte)(uVar83 >> 3) & 1);
      auVar133._12_4_ = (float)((uint)bVar13 * auVar120._12_4_ | (uint)!bVar13 * auVar128._12_4_);
      bVar13 = (bool)((byte)(uVar83 >> 4) & 1);
      auVar133._16_4_ = (float)((uint)bVar13 * auVar120._16_4_ | (uint)!bVar13 * auVar128._16_4_);
      bVar13 = (bool)((byte)(uVar83 >> 5) & 1);
      auVar133._20_4_ = (float)((uint)bVar13 * auVar120._20_4_ | (uint)!bVar13 * auVar128._20_4_);
      bVar13 = (bool)((byte)(uVar83 >> 6) & 1);
      auVar133._24_4_ = (float)((uint)bVar13 * auVar120._24_4_ | (uint)!bVar13 * auVar128._24_4_);
      bVar13 = SUB81(uVar83 >> 7,0);
      auVar133._28_4_ = (uint)bVar13 * auVar120._28_4_ | (uint)!bVar13 * auVar128._28_4_;
      auVar113 = vxorps_avx512vl(auVar199,auVar199);
      auVar129 = vfmadd213ps_avx512vl(auVar124,auVar124,ZEXT1632(auVar113));
      auVar107 = vfmadd231ps_fma(auVar129,auVar131,auVar131);
      auVar128 = vrsqrt14ps_avx512vl(ZEXT1632(auVar107));
      fVar93 = auVar128._0_4_;
      fVar94 = auVar128._4_4_;
      fVar156 = auVar128._8_4_;
      fVar157 = auVar128._12_4_;
      fVar158 = auVar128._16_4_;
      fVar159 = auVar128._20_4_;
      fVar161 = auVar128._24_4_;
      auVar129._4_4_ = fVar94 * fVar94 * fVar94 * auVar107._4_4_ * -0.5;
      auVar129._0_4_ = fVar93 * fVar93 * fVar93 * auVar107._0_4_ * -0.5;
      auVar129._8_4_ = fVar156 * fVar156 * fVar156 * auVar107._8_4_ * -0.5;
      auVar129._12_4_ = fVar157 * fVar157 * fVar157 * auVar107._12_4_ * -0.5;
      auVar129._16_4_ = fVar158 * fVar158 * fVar158 * -0.0;
      auVar129._20_4_ = fVar159 * fVar159 * fVar159 * -0.0;
      auVar129._24_4_ = fVar161 * fVar161 * fVar161 * -0.0;
      auVar129._28_4_ = 0;
      auVar115 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
      auVar129 = vfmadd231ps_avx512vl(auVar129,auVar115,auVar128);
      auVar130._4_4_ = auVar131._4_4_ * auVar129._4_4_;
      auVar130._0_4_ = auVar131._0_4_ * auVar129._0_4_;
      auVar130._8_4_ = auVar131._8_4_ * auVar129._8_4_;
      auVar130._12_4_ = auVar131._12_4_ * auVar129._12_4_;
      auVar130._16_4_ = auVar131._16_4_ * auVar129._16_4_;
      auVar130._20_4_ = auVar131._20_4_ * auVar129._20_4_;
      auVar130._24_4_ = auVar131._24_4_ * auVar129._24_4_;
      auVar130._28_4_ = auVar128._28_4_;
      auVar128._4_4_ = auVar129._4_4_ * -auVar124._4_4_;
      auVar128._0_4_ = auVar129._0_4_ * -auVar124._0_4_;
      auVar128._8_4_ = auVar129._8_4_ * -auVar124._8_4_;
      auVar128._12_4_ = auVar129._12_4_ * -auVar124._12_4_;
      auVar128._16_4_ = auVar129._16_4_ * -fVar225;
      auVar128._20_4_ = auVar129._20_4_ * -fVar186;
      auVar128._24_4_ = auVar129._24_4_ * -fVar226;
      auVar128._28_4_ = uVar84 ^ 0x80000000;
      auVar119 = vmulps_avx512vl(auVar129,ZEXT1632(auVar113));
      auVar120 = ZEXT1632(auVar113);
      auVar127 = vfmadd213ps_avx512vl(auVar132,auVar132,auVar120);
      auVar107 = vfmadd231ps_fma(auVar127,auVar133,auVar133);
      auVar126 = vrsqrt14ps_avx512vl(ZEXT1632(auVar107));
      fVar186 = auVar126._0_4_;
      fVar225 = auVar126._4_4_;
      fVar226 = auVar126._8_4_;
      fVar93 = auVar126._12_4_;
      fVar94 = auVar126._16_4_;
      fVar156 = auVar126._20_4_;
      fVar157 = auVar126._24_4_;
      auVar127._4_4_ = fVar225 * fVar225 * fVar225 * auVar107._4_4_ * -0.5;
      auVar127._0_4_ = fVar186 * fVar186 * fVar186 * auVar107._0_4_ * -0.5;
      auVar127._8_4_ = fVar226 * fVar226 * fVar226 * auVar107._8_4_ * -0.5;
      auVar127._12_4_ = fVar93 * fVar93 * fVar93 * auVar107._12_4_ * -0.5;
      auVar127._16_4_ = fVar94 * fVar94 * fVar94 * -0.0;
      auVar127._20_4_ = fVar156 * fVar156 * fVar156 * -0.0;
      auVar127._24_4_ = fVar157 * fVar157 * fVar157 * -0.0;
      auVar127._28_4_ = 0;
      auVar127 = vfmadd231ps_avx512vl(auVar127,auVar115,auVar126);
      auVar116._4_4_ = auVar133._4_4_ * auVar127._4_4_;
      auVar116._0_4_ = auVar133._0_4_ * auVar127._0_4_;
      auVar116._8_4_ = auVar133._8_4_ * auVar127._8_4_;
      auVar116._12_4_ = auVar133._12_4_ * auVar127._12_4_;
      auVar116._16_4_ = auVar133._16_4_ * auVar127._16_4_;
      auVar116._20_4_ = auVar133._20_4_ * auVar127._20_4_;
      auVar116._24_4_ = auVar133._24_4_ * auVar127._24_4_;
      auVar116._28_4_ = auVar126._28_4_;
      auVar126._4_4_ = -auVar132._4_4_ * auVar127._4_4_;
      auVar126._0_4_ = -auVar132._0_4_ * auVar127._0_4_;
      auVar126._8_4_ = -auVar132._8_4_ * auVar127._8_4_;
      auVar126._12_4_ = -auVar132._12_4_ * auVar127._12_4_;
      auVar126._16_4_ = -fVar179 * auVar127._16_4_;
      auVar126._20_4_ = -fVar185 * auVar127._20_4_;
      auVar126._24_4_ = -fVar194 * auVar127._24_4_;
      auVar126._28_4_ = auVar129._28_4_;
      auVar129 = vmulps_avx512vl(auVar127,auVar120);
      auVar107 = vfmadd213ps_fma(auVar130,auVar122,auVar118);
      auVar110 = vfmadd213ps_fma(auVar128,auVar122,auVar117);
      auVar127 = vfmadd213ps_avx512vl(auVar119,auVar122,auVar121);
      auVar115 = vfmadd213ps_avx512vl(auVar116,ZEXT1632(auVar102),ZEXT1632(auVar100));
      auVar105 = vfnmadd213ps_fma(auVar130,auVar122,auVar118);
      auVar118 = ZEXT1632(auVar102);
      auVar109 = vfmadd213ps_fma(auVar126,auVar118,ZEXT1632(auVar101));
      auVar106 = vfnmadd213ps_fma(auVar128,auVar122,auVar117);
      auVar28 = vfmadd213ps_fma(auVar129,auVar118,auVar125);
      auVar130 = vfnmadd231ps_avx512vl(auVar121,auVar122,auVar119);
      auVar100 = vfnmadd213ps_fma(auVar116,auVar118,ZEXT1632(auVar100));
      auVar101 = vfnmadd213ps_fma(auVar126,auVar118,ZEXT1632(auVar101));
      auVar239 = vfnmadd231ps_fma(auVar125,ZEXT1632(auVar102),auVar129);
      auVar128 = vsubps_avx512vl(auVar115,ZEXT1632(auVar105));
      auVar129 = vsubps_avx(ZEXT1632(auVar109),ZEXT1632(auVar106));
      auVar116 = vsubps_avx512vl(ZEXT1632(auVar28),auVar130);
      auVar126 = vmulps_avx512vl(auVar129,auVar130);
      auVar103 = vfmsub231ps_fma(auVar126,ZEXT1632(auVar106),auVar116);
      auVar125._4_4_ = auVar105._4_4_ * auVar116._4_4_;
      auVar125._0_4_ = auVar105._0_4_ * auVar116._0_4_;
      auVar125._8_4_ = auVar105._8_4_ * auVar116._8_4_;
      auVar125._12_4_ = auVar105._12_4_ * auVar116._12_4_;
      auVar125._16_4_ = auVar116._16_4_ * 0.0;
      auVar125._20_4_ = auVar116._20_4_ * 0.0;
      auVar125._24_4_ = auVar116._24_4_ * 0.0;
      auVar125._28_4_ = auVar116._28_4_;
      auVar116 = vfmsub231ps_avx512vl(auVar125,auVar130,auVar128);
      auVar117._4_4_ = auVar106._4_4_ * auVar128._4_4_;
      auVar117._0_4_ = auVar106._0_4_ * auVar128._0_4_;
      auVar117._8_4_ = auVar106._8_4_ * auVar128._8_4_;
      auVar117._12_4_ = auVar106._12_4_ * auVar128._12_4_;
      auVar117._16_4_ = auVar128._16_4_ * 0.0;
      auVar117._20_4_ = auVar128._20_4_ * 0.0;
      auVar117._24_4_ = auVar128._24_4_ * 0.0;
      auVar117._28_4_ = auVar128._28_4_;
      auVar99 = vfmsub231ps_fma(auVar117,ZEXT1632(auVar105),auVar129);
      auVar129 = vfmadd231ps_avx512vl(ZEXT1632(auVar99),auVar120,auVar116);
      auVar129 = vfmadd231ps_avx512vl(auVar129,auVar120,ZEXT1632(auVar103));
      auVar121 = ZEXT1632(auVar113);
      uVar83 = vcmpps_avx512vl(auVar129,auVar121,2);
      bVar82 = (byte)uVar83;
      fVar93 = (float)((uint)(bVar82 & 1) * auVar107._0_4_ |
                      (uint)!(bool)(bVar82 & 1) * auVar100._0_4_);
      bVar13 = (bool)((byte)(uVar83 >> 1) & 1);
      fVar156 = (float)((uint)bVar13 * auVar107._4_4_ | (uint)!bVar13 * auVar100._4_4_);
      bVar13 = (bool)((byte)(uVar83 >> 2) & 1);
      fVar158 = (float)((uint)bVar13 * auVar107._8_4_ | (uint)!bVar13 * auVar100._8_4_);
      bVar13 = (bool)((byte)(uVar83 >> 3) & 1);
      fVar161 = (float)((uint)bVar13 * auVar107._12_4_ | (uint)!bVar13 * auVar100._12_4_);
      auVar126 = ZEXT1632(CONCAT412(fVar161,CONCAT48(fVar158,CONCAT44(fVar156,fVar93))));
      fVar94 = (float)((uint)(bVar82 & 1) * auVar110._0_4_ |
                      (uint)!(bool)(bVar82 & 1) * auVar101._0_4_);
      bVar13 = (bool)((byte)(uVar83 >> 1) & 1);
      fVar157 = (float)((uint)bVar13 * auVar110._4_4_ | (uint)!bVar13 * auVar101._4_4_);
      bVar13 = (bool)((byte)(uVar83 >> 2) & 1);
      fVar159 = (float)((uint)bVar13 * auVar110._8_4_ | (uint)!bVar13 * auVar101._8_4_);
      bVar13 = (bool)((byte)(uVar83 >> 3) & 1);
      fVar162 = (float)((uint)bVar13 * auVar110._12_4_ | (uint)!bVar13 * auVar101._12_4_);
      auVar125 = ZEXT1632(CONCAT412(fVar162,CONCAT48(fVar159,CONCAT44(fVar157,fVar94))));
      auVar134._0_4_ =
           (float)((uint)(bVar82 & 1) * auVar127._0_4_ | (uint)!(bool)(bVar82 & 1) * auVar239._0_4_)
      ;
      bVar13 = (bool)((byte)(uVar83 >> 1) & 1);
      auVar134._4_4_ = (float)((uint)bVar13 * auVar127._4_4_ | (uint)!bVar13 * auVar239._4_4_);
      bVar13 = (bool)((byte)(uVar83 >> 2) & 1);
      auVar134._8_4_ = (float)((uint)bVar13 * auVar127._8_4_ | (uint)!bVar13 * auVar239._8_4_);
      bVar13 = (bool)((byte)(uVar83 >> 3) & 1);
      auVar134._12_4_ = (float)((uint)bVar13 * auVar127._12_4_ | (uint)!bVar13 * auVar239._12_4_);
      fVar226 = (float)((uint)((byte)(uVar83 >> 4) & 1) * auVar127._16_4_);
      auVar134._16_4_ = fVar226;
      fVar225 = (float)((uint)((byte)(uVar83 >> 5) & 1) * auVar127._20_4_);
      auVar134._20_4_ = fVar225;
      fVar186 = (float)((uint)((byte)(uVar83 >> 6) & 1) * auVar127._24_4_);
      auVar134._24_4_ = fVar186;
      iVar1 = (uint)(byte)(uVar83 >> 7) * auVar127._28_4_;
      auVar134._28_4_ = iVar1;
      auVar128 = vblendmps_avx512vl(ZEXT1632(auVar105),auVar115);
      auVar135._0_4_ =
           (uint)(bVar82 & 1) * auVar128._0_4_ | (uint)!(bool)(bVar82 & 1) * auVar110._0_4_;
      bVar13 = (bool)((byte)(uVar83 >> 1) & 1);
      auVar135._4_4_ = (uint)bVar13 * auVar128._4_4_ | (uint)!bVar13 * auVar110._4_4_;
      bVar13 = (bool)((byte)(uVar83 >> 2) & 1);
      auVar135._8_4_ = (uint)bVar13 * auVar128._8_4_ | (uint)!bVar13 * auVar110._8_4_;
      bVar13 = (bool)((byte)(uVar83 >> 3) & 1);
      auVar135._12_4_ = (uint)bVar13 * auVar128._12_4_ | (uint)!bVar13 * auVar110._12_4_;
      auVar135._16_4_ = (uint)((byte)(uVar83 >> 4) & 1) * auVar128._16_4_;
      auVar135._20_4_ = (uint)((byte)(uVar83 >> 5) & 1) * auVar128._20_4_;
      auVar135._24_4_ = (uint)((byte)(uVar83 >> 6) & 1) * auVar128._24_4_;
      auVar135._28_4_ = (uint)(byte)(uVar83 >> 7) * auVar128._28_4_;
      auVar128 = vblendmps_avx512vl(ZEXT1632(auVar106),ZEXT1632(auVar109));
      auVar136._0_4_ =
           (float)((uint)(bVar82 & 1) * auVar128._0_4_ | (uint)!(bool)(bVar82 & 1) * auVar103._0_4_)
      ;
      bVar13 = (bool)((byte)(uVar83 >> 1) & 1);
      auVar136._4_4_ = (float)((uint)bVar13 * auVar128._4_4_ | (uint)!bVar13 * auVar103._4_4_);
      bVar13 = (bool)((byte)(uVar83 >> 2) & 1);
      auVar136._8_4_ = (float)((uint)bVar13 * auVar128._8_4_ | (uint)!bVar13 * auVar103._8_4_);
      bVar13 = (bool)((byte)(uVar83 >> 3) & 1);
      auVar136._12_4_ = (float)((uint)bVar13 * auVar128._12_4_ | (uint)!bVar13 * auVar103._12_4_);
      fVar179 = (float)((uint)((byte)(uVar83 >> 4) & 1) * auVar128._16_4_);
      auVar136._16_4_ = fVar179;
      fVar194 = (float)((uint)((byte)(uVar83 >> 5) & 1) * auVar128._20_4_);
      auVar136._20_4_ = fVar194;
      fVar185 = (float)((uint)((byte)(uVar83 >> 6) & 1) * auVar128._24_4_);
      auVar136._24_4_ = fVar185;
      auVar136._28_4_ = (uint)(byte)(uVar83 >> 7) * auVar128._28_4_;
      auVar128 = vblendmps_avx512vl(auVar130,ZEXT1632(auVar28));
      auVar137._0_4_ =
           (float)((uint)(bVar82 & 1) * auVar128._0_4_ | (uint)!(bool)(bVar82 & 1) * auVar127._0_4_)
      ;
      bVar13 = (bool)((byte)(uVar83 >> 1) & 1);
      auVar137._4_4_ = (float)((uint)bVar13 * auVar128._4_4_ | (uint)!bVar13 * auVar127._4_4_);
      bVar13 = (bool)((byte)(uVar83 >> 2) & 1);
      auVar137._8_4_ = (float)((uint)bVar13 * auVar128._8_4_ | (uint)!bVar13 * auVar127._8_4_);
      bVar13 = (bool)((byte)(uVar83 >> 3) & 1);
      auVar137._12_4_ = (float)((uint)bVar13 * auVar128._12_4_ | (uint)!bVar13 * auVar127._12_4_);
      bVar13 = (bool)((byte)(uVar83 >> 4) & 1);
      auVar137._16_4_ = (float)((uint)bVar13 * auVar128._16_4_ | (uint)!bVar13 * auVar127._16_4_);
      bVar13 = (bool)((byte)(uVar83 >> 5) & 1);
      auVar137._20_4_ = (float)((uint)bVar13 * auVar128._20_4_ | (uint)!bVar13 * auVar127._20_4_);
      bVar13 = (bool)((byte)(uVar83 >> 6) & 1);
      auVar137._24_4_ = (float)((uint)bVar13 * auVar128._24_4_ | (uint)!bVar13 * auVar127._24_4_);
      bVar13 = SUB81(uVar83 >> 7,0);
      auVar137._28_4_ = (uint)bVar13 * auVar128._28_4_ | (uint)!bVar13 * auVar127._28_4_;
      auVar138._0_4_ =
           (uint)(bVar82 & 1) * (int)auVar105._0_4_ | (uint)!(bool)(bVar82 & 1) * auVar115._0_4_;
      bVar13 = (bool)((byte)(uVar83 >> 1) & 1);
      auVar138._4_4_ = (uint)bVar13 * (int)auVar105._4_4_ | (uint)!bVar13 * auVar115._4_4_;
      bVar13 = (bool)((byte)(uVar83 >> 2) & 1);
      auVar138._8_4_ = (uint)bVar13 * (int)auVar105._8_4_ | (uint)!bVar13 * auVar115._8_4_;
      bVar13 = (bool)((byte)(uVar83 >> 3) & 1);
      auVar138._12_4_ = (uint)bVar13 * (int)auVar105._12_4_ | (uint)!bVar13 * auVar115._12_4_;
      auVar138._16_4_ = (uint)!(bool)((byte)(uVar83 >> 4) & 1) * auVar115._16_4_;
      auVar138._20_4_ = (uint)!(bool)((byte)(uVar83 >> 5) & 1) * auVar115._20_4_;
      auVar138._24_4_ = (uint)!(bool)((byte)(uVar83 >> 6) & 1) * auVar115._24_4_;
      auVar138._28_4_ = (uint)!SUB81(uVar83 >> 7,0) * auVar115._28_4_;
      bVar13 = (bool)((byte)(uVar83 >> 1) & 1);
      bVar15 = (bool)((byte)(uVar83 >> 2) & 1);
      bVar16 = (bool)((byte)(uVar83 >> 3) & 1);
      auVar139._0_4_ =
           (uint)(bVar82 & 1) * auVar130._0_4_ | (uint)!(bool)(bVar82 & 1) * auVar28._0_4_;
      bVar14 = (bool)((byte)(uVar83 >> 1) & 1);
      auVar139._4_4_ = (uint)bVar14 * auVar130._4_4_ | (uint)!bVar14 * auVar28._4_4_;
      bVar14 = (bool)((byte)(uVar83 >> 2) & 1);
      auVar139._8_4_ = (uint)bVar14 * auVar130._8_4_ | (uint)!bVar14 * auVar28._8_4_;
      bVar14 = (bool)((byte)(uVar83 >> 3) & 1);
      auVar139._12_4_ = (uint)bVar14 * auVar130._12_4_ | (uint)!bVar14 * auVar28._12_4_;
      auVar139._16_4_ = (uint)((byte)(uVar83 >> 4) & 1) * auVar130._16_4_;
      auVar139._20_4_ = (uint)((byte)(uVar83 >> 5) & 1) * auVar130._20_4_;
      auVar139._24_4_ = (uint)((byte)(uVar83 >> 6) & 1) * auVar130._24_4_;
      iVar2 = (uint)(byte)(uVar83 >> 7) * auVar130._28_4_;
      auVar139._28_4_ = iVar2;
      auVar117 = vsubps_avx512vl(auVar138,auVar126);
      auVar130 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar16 * (int)auVar106._12_4_ |
                                               (uint)!bVar16 * auVar109._12_4_,
                                               CONCAT48((uint)bVar15 * (int)auVar106._8_4_ |
                                                        (uint)!bVar15 * auVar109._8_4_,
                                                        CONCAT44((uint)bVar13 * (int)auVar106._4_4_
                                                                 | (uint)!bVar13 * auVar109._4_4_,
                                                                 (uint)(bVar82 & 1) *
                                                                 (int)auVar106._0_4_ |
                                                                 (uint)!(bool)(bVar82 & 1) *
                                                                 auVar109._0_4_)))),auVar125);
      auVar219 = ZEXT3264(auVar130);
      auVar128 = vsubps_avx(auVar139,auVar134);
      auVar127 = vsubps_avx(auVar126,auVar135);
      auVar222 = ZEXT3264(auVar127);
      auVar115 = vsubps_avx(auVar125,auVar136);
      auVar116 = vsubps_avx(auVar134,auVar137);
      auVar118._4_4_ = auVar128._4_4_ * fVar156;
      auVar118._0_4_ = auVar128._0_4_ * fVar93;
      auVar118._8_4_ = auVar128._8_4_ * fVar158;
      auVar118._12_4_ = auVar128._12_4_ * fVar161;
      auVar118._16_4_ = auVar128._16_4_ * 0.0;
      auVar118._20_4_ = auVar128._20_4_ * 0.0;
      auVar118._24_4_ = auVar128._24_4_ * 0.0;
      auVar118._28_4_ = iVar2;
      auVar107 = vfmsub231ps_fma(auVar118,auVar134,auVar117);
      auVar119._4_4_ = fVar157 * auVar117._4_4_;
      auVar119._0_4_ = fVar94 * auVar117._0_4_;
      auVar119._8_4_ = fVar159 * auVar117._8_4_;
      auVar119._12_4_ = fVar162 * auVar117._12_4_;
      auVar119._16_4_ = auVar117._16_4_ * 0.0;
      auVar119._20_4_ = auVar117._20_4_ * 0.0;
      auVar119._24_4_ = auVar117._24_4_ * 0.0;
      auVar119._28_4_ = auVar129._28_4_;
      auVar110 = vfmsub231ps_fma(auVar119,auVar126,auVar130);
      auVar129 = vfmadd231ps_avx512vl(ZEXT1632(auVar110),auVar121,ZEXT1632(auVar107));
      auVar208._0_4_ = auVar130._0_4_ * auVar134._0_4_;
      auVar208._4_4_ = auVar130._4_4_ * auVar134._4_4_;
      auVar208._8_4_ = auVar130._8_4_ * auVar134._8_4_;
      auVar208._12_4_ = auVar130._12_4_ * auVar134._12_4_;
      auVar208._16_4_ = auVar130._16_4_ * fVar226;
      auVar208._20_4_ = auVar130._20_4_ * fVar225;
      auVar208._24_4_ = auVar130._24_4_ * fVar186;
      auVar208._28_4_ = 0;
      auVar107 = vfmsub231ps_fma(auVar208,auVar125,auVar128);
      auVar118 = vfmadd231ps_avx512vl(auVar129,auVar121,ZEXT1632(auVar107));
      auVar129 = vmulps_avx512vl(auVar116,auVar135);
      auVar129 = vfmsub231ps_avx512vl(auVar129,auVar127,auVar137);
      auVar120._4_4_ = auVar115._4_4_ * auVar137._4_4_;
      auVar120._0_4_ = auVar115._0_4_ * auVar137._0_4_;
      auVar120._8_4_ = auVar115._8_4_ * auVar137._8_4_;
      auVar120._12_4_ = auVar115._12_4_ * auVar137._12_4_;
      auVar120._16_4_ = auVar115._16_4_ * auVar137._16_4_;
      auVar120._20_4_ = auVar115._20_4_ * auVar137._20_4_;
      auVar120._24_4_ = auVar115._24_4_ * auVar137._24_4_;
      auVar120._28_4_ = auVar137._28_4_;
      auVar107 = vfmsub231ps_fma(auVar120,auVar136,auVar116);
      auVar209._0_4_ = auVar136._0_4_ * auVar127._0_4_;
      auVar209._4_4_ = auVar136._4_4_ * auVar127._4_4_;
      auVar209._8_4_ = auVar136._8_4_ * auVar127._8_4_;
      auVar209._12_4_ = auVar136._12_4_ * auVar127._12_4_;
      auVar209._16_4_ = fVar179 * auVar127._16_4_;
      auVar209._20_4_ = fVar194 * auVar127._20_4_;
      auVar209._24_4_ = fVar185 * auVar127._24_4_;
      auVar209._28_4_ = 0;
      auVar110 = vfmsub231ps_fma(auVar209,auVar115,auVar135);
      auVar129 = vfmadd231ps_avx512vl(ZEXT1632(auVar110),auVar121,auVar129);
      auVar119 = vfmadd231ps_avx512vl(auVar129,auVar121,ZEXT1632(auVar107));
      auVar212 = ZEXT3264(auVar119);
      auVar129 = vmaxps_avx(auVar118,auVar119);
      uVar180 = vcmpps_avx512vl(auVar129,auVar121,2);
      bVar90 = bVar90 & (byte)uVar180;
      if (bVar90 != 0) {
        auVar40._4_4_ = auVar116._4_4_ * auVar130._4_4_;
        auVar40._0_4_ = auVar116._0_4_ * auVar130._0_4_;
        auVar40._8_4_ = auVar116._8_4_ * auVar130._8_4_;
        auVar40._12_4_ = auVar116._12_4_ * auVar130._12_4_;
        auVar40._16_4_ = auVar116._16_4_ * auVar130._16_4_;
        auVar40._20_4_ = auVar116._20_4_ * auVar130._20_4_;
        auVar40._24_4_ = auVar116._24_4_ * auVar130._24_4_;
        auVar40._28_4_ = auVar129._28_4_;
        auVar28 = vfmsub231ps_fma(auVar40,auVar115,auVar128);
        auVar41._4_4_ = auVar128._4_4_ * auVar127._4_4_;
        auVar41._0_4_ = auVar128._0_4_ * auVar127._0_4_;
        auVar41._8_4_ = auVar128._8_4_ * auVar127._8_4_;
        auVar41._12_4_ = auVar128._12_4_ * auVar127._12_4_;
        auVar41._16_4_ = auVar128._16_4_ * auVar127._16_4_;
        auVar41._20_4_ = auVar128._20_4_ * auVar127._20_4_;
        auVar41._24_4_ = auVar128._24_4_ * auVar127._24_4_;
        auVar41._28_4_ = auVar128._28_4_;
        auVar109 = vfmsub231ps_fma(auVar41,auVar117,auVar116);
        auVar42._4_4_ = auVar115._4_4_ * auVar117._4_4_;
        auVar42._0_4_ = auVar115._0_4_ * auVar117._0_4_;
        auVar42._8_4_ = auVar115._8_4_ * auVar117._8_4_;
        auVar42._12_4_ = auVar115._12_4_ * auVar117._12_4_;
        auVar42._16_4_ = auVar115._16_4_ * auVar117._16_4_;
        auVar42._20_4_ = auVar115._20_4_ * auVar117._20_4_;
        auVar42._24_4_ = auVar115._24_4_ * auVar117._24_4_;
        auVar42._28_4_ = auVar115._28_4_;
        auVar103 = vfmsub231ps_fma(auVar42,auVar127,auVar130);
        auVar107 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar109),ZEXT1632(auVar103));
        auVar110 = vfmadd231ps_fma(ZEXT1632(auVar107),ZEXT1632(auVar28),ZEXT1232(ZEXT412(0)) << 0x20
                                  );
        auVar129 = vrcp14ps_avx512vl(ZEXT1632(auVar110));
        auVar33._8_4_ = 0x3f800000;
        auVar33._0_8_ = 0x3f8000003f800000;
        auVar33._12_4_ = 0x3f800000;
        auVar33._16_4_ = 0x3f800000;
        auVar33._20_4_ = 0x3f800000;
        auVar33._24_4_ = 0x3f800000;
        auVar33._28_4_ = 0x3f800000;
        auVar130 = vfnmadd213ps_avx512vl(auVar129,ZEXT1632(auVar110),auVar33);
        auVar107 = vfmadd132ps_fma(auVar130,auVar129,auVar129);
        auVar219 = ZEXT1664(auVar107);
        auVar43._4_4_ = auVar103._4_4_ * auVar134._4_4_;
        auVar43._0_4_ = auVar103._0_4_ * auVar134._0_4_;
        auVar43._8_4_ = auVar103._8_4_ * auVar134._8_4_;
        auVar43._12_4_ = auVar103._12_4_ * auVar134._12_4_;
        auVar43._16_4_ = fVar226 * 0.0;
        auVar43._20_4_ = fVar225 * 0.0;
        auVar43._24_4_ = fVar186 * 0.0;
        auVar43._28_4_ = iVar1;
        auVar109 = vfmadd231ps_fma(auVar43,auVar125,ZEXT1632(auVar109));
        auVar109 = vfmadd231ps_fma(ZEXT1632(auVar109),auVar126,ZEXT1632(auVar28));
        fVar186 = auVar107._0_4_;
        fVar225 = auVar107._4_4_;
        fVar226 = auVar107._8_4_;
        fVar179 = auVar107._12_4_;
        local_7a0._28_4_ = auVar129._28_4_;
        local_7a0._0_28_ =
             ZEXT1628(CONCAT412(auVar109._12_4_ * fVar179,
                                CONCAT48(auVar109._8_4_ * fVar226,
                                         CONCAT44(auVar109._4_4_ * fVar225,auVar109._0_4_ * fVar186)
                                        )));
        auVar222 = ZEXT3264(local_7a0);
        auVar169._4_4_ = local_760;
        auVar169._0_4_ = local_760;
        auVar169._8_4_ = local_760;
        auVar169._12_4_ = local_760;
        auVar169._16_4_ = local_760;
        auVar169._20_4_ = local_760;
        auVar169._24_4_ = local_760;
        auVar169._28_4_ = local_760;
        uVar180 = vcmpps_avx512vl(auVar169,local_7a0,2);
        uVar178 = *(undefined4 *)(ray + k * 4 + 0x200);
        auVar34._4_4_ = uVar178;
        auVar34._0_4_ = uVar178;
        auVar34._8_4_ = uVar178;
        auVar34._12_4_ = uVar178;
        auVar34._16_4_ = uVar178;
        auVar34._20_4_ = uVar178;
        auVar34._24_4_ = uVar178;
        auVar34._28_4_ = uVar178;
        uVar30 = vcmpps_avx512vl(local_7a0,auVar34,2);
        bVar90 = (byte)uVar180 & (byte)uVar30 & bVar90;
        if (bVar90 != 0) {
          uVar92 = vcmpps_avx512vl(ZEXT1632(auVar110),ZEXT1232(ZEXT412(0)) << 0x20,4);
          uVar92 = bVar90 & uVar92;
          if ((char)uVar92 != '\0') {
            fVar185 = auVar118._0_4_ * fVar186;
            fVar194 = auVar118._4_4_ * fVar225;
            auVar44._4_4_ = fVar194;
            auVar44._0_4_ = fVar185;
            fVar93 = auVar118._8_4_ * fVar226;
            auVar44._8_4_ = fVar93;
            fVar94 = auVar118._12_4_ * fVar179;
            auVar44._12_4_ = fVar94;
            fVar156 = auVar118._16_4_ * 0.0;
            auVar44._16_4_ = fVar156;
            fVar157 = auVar118._20_4_ * 0.0;
            auVar44._20_4_ = fVar157;
            fVar158 = auVar118._24_4_ * 0.0;
            auVar44._24_4_ = fVar158;
            auVar44._28_4_ = auVar118._28_4_;
            auVar170._8_4_ = 0x3f800000;
            auVar170._0_8_ = 0x3f8000003f800000;
            auVar170._12_4_ = 0x3f800000;
            auVar170._16_4_ = 0x3f800000;
            auVar170._20_4_ = 0x3f800000;
            auVar170._24_4_ = 0x3f800000;
            auVar170._28_4_ = 0x3f800000;
            auVar129 = vsubps_avx(auVar170,auVar44);
            local_5e0._0_4_ =
                 (float)((uint)(bVar82 & 1) * (int)fVar185 |
                        (uint)!(bool)(bVar82 & 1) * auVar129._0_4_);
            bVar13 = (bool)((byte)(uVar83 >> 1) & 1);
            local_5e0._4_4_ = (float)((uint)bVar13 * (int)fVar194 | (uint)!bVar13 * auVar129._4_4_);
            bVar13 = (bool)((byte)(uVar83 >> 2) & 1);
            local_5e0._8_4_ = (float)((uint)bVar13 * (int)fVar93 | (uint)!bVar13 * auVar129._8_4_);
            bVar13 = (bool)((byte)(uVar83 >> 3) & 1);
            local_5e0._12_4_ = (float)((uint)bVar13 * (int)fVar94 | (uint)!bVar13 * auVar129._12_4_)
            ;
            bVar13 = (bool)((byte)(uVar83 >> 4) & 1);
            local_5e0._16_4_ =
                 (float)((uint)bVar13 * (int)fVar156 | (uint)!bVar13 * auVar129._16_4_);
            bVar13 = (bool)((byte)(uVar83 >> 5) & 1);
            local_5e0._20_4_ =
                 (float)((uint)bVar13 * (int)fVar157 | (uint)!bVar13 * auVar129._20_4_);
            bVar13 = (bool)((byte)(uVar83 >> 6) & 1);
            local_5e0._24_4_ =
                 (float)((uint)bVar13 * (int)fVar158 | (uint)!bVar13 * auVar129._24_4_);
            bVar13 = SUB81(uVar83 >> 7,0);
            local_5e0._28_4_ =
                 (float)((uint)bVar13 * auVar118._28_4_ | (uint)!bVar13 * auVar129._28_4_);
            auVar129 = vsubps_avx(ZEXT1632(auVar102),auVar122);
            auVar107 = vfmadd213ps_fma(auVar129,local_5e0,auVar122);
            uVar178 = *(undefined4 *)((long)local_7e0->ray_space + k * 4 + -0x40);
            auVar122._4_4_ = uVar178;
            auVar122._0_4_ = uVar178;
            auVar122._8_4_ = uVar178;
            auVar122._12_4_ = uVar178;
            auVar122._16_4_ = uVar178;
            auVar122._20_4_ = uVar178;
            auVar122._24_4_ = uVar178;
            auVar122._28_4_ = uVar178;
            auVar129 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar107._12_4_ + auVar107._12_4_,
                                                          CONCAT48(auVar107._8_4_ + auVar107._8_4_,
                                                                   CONCAT44(auVar107._4_4_ +
                                                                            auVar107._4_4_,
                                                                            auVar107._0_4_ +
                                                                            auVar107._0_4_)))),
                                       auVar122);
            uVar29 = vcmpps_avx512vl(local_7a0,auVar129,6);
            uVar92 = uVar92 & uVar29;
            bVar90 = (byte)uVar92;
            if (bVar90 != 0) {
              auVar192._0_4_ = auVar119._0_4_ * fVar186;
              auVar192._4_4_ = auVar119._4_4_ * fVar225;
              auVar192._8_4_ = auVar119._8_4_ * fVar226;
              auVar192._12_4_ = auVar119._12_4_ * fVar179;
              auVar192._16_4_ = auVar119._16_4_ * 0.0;
              auVar192._20_4_ = auVar119._20_4_ * 0.0;
              auVar192._24_4_ = auVar119._24_4_ * 0.0;
              auVar192._28_4_ = 0;
              auVar204._8_4_ = 0x3f800000;
              auVar204._0_8_ = 0x3f8000003f800000;
              auVar204._12_4_ = 0x3f800000;
              auVar204._16_4_ = 0x3f800000;
              auVar204._20_4_ = 0x3f800000;
              auVar204._24_4_ = 0x3f800000;
              auVar204._28_4_ = 0x3f800000;
              auVar129 = vsubps_avx(auVar204,auVar192);
              auVar140._0_4_ =
                   (uint)(bVar82 & 1) * (int)auVar192._0_4_ |
                   (uint)!(bool)(bVar82 & 1) * auVar129._0_4_;
              bVar13 = (bool)((byte)(uVar83 >> 1) & 1);
              auVar140._4_4_ = (uint)bVar13 * (int)auVar192._4_4_ | (uint)!bVar13 * auVar129._4_4_;
              bVar13 = (bool)((byte)(uVar83 >> 2) & 1);
              auVar140._8_4_ = (uint)bVar13 * (int)auVar192._8_4_ | (uint)!bVar13 * auVar129._8_4_;
              bVar13 = (bool)((byte)(uVar83 >> 3) & 1);
              auVar140._12_4_ =
                   (uint)bVar13 * (int)auVar192._12_4_ | (uint)!bVar13 * auVar129._12_4_;
              bVar13 = (bool)((byte)(uVar83 >> 4) & 1);
              auVar140._16_4_ =
                   (uint)bVar13 * (int)auVar192._16_4_ | (uint)!bVar13 * auVar129._16_4_;
              bVar13 = (bool)((byte)(uVar83 >> 5) & 1);
              auVar140._20_4_ =
                   (uint)bVar13 * (int)auVar192._20_4_ | (uint)!bVar13 * auVar129._20_4_;
              bVar13 = (bool)((byte)(uVar83 >> 6) & 1);
              auVar140._24_4_ =
                   (uint)bVar13 * (int)auVar192._24_4_ | (uint)!bVar13 * auVar129._24_4_;
              auVar140._28_4_ = (uint)!SUB81(uVar83 >> 7,0) * auVar129._28_4_;
              auVar35._8_4_ = 0x40000000;
              auVar35._0_8_ = 0x4000000040000000;
              auVar35._12_4_ = 0x40000000;
              auVar35._16_4_ = 0x40000000;
              auVar35._20_4_ = 0x40000000;
              auVar35._24_4_ = 0x40000000;
              auVar35._28_4_ = 0x40000000;
              local_5c0 = vfmsub132ps_avx512vl(auVar140,auVar204,auVar35);
              local_580 = 0;
              local_570 = local_840;
              uStack_568 = uStack_838;
              local_560 = local_850;
              uStack_558 = uStack_848;
              local_550 = local_860;
              uStack_548 = uStack_858;
              local_540 = local_870;
              uStack_538 = uStack_868;
              if ((pGVar88->mask & *(uint *)(ray + k * 4 + 0x240)) != 0) {
                fVar186 = 1.0 / auVar123._0_4_;
                local_520[0] = fVar186 * (local_5e0._0_4_ + 0.0);
                local_520[1] = fVar186 * (local_5e0._4_4_ + 1.0);
                local_520[2] = fVar186 * (local_5e0._8_4_ + 2.0);
                local_520[3] = fVar186 * (local_5e0._12_4_ + 3.0);
                fStack_510 = fVar186 * (local_5e0._16_4_ + 4.0);
                fStack_50c = fVar186 * (local_5e0._20_4_ + 5.0);
                fStack_508 = fVar186 * (local_5e0._24_4_ + 6.0);
                fStack_504 = local_5e0._28_4_ + 7.0;
                local_500 = local_5c0;
                local_4e0 = local_7a0;
                auVar171._8_4_ = 0x7f800000;
                auVar171._0_8_ = 0x7f8000007f800000;
                auVar171._12_4_ = 0x7f800000;
                auVar171._16_4_ = 0x7f800000;
                auVar171._20_4_ = 0x7f800000;
                auVar171._24_4_ = 0x7f800000;
                auVar171._28_4_ = 0x7f800000;
                auVar129 = vblendmps_avx512vl(auVar171,local_7a0);
                auVar141._0_4_ =
                     (uint)(bVar90 & 1) * auVar129._0_4_ | (uint)!(bool)(bVar90 & 1) * 0x7f800000;
                bVar13 = (bool)((byte)(uVar92 >> 1) & 1);
                auVar141._4_4_ = (uint)bVar13 * auVar129._4_4_ | (uint)!bVar13 * 0x7f800000;
                bVar13 = (bool)((byte)(uVar92 >> 2) & 1);
                auVar141._8_4_ = (uint)bVar13 * auVar129._8_4_ | (uint)!bVar13 * 0x7f800000;
                bVar13 = (bool)((byte)(uVar92 >> 3) & 1);
                auVar141._12_4_ = (uint)bVar13 * auVar129._12_4_ | (uint)!bVar13 * 0x7f800000;
                bVar13 = (bool)((byte)(uVar92 >> 4) & 1);
                auVar141._16_4_ = (uint)bVar13 * auVar129._16_4_ | (uint)!bVar13 * 0x7f800000;
                bVar13 = (bool)((byte)(uVar92 >> 5) & 1);
                auVar141._20_4_ = (uint)bVar13 * auVar129._20_4_ | (uint)!bVar13 * 0x7f800000;
                bVar13 = (bool)((byte)(uVar92 >> 6) & 1);
                auVar141._24_4_ = (uint)bVar13 * auVar129._24_4_ | (uint)!bVar13 * 0x7f800000;
                bVar13 = SUB81(uVar92 >> 7,0);
                auVar141._28_4_ = (uint)bVar13 * auVar129._28_4_ | (uint)!bVar13 * 0x7f800000;
                auVar129 = vshufps_avx(auVar141,auVar141,0xb1);
                auVar129 = vminps_avx(auVar141,auVar129);
                auVar130 = vshufpd_avx(auVar129,auVar129,5);
                auVar129 = vminps_avx(auVar129,auVar130);
                auVar130 = vpermpd_avx2(auVar129,0x4e);
                auVar129 = vminps_avx(auVar129,auVar130);
                uVar180 = vcmpps_avx512vl(auVar141,auVar129,0);
                uVar84 = (uint)uVar92;
                if ((bVar90 & (byte)uVar180) != 0) {
                  uVar84 = (uint)(bVar90 & (byte)uVar180);
                }
                uVar31 = 0;
                for (; (uVar84 & 1) == 0; uVar84 = uVar84 >> 1 | 0x80000000) {
                  uVar31 = uVar31 + 1;
                }
                uVar83 = (ulong)uVar31;
                if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                   (pGVar88->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                  local_780._0_16_ = ZEXT416(*(uint *)(ray + k * 4 + 0x200));
                  local_5a0 = local_7a0;
                  local_57c = iVar8;
                  do {
                    local_200 = vbroadcastss_avx512f(ZEXT416((uint)local_520[uVar83]));
                    local_1c0 = vbroadcastss_avx512f(ZEXT416(*(uint *)(local_500 + uVar83 * 4)));
                    *(undefined4 *)(ray + k * 4 + 0x200) = *(undefined4 *)(local_4e0 + uVar83 * 4);
                    local_830.context = context->user;
                    fVar179 = local_200._0_4_;
                    fVar225 = 1.0 - fVar179;
                    fVar186 = fVar225 * fVar225 * -3.0;
                    auVar107 = vfmadd231ss_fma(ZEXT416((uint)(fVar225 * fVar225)),
                                               ZEXT416((uint)(fVar179 * fVar225)),
                                               ZEXT416(0xc0000000));
                    auVar110 = vfmsub132ss_fma(ZEXT416((uint)(fVar179 * fVar225)),
                                               ZEXT416((uint)(fVar179 * fVar179)),
                                               ZEXT416(0x40000000));
                    fVar225 = auVar107._0_4_ * 3.0;
                    fVar226 = auVar110._0_4_ * 3.0;
                    fVar179 = fVar179 * fVar179 * 3.0;
                    auVar218._0_4_ = fVar179 * fVar27;
                    auVar218._4_4_ = fVar179 * fVar65;
                    auVar218._8_4_ = fVar179 * fVar66;
                    auVar218._12_4_ = fVar179 * fVar67;
                    auVar167._4_4_ = fVar226;
                    auVar167._0_4_ = fVar226;
                    auVar167._8_4_ = fVar226;
                    auVar167._12_4_ = fVar226;
                    auVar107 = vfmadd132ps_fma(auVar167,auVar218,auVar104);
                    auVar203._4_4_ = fVar225;
                    auVar203._0_4_ = fVar225;
                    auVar203._8_4_ = fVar225;
                    auVar203._12_4_ = fVar225;
                    auVar107 = vfmadd132ps_fma(auVar203,auVar107,auVar6);
                    auVar168._4_4_ = fVar186;
                    auVar168._0_4_ = fVar186;
                    auVar168._8_4_ = fVar186;
                    auVar168._12_4_ = fVar186;
                    auVar107 = vfmadd132ps_fma(auVar168,auVar107,auVar108);
                    auVar155 = vbroadcastss_avx512f(auVar107);
                    auVar212 = vbroadcastss_avx512f(ZEXT416(1));
                    auVar212 = vpermps_avx512f(auVar212,ZEXT1664(auVar107));
                    auVar219 = vbroadcastss_avx512f(ZEXT416(2));
                    local_240 = vpermps_avx512f(auVar219,ZEXT1664(auVar107));
                    local_2c0[0] = (RTCHitN)auVar155[0];
                    local_2c0[1] = (RTCHitN)auVar155[1];
                    local_2c0[2] = (RTCHitN)auVar155[2];
                    local_2c0[3] = (RTCHitN)auVar155[3];
                    local_2c0[4] = (RTCHitN)auVar155[4];
                    local_2c0[5] = (RTCHitN)auVar155[5];
                    local_2c0[6] = (RTCHitN)auVar155[6];
                    local_2c0[7] = (RTCHitN)auVar155[7];
                    local_2c0[8] = (RTCHitN)auVar155[8];
                    local_2c0[9] = (RTCHitN)auVar155[9];
                    local_2c0[10] = (RTCHitN)auVar155[10];
                    local_2c0[0xb] = (RTCHitN)auVar155[0xb];
                    local_2c0[0xc] = (RTCHitN)auVar155[0xc];
                    local_2c0[0xd] = (RTCHitN)auVar155[0xd];
                    local_2c0[0xe] = (RTCHitN)auVar155[0xe];
                    local_2c0[0xf] = (RTCHitN)auVar155[0xf];
                    local_2c0[0x10] = (RTCHitN)auVar155[0x10];
                    local_2c0[0x11] = (RTCHitN)auVar155[0x11];
                    local_2c0[0x12] = (RTCHitN)auVar155[0x12];
                    local_2c0[0x13] = (RTCHitN)auVar155[0x13];
                    local_2c0[0x14] = (RTCHitN)auVar155[0x14];
                    local_2c0[0x15] = (RTCHitN)auVar155[0x15];
                    local_2c0[0x16] = (RTCHitN)auVar155[0x16];
                    local_2c0[0x17] = (RTCHitN)auVar155[0x17];
                    local_2c0[0x18] = (RTCHitN)auVar155[0x18];
                    local_2c0[0x19] = (RTCHitN)auVar155[0x19];
                    local_2c0[0x1a] = (RTCHitN)auVar155[0x1a];
                    local_2c0[0x1b] = (RTCHitN)auVar155[0x1b];
                    local_2c0[0x1c] = (RTCHitN)auVar155[0x1c];
                    local_2c0[0x1d] = (RTCHitN)auVar155[0x1d];
                    local_2c0[0x1e] = (RTCHitN)auVar155[0x1e];
                    local_2c0[0x1f] = (RTCHitN)auVar155[0x1f];
                    local_2c0[0x20] = (RTCHitN)auVar155[0x20];
                    local_2c0[0x21] = (RTCHitN)auVar155[0x21];
                    local_2c0[0x22] = (RTCHitN)auVar155[0x22];
                    local_2c0[0x23] = (RTCHitN)auVar155[0x23];
                    local_2c0[0x24] = (RTCHitN)auVar155[0x24];
                    local_2c0[0x25] = (RTCHitN)auVar155[0x25];
                    local_2c0[0x26] = (RTCHitN)auVar155[0x26];
                    local_2c0[0x27] = (RTCHitN)auVar155[0x27];
                    local_2c0[0x28] = (RTCHitN)auVar155[0x28];
                    local_2c0[0x29] = (RTCHitN)auVar155[0x29];
                    local_2c0[0x2a] = (RTCHitN)auVar155[0x2a];
                    local_2c0[0x2b] = (RTCHitN)auVar155[0x2b];
                    local_2c0[0x2c] = (RTCHitN)auVar155[0x2c];
                    local_2c0[0x2d] = (RTCHitN)auVar155[0x2d];
                    local_2c0[0x2e] = (RTCHitN)auVar155[0x2e];
                    local_2c0[0x2f] = (RTCHitN)auVar155[0x2f];
                    local_2c0[0x30] = (RTCHitN)auVar155[0x30];
                    local_2c0[0x31] = (RTCHitN)auVar155[0x31];
                    local_2c0[0x32] = (RTCHitN)auVar155[0x32];
                    local_2c0[0x33] = (RTCHitN)auVar155[0x33];
                    local_2c0[0x34] = (RTCHitN)auVar155[0x34];
                    local_2c0[0x35] = (RTCHitN)auVar155[0x35];
                    local_2c0[0x36] = (RTCHitN)auVar155[0x36];
                    local_2c0[0x37] = (RTCHitN)auVar155[0x37];
                    local_2c0[0x38] = (RTCHitN)auVar155[0x38];
                    local_2c0[0x39] = (RTCHitN)auVar155[0x39];
                    local_2c0[0x3a] = (RTCHitN)auVar155[0x3a];
                    local_2c0[0x3b] = (RTCHitN)auVar155[0x3b];
                    local_2c0[0x3c] = (RTCHitN)auVar155[0x3c];
                    local_2c0[0x3d] = (RTCHitN)auVar155[0x3d];
                    local_2c0[0x3e] = (RTCHitN)auVar155[0x3e];
                    local_2c0[0x3f] = (RTCHitN)auVar155[0x3f];
                    local_280 = auVar212;
                    local_180 = local_340._0_8_;
                    uStack_178 = local_340._8_8_;
                    uStack_170 = local_340._16_8_;
                    uStack_168 = local_340._24_8_;
                    uStack_160 = local_340._32_8_;
                    uStack_158 = local_340._40_8_;
                    uStack_150 = local_340._48_8_;
                    uStack_148 = local_340._56_8_;
                    auVar155 = vmovdqa64_avx512f(local_300);
                    local_140 = vmovdqa64_avx512f(auVar155);
                    auVar129 = vpcmpeqd_avx2(auVar155._0_32_,auVar155._0_32_);
                    local_7e8[3] = auVar129;
                    local_7e8[2] = auVar129;
                    local_7e8[1] = auVar129;
                    *local_7e8 = auVar129;
                    local_100 = vbroadcastss_avx512f(ZEXT416((local_830.context)->instID[0]));
                    local_c0 = vbroadcastss_avx512f(ZEXT416((local_830.context)->instPrimID[0]));
                    auVar155 = vmovdqa64_avx512f(local_380);
                    local_740 = vmovdqa64_avx512f(auVar155);
                    local_830.valid = (int *)local_740;
                    local_830.geometryUserPtr = pGVar88->userPtr;
                    local_830.hit = local_2c0;
                    local_830.N = 0x10;
                    local_830.ray = (RTCRayN *)ray;
                    if (pGVar88->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                      auVar212 = ZEXT1664(auVar212._0_16_);
                      auVar219 = ZEXT1664(auVar219._0_16_);
                      (*pGVar88->intersectionFilterN)(&local_830);
                      auVar222 = ZEXT3264(local_7a0);
                      auVar177 = ZEXT464(0xbf800000);
                      auVar107 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                      auVar240 = ZEXT1664(auVar107);
                      auVar155 = vmovdqa64_avx512f(local_740);
                    }
                    uVar180 = vptestmd_avx512f(auVar155,auVar155);
                    if ((short)uVar180 == 0) {
LAB_018b59b2:
                      *(undefined4 *)(ray + k * 4 + 0x200) = local_780._0_4_;
                    }
                    else {
                      p_Var12 = context->args->filter;
                      if ((p_Var12 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar88->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar212 = ZEXT1664(auVar212._0_16_);
                        auVar219 = ZEXT1664(auVar219._0_16_);
                        (*p_Var12)(&local_830);
                        auVar222 = ZEXT3264(local_7a0);
                        auVar177 = ZEXT464(0xbf800000);
                        auVar107 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                        auVar240 = ZEXT1664(auVar107);
                        auVar155 = vmovdqa64_avx512f(local_740);
                      }
                      uVar29 = vptestmd_avx512f(auVar155,auVar155);
                      if ((short)uVar29 == 0) goto LAB_018b59b2;
                      iVar1 = *(int *)(local_830.hit + 4);
                      iVar2 = *(int *)(local_830.hit + 8);
                      iVar68 = *(int *)(local_830.hit + 0xc);
                      iVar69 = *(int *)(local_830.hit + 0x10);
                      iVar70 = *(int *)(local_830.hit + 0x14);
                      iVar71 = *(int *)(local_830.hit + 0x18);
                      iVar72 = *(int *)(local_830.hit + 0x1c);
                      iVar73 = *(int *)(local_830.hit + 0x20);
                      iVar74 = *(int *)(local_830.hit + 0x24);
                      iVar75 = *(int *)(local_830.hit + 0x28);
                      iVar76 = *(int *)(local_830.hit + 0x2c);
                      iVar77 = *(int *)(local_830.hit + 0x30);
                      iVar78 = *(int *)(local_830.hit + 0x34);
                      iVar79 = *(int *)(local_830.hit + 0x38);
                      iVar80 = *(int *)(local_830.hit + 0x3c);
                      bVar90 = (byte)uVar29;
                      bVar13 = (bool)((byte)(uVar29 >> 1) & 1);
                      bVar14 = (bool)((byte)(uVar29 >> 2) & 1);
                      bVar15 = (bool)((byte)(uVar29 >> 3) & 1);
                      bVar16 = (bool)((byte)(uVar29 >> 4) & 1);
                      bVar17 = (bool)((byte)(uVar29 >> 5) & 1);
                      bVar18 = (bool)((byte)(uVar29 >> 6) & 1);
                      bVar19 = (bool)((byte)(uVar29 >> 7) & 1);
                      bVar82 = (byte)(uVar29 >> 8);
                      bVar20 = (bool)((byte)(uVar29 >> 9) & 1);
                      bVar21 = (bool)((byte)(uVar29 >> 10) & 1);
                      bVar22 = (bool)((byte)(uVar29 >> 0xb) & 1);
                      bVar23 = (bool)((byte)(uVar29 >> 0xc) & 1);
                      bVar24 = (bool)((byte)(uVar29 >> 0xd) & 1);
                      bVar25 = (bool)((byte)(uVar29 >> 0xe) & 1);
                      bVar26 = SUB81(uVar29 >> 0xf,0);
                      *(uint *)(local_830.ray + 0x300) =
                           (uint)(bVar90 & 1) * *(int *)local_830.hit |
                           (uint)!(bool)(bVar90 & 1) * *(int *)(local_830.ray + 0x300);
                      *(uint *)(local_830.ray + 0x304) =
                           (uint)bVar13 * iVar1 | (uint)!bVar13 * *(int *)(local_830.ray + 0x304);
                      *(uint *)(local_830.ray + 0x308) =
                           (uint)bVar14 * iVar2 | (uint)!bVar14 * *(int *)(local_830.ray + 0x308);
                      *(uint *)(local_830.ray + 0x30c) =
                           (uint)bVar15 * iVar68 | (uint)!bVar15 * *(int *)(local_830.ray + 0x30c);
                      *(uint *)(local_830.ray + 0x310) =
                           (uint)bVar16 * iVar69 | (uint)!bVar16 * *(int *)(local_830.ray + 0x310);
                      *(uint *)(local_830.ray + 0x314) =
                           (uint)bVar17 * iVar70 | (uint)!bVar17 * *(int *)(local_830.ray + 0x314);
                      *(uint *)(local_830.ray + 0x318) =
                           (uint)bVar18 * iVar71 | (uint)!bVar18 * *(int *)(local_830.ray + 0x318);
                      *(uint *)(local_830.ray + 0x31c) =
                           (uint)bVar19 * iVar72 | (uint)!bVar19 * *(int *)(local_830.ray + 0x31c);
                      *(uint *)(local_830.ray + 800) =
                           (uint)(bVar82 & 1) * iVar73 |
                           (uint)!(bool)(bVar82 & 1) * *(int *)(local_830.ray + 800);
                      *(uint *)(local_830.ray + 0x324) =
                           (uint)bVar20 * iVar74 | (uint)!bVar20 * *(int *)(local_830.ray + 0x324);
                      *(uint *)(local_830.ray + 0x328) =
                           (uint)bVar21 * iVar75 | (uint)!bVar21 * *(int *)(local_830.ray + 0x328);
                      *(uint *)(local_830.ray + 0x32c) =
                           (uint)bVar22 * iVar76 | (uint)!bVar22 * *(int *)(local_830.ray + 0x32c);
                      *(uint *)(local_830.ray + 0x330) =
                           (uint)bVar23 * iVar77 | (uint)!bVar23 * *(int *)(local_830.ray + 0x330);
                      *(uint *)(local_830.ray + 0x334) =
                           (uint)bVar24 * iVar78 | (uint)!bVar24 * *(int *)(local_830.ray + 0x334);
                      *(uint *)(local_830.ray + 0x338) =
                           (uint)bVar25 * iVar79 | (uint)!bVar25 * *(int *)(local_830.ray + 0x338);
                      *(uint *)(local_830.ray + 0x33c) =
                           (uint)bVar26 * iVar80 | (uint)!bVar26 * *(int *)(local_830.ray + 0x33c);
                      iVar1 = *(int *)(local_830.hit + 0x44);
                      iVar2 = *(int *)(local_830.hit + 0x48);
                      iVar68 = *(int *)(local_830.hit + 0x4c);
                      iVar69 = *(int *)(local_830.hit + 0x50);
                      iVar70 = *(int *)(local_830.hit + 0x54);
                      iVar71 = *(int *)(local_830.hit + 0x58);
                      iVar72 = *(int *)(local_830.hit + 0x5c);
                      iVar73 = *(int *)(local_830.hit + 0x60);
                      iVar74 = *(int *)(local_830.hit + 100);
                      iVar75 = *(int *)(local_830.hit + 0x68);
                      iVar76 = *(int *)(local_830.hit + 0x6c);
                      iVar77 = *(int *)(local_830.hit + 0x70);
                      iVar78 = *(int *)(local_830.hit + 0x74);
                      iVar79 = *(int *)(local_830.hit + 0x78);
                      iVar80 = *(int *)(local_830.hit + 0x7c);
                      bVar13 = (bool)((byte)(uVar29 >> 1) & 1);
                      bVar14 = (bool)((byte)(uVar29 >> 2) & 1);
                      bVar15 = (bool)((byte)(uVar29 >> 3) & 1);
                      bVar16 = (bool)((byte)(uVar29 >> 4) & 1);
                      bVar17 = (bool)((byte)(uVar29 >> 5) & 1);
                      bVar18 = (bool)((byte)(uVar29 >> 6) & 1);
                      bVar19 = (bool)((byte)(uVar29 >> 7) & 1);
                      bVar20 = (bool)((byte)(uVar29 >> 9) & 1);
                      bVar21 = (bool)((byte)(uVar29 >> 10) & 1);
                      bVar22 = (bool)((byte)(uVar29 >> 0xb) & 1);
                      bVar23 = (bool)((byte)(uVar29 >> 0xc) & 1);
                      bVar24 = (bool)((byte)(uVar29 >> 0xd) & 1);
                      bVar25 = (bool)((byte)(uVar29 >> 0xe) & 1);
                      bVar26 = SUB81(uVar29 >> 0xf,0);
                      *(uint *)(local_830.ray + 0x340) =
                           (uint)(bVar90 & 1) * *(int *)(local_830.hit + 0x40) |
                           (uint)!(bool)(bVar90 & 1) * *(int *)(local_830.ray + 0x340);
                      *(uint *)(local_830.ray + 0x344) =
                           (uint)bVar13 * iVar1 | (uint)!bVar13 * *(int *)(local_830.ray + 0x344);
                      *(uint *)(local_830.ray + 0x348) =
                           (uint)bVar14 * iVar2 | (uint)!bVar14 * *(int *)(local_830.ray + 0x348);
                      *(uint *)(local_830.ray + 0x34c) =
                           (uint)bVar15 * iVar68 | (uint)!bVar15 * *(int *)(local_830.ray + 0x34c);
                      *(uint *)(local_830.ray + 0x350) =
                           (uint)bVar16 * iVar69 | (uint)!bVar16 * *(int *)(local_830.ray + 0x350);
                      *(uint *)(local_830.ray + 0x354) =
                           (uint)bVar17 * iVar70 | (uint)!bVar17 * *(int *)(local_830.ray + 0x354);
                      *(uint *)(local_830.ray + 0x358) =
                           (uint)bVar18 * iVar71 | (uint)!bVar18 * *(int *)(local_830.ray + 0x358);
                      *(uint *)(local_830.ray + 0x35c) =
                           (uint)bVar19 * iVar72 | (uint)!bVar19 * *(int *)(local_830.ray + 0x35c);
                      *(uint *)(local_830.ray + 0x360) =
                           (uint)(bVar82 & 1) * iVar73 |
                           (uint)!(bool)(bVar82 & 1) * *(int *)(local_830.ray + 0x360);
                      *(uint *)(local_830.ray + 0x364) =
                           (uint)bVar20 * iVar74 | (uint)!bVar20 * *(int *)(local_830.ray + 0x364);
                      *(uint *)(local_830.ray + 0x368) =
                           (uint)bVar21 * iVar75 | (uint)!bVar21 * *(int *)(local_830.ray + 0x368);
                      *(uint *)(local_830.ray + 0x36c) =
                           (uint)bVar22 * iVar76 | (uint)!bVar22 * *(int *)(local_830.ray + 0x36c);
                      *(uint *)(local_830.ray + 0x370) =
                           (uint)bVar23 * iVar77 | (uint)!bVar23 * *(int *)(local_830.ray + 0x370);
                      *(uint *)(local_830.ray + 0x374) =
                           (uint)bVar24 * iVar78 | (uint)!bVar24 * *(int *)(local_830.ray + 0x374);
                      *(uint *)(local_830.ray + 0x378) =
                           (uint)bVar25 * iVar79 | (uint)!bVar25 * *(int *)(local_830.ray + 0x378);
                      *(uint *)(local_830.ray + 0x37c) =
                           (uint)bVar26 * iVar80 | (uint)!bVar26 * *(int *)(local_830.ray + 0x37c);
                      iVar1 = *(int *)(local_830.hit + 0x84);
                      iVar2 = *(int *)(local_830.hit + 0x88);
                      iVar68 = *(int *)(local_830.hit + 0x8c);
                      iVar69 = *(int *)(local_830.hit + 0x90);
                      iVar70 = *(int *)(local_830.hit + 0x94);
                      iVar71 = *(int *)(local_830.hit + 0x98);
                      iVar72 = *(int *)(local_830.hit + 0x9c);
                      iVar73 = *(int *)(local_830.hit + 0xa0);
                      iVar74 = *(int *)(local_830.hit + 0xa4);
                      iVar75 = *(int *)(local_830.hit + 0xa8);
                      iVar76 = *(int *)(local_830.hit + 0xac);
                      iVar77 = *(int *)(local_830.hit + 0xb0);
                      iVar78 = *(int *)(local_830.hit + 0xb4);
                      iVar79 = *(int *)(local_830.hit + 0xb8);
                      iVar80 = *(int *)(local_830.hit + 0xbc);
                      bVar13 = (bool)((byte)(uVar29 >> 1) & 1);
                      bVar14 = (bool)((byte)(uVar29 >> 2) & 1);
                      bVar15 = (bool)((byte)(uVar29 >> 3) & 1);
                      bVar16 = (bool)((byte)(uVar29 >> 4) & 1);
                      bVar17 = (bool)((byte)(uVar29 >> 5) & 1);
                      bVar18 = (bool)((byte)(uVar29 >> 6) & 1);
                      bVar19 = (bool)((byte)(uVar29 >> 7) & 1);
                      bVar20 = (bool)((byte)(uVar29 >> 9) & 1);
                      bVar21 = (bool)((byte)(uVar29 >> 10) & 1);
                      bVar22 = (bool)((byte)(uVar29 >> 0xb) & 1);
                      bVar23 = (bool)((byte)(uVar29 >> 0xc) & 1);
                      bVar24 = (bool)((byte)(uVar29 >> 0xd) & 1);
                      bVar25 = (bool)((byte)(uVar29 >> 0xe) & 1);
                      bVar26 = SUB81(uVar29 >> 0xf,0);
                      *(uint *)(local_830.ray + 0x380) =
                           (uint)(bVar90 & 1) * *(int *)(local_830.hit + 0x80) |
                           (uint)!(bool)(bVar90 & 1) * *(int *)(local_830.ray + 0x380);
                      *(uint *)(local_830.ray + 900) =
                           (uint)bVar13 * iVar1 | (uint)!bVar13 * *(int *)(local_830.ray + 900);
                      *(uint *)(local_830.ray + 0x388) =
                           (uint)bVar14 * iVar2 | (uint)!bVar14 * *(int *)(local_830.ray + 0x388);
                      *(uint *)(local_830.ray + 0x38c) =
                           (uint)bVar15 * iVar68 | (uint)!bVar15 * *(int *)(local_830.ray + 0x38c);
                      *(uint *)(local_830.ray + 0x390) =
                           (uint)bVar16 * iVar69 | (uint)!bVar16 * *(int *)(local_830.ray + 0x390);
                      *(uint *)(local_830.ray + 0x394) =
                           (uint)bVar17 * iVar70 | (uint)!bVar17 * *(int *)(local_830.ray + 0x394);
                      *(uint *)(local_830.ray + 0x398) =
                           (uint)bVar18 * iVar71 | (uint)!bVar18 * *(int *)(local_830.ray + 0x398);
                      *(uint *)(local_830.ray + 0x39c) =
                           (uint)bVar19 * iVar72 | (uint)!bVar19 * *(int *)(local_830.ray + 0x39c);
                      *(uint *)(local_830.ray + 0x3a0) =
                           (uint)(bVar82 & 1) * iVar73 |
                           (uint)!(bool)(bVar82 & 1) * *(int *)(local_830.ray + 0x3a0);
                      *(uint *)(local_830.ray + 0x3a4) =
                           (uint)bVar20 * iVar74 | (uint)!bVar20 * *(int *)(local_830.ray + 0x3a4);
                      *(uint *)(local_830.ray + 0x3a8) =
                           (uint)bVar21 * iVar75 | (uint)!bVar21 * *(int *)(local_830.ray + 0x3a8);
                      *(uint *)(local_830.ray + 0x3ac) =
                           (uint)bVar22 * iVar76 | (uint)!bVar22 * *(int *)(local_830.ray + 0x3ac);
                      *(uint *)(local_830.ray + 0x3b0) =
                           (uint)bVar23 * iVar77 | (uint)!bVar23 * *(int *)(local_830.ray + 0x3b0);
                      *(uint *)(local_830.ray + 0x3b4) =
                           (uint)bVar24 * iVar78 | (uint)!bVar24 * *(int *)(local_830.ray + 0x3b4);
                      *(uint *)(local_830.ray + 0x3b8) =
                           (uint)bVar25 * iVar79 | (uint)!bVar25 * *(int *)(local_830.ray + 0x3b8);
                      *(uint *)(local_830.ray + 0x3bc) =
                           (uint)bVar26 * iVar80 | (uint)!bVar26 * *(int *)(local_830.ray + 0x3bc);
                      iVar1 = *(int *)(local_830.hit + 0xc4);
                      iVar2 = *(int *)(local_830.hit + 200);
                      iVar68 = *(int *)(local_830.hit + 0xcc);
                      iVar69 = *(int *)(local_830.hit + 0xd0);
                      iVar70 = *(int *)(local_830.hit + 0xd4);
                      iVar71 = *(int *)(local_830.hit + 0xd8);
                      iVar72 = *(int *)(local_830.hit + 0xdc);
                      iVar73 = *(int *)(local_830.hit + 0xe0);
                      iVar74 = *(int *)(local_830.hit + 0xe4);
                      iVar75 = *(int *)(local_830.hit + 0xe8);
                      iVar76 = *(int *)(local_830.hit + 0xec);
                      iVar77 = *(int *)(local_830.hit + 0xf0);
                      iVar78 = *(int *)(local_830.hit + 0xf4);
                      iVar79 = *(int *)(local_830.hit + 0xf8);
                      iVar80 = *(int *)(local_830.hit + 0xfc);
                      bVar13 = (bool)((byte)(uVar29 >> 1) & 1);
                      bVar14 = (bool)((byte)(uVar29 >> 2) & 1);
                      bVar15 = (bool)((byte)(uVar29 >> 3) & 1);
                      bVar16 = (bool)((byte)(uVar29 >> 4) & 1);
                      bVar17 = (bool)((byte)(uVar29 >> 5) & 1);
                      bVar18 = (bool)((byte)(uVar29 >> 6) & 1);
                      bVar19 = (bool)((byte)(uVar29 >> 7) & 1);
                      bVar20 = (bool)((byte)(uVar29 >> 9) & 1);
                      bVar21 = (bool)((byte)(uVar29 >> 10) & 1);
                      bVar22 = (bool)((byte)(uVar29 >> 0xb) & 1);
                      bVar23 = (bool)((byte)(uVar29 >> 0xc) & 1);
                      bVar24 = (bool)((byte)(uVar29 >> 0xd) & 1);
                      bVar25 = (bool)((byte)(uVar29 >> 0xe) & 1);
                      bVar26 = SUB81(uVar29 >> 0xf,0);
                      *(uint *)(local_830.ray + 0x3c0) =
                           (uint)(bVar90 & 1) * *(int *)(local_830.hit + 0xc0) |
                           (uint)!(bool)(bVar90 & 1) * *(int *)(local_830.ray + 0x3c0);
                      *(uint *)(local_830.ray + 0x3c4) =
                           (uint)bVar13 * iVar1 | (uint)!bVar13 * *(int *)(local_830.ray + 0x3c4);
                      *(uint *)(local_830.ray + 0x3c8) =
                           (uint)bVar14 * iVar2 | (uint)!bVar14 * *(int *)(local_830.ray + 0x3c8);
                      *(uint *)(local_830.ray + 0x3cc) =
                           (uint)bVar15 * iVar68 | (uint)!bVar15 * *(int *)(local_830.ray + 0x3cc);
                      *(uint *)(local_830.ray + 0x3d0) =
                           (uint)bVar16 * iVar69 | (uint)!bVar16 * *(int *)(local_830.ray + 0x3d0);
                      *(uint *)(local_830.ray + 0x3d4) =
                           (uint)bVar17 * iVar70 | (uint)!bVar17 * *(int *)(local_830.ray + 0x3d4);
                      *(uint *)(local_830.ray + 0x3d8) =
                           (uint)bVar18 * iVar71 | (uint)!bVar18 * *(int *)(local_830.ray + 0x3d8);
                      *(uint *)(local_830.ray + 0x3dc) =
                           (uint)bVar19 * iVar72 | (uint)!bVar19 * *(int *)(local_830.ray + 0x3dc);
                      *(uint *)(local_830.ray + 0x3e0) =
                           (uint)(bVar82 & 1) * iVar73 |
                           (uint)!(bool)(bVar82 & 1) * *(int *)(local_830.ray + 0x3e0);
                      *(uint *)(local_830.ray + 0x3e4) =
                           (uint)bVar20 * iVar74 | (uint)!bVar20 * *(int *)(local_830.ray + 0x3e4);
                      *(uint *)(local_830.ray + 1000) =
                           (uint)bVar21 * iVar75 | (uint)!bVar21 * *(int *)(local_830.ray + 1000);
                      *(uint *)(local_830.ray + 0x3ec) =
                           (uint)bVar22 * iVar76 | (uint)!bVar22 * *(int *)(local_830.ray + 0x3ec);
                      *(uint *)(local_830.ray + 0x3f0) =
                           (uint)bVar23 * iVar77 | (uint)!bVar23 * *(int *)(local_830.ray + 0x3f0);
                      *(uint *)(local_830.ray + 0x3f4) =
                           (uint)bVar24 * iVar78 | (uint)!bVar24 * *(int *)(local_830.ray + 0x3f4);
                      *(uint *)(local_830.ray + 0x3f8) =
                           (uint)bVar25 * iVar79 | (uint)!bVar25 * *(int *)(local_830.ray + 0x3f8);
                      *(uint *)(local_830.ray + 0x3fc) =
                           (uint)bVar26 * iVar80 | (uint)!bVar26 * *(int *)(local_830.ray + 0x3fc);
                      iVar1 = *(int *)(local_830.hit + 0x104);
                      iVar2 = *(int *)(local_830.hit + 0x108);
                      iVar68 = *(int *)(local_830.hit + 0x10c);
                      iVar69 = *(int *)(local_830.hit + 0x110);
                      iVar70 = *(int *)(local_830.hit + 0x114);
                      iVar71 = *(int *)(local_830.hit + 0x118);
                      iVar72 = *(int *)(local_830.hit + 0x11c);
                      iVar73 = *(int *)(local_830.hit + 0x120);
                      iVar74 = *(int *)(local_830.hit + 0x124);
                      iVar75 = *(int *)(local_830.hit + 0x128);
                      iVar76 = *(int *)(local_830.hit + 300);
                      iVar77 = *(int *)(local_830.hit + 0x130);
                      iVar78 = *(int *)(local_830.hit + 0x134);
                      iVar79 = *(int *)(local_830.hit + 0x138);
                      iVar80 = *(int *)(local_830.hit + 0x13c);
                      bVar13 = (bool)((byte)(uVar29 >> 1) & 1);
                      bVar14 = (bool)((byte)(uVar29 >> 2) & 1);
                      bVar15 = (bool)((byte)(uVar29 >> 3) & 1);
                      bVar16 = (bool)((byte)(uVar29 >> 4) & 1);
                      bVar17 = (bool)((byte)(uVar29 >> 5) & 1);
                      bVar18 = (bool)((byte)(uVar29 >> 6) & 1);
                      bVar19 = (bool)((byte)(uVar29 >> 7) & 1);
                      bVar20 = (bool)((byte)(uVar29 >> 9) & 1);
                      bVar21 = (bool)((byte)(uVar29 >> 10) & 1);
                      bVar22 = (bool)((byte)(uVar29 >> 0xb) & 1);
                      bVar23 = (bool)((byte)(uVar29 >> 0xc) & 1);
                      bVar24 = (bool)((byte)(uVar29 >> 0xd) & 1);
                      bVar25 = (bool)((byte)(uVar29 >> 0xe) & 1);
                      bVar26 = SUB81(uVar29 >> 0xf,0);
                      *(uint *)(local_830.ray + 0x400) =
                           (uint)(bVar90 & 1) * *(int *)(local_830.hit + 0x100) |
                           (uint)!(bool)(bVar90 & 1) * *(int *)(local_830.ray + 0x400);
                      *(uint *)(local_830.ray + 0x404) =
                           (uint)bVar13 * iVar1 | (uint)!bVar13 * *(int *)(local_830.ray + 0x404);
                      *(uint *)(local_830.ray + 0x408) =
                           (uint)bVar14 * iVar2 | (uint)!bVar14 * *(int *)(local_830.ray + 0x408);
                      *(uint *)(local_830.ray + 0x40c) =
                           (uint)bVar15 * iVar68 | (uint)!bVar15 * *(int *)(local_830.ray + 0x40c);
                      *(uint *)(local_830.ray + 0x410) =
                           (uint)bVar16 * iVar69 | (uint)!bVar16 * *(int *)(local_830.ray + 0x410);
                      *(uint *)(local_830.ray + 0x414) =
                           (uint)bVar17 * iVar70 | (uint)!bVar17 * *(int *)(local_830.ray + 0x414);
                      *(uint *)(local_830.ray + 0x418) =
                           (uint)bVar18 * iVar71 | (uint)!bVar18 * *(int *)(local_830.ray + 0x418);
                      *(uint *)(local_830.ray + 0x41c) =
                           (uint)bVar19 * iVar72 | (uint)!bVar19 * *(int *)(local_830.ray + 0x41c);
                      *(uint *)(local_830.ray + 0x420) =
                           (uint)(bVar82 & 1) * iVar73 |
                           (uint)!(bool)(bVar82 & 1) * *(int *)(local_830.ray + 0x420);
                      *(uint *)(local_830.ray + 0x424) =
                           (uint)bVar20 * iVar74 | (uint)!bVar20 * *(int *)(local_830.ray + 0x424);
                      *(uint *)(local_830.ray + 0x428) =
                           (uint)bVar21 * iVar75 | (uint)!bVar21 * *(int *)(local_830.ray + 0x428);
                      *(uint *)(local_830.ray + 0x42c) =
                           (uint)bVar22 * iVar76 | (uint)!bVar22 * *(int *)(local_830.ray + 0x42c);
                      *(uint *)(local_830.ray + 0x430) =
                           (uint)bVar23 * iVar77 | (uint)!bVar23 * *(int *)(local_830.ray + 0x430);
                      *(uint *)(local_830.ray + 0x434) =
                           (uint)bVar24 * iVar78 | (uint)!bVar24 * *(int *)(local_830.ray + 0x434);
                      *(uint *)(local_830.ray + 0x438) =
                           (uint)bVar25 * iVar79 | (uint)!bVar25 * *(int *)(local_830.ray + 0x438);
                      *(uint *)(local_830.ray + 0x43c) =
                           (uint)bVar26 * iVar80 | (uint)!bVar26 * *(int *)(local_830.ray + 0x43c);
                      auVar155 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_830.hit + 0x140));
                      auVar155 = vmovdqu32_avx512f(auVar155);
                      *(undefined1 (*) [64])(local_830.ray + 0x440) = auVar155;
                      auVar155 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_830.hit + 0x180));
                      auVar155 = vmovdqu32_avx512f(auVar155);
                      *(undefined1 (*) [64])(local_830.ray + 0x480) = auVar155;
                      auVar155 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_830.hit + 0x1c0));
                      auVar155 = vmovdqa32_avx512f(auVar155);
                      *(undefined1 (*) [64])(local_830.ray + 0x4c0) = auVar155;
                      auVar155 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_830.hit + 0x200));
                      auVar155 = vmovdqa32_avx512f(auVar155);
                      *(undefined1 (*) [64])(local_830.ray + 0x500) = auVar155;
                      local_780._0_4_ = *(undefined4 *)(ray + k * 4 + 0x200);
                      local_780._4_4_ = 0;
                      local_780._8_4_ = 0;
                      local_780._12_4_ = 0;
                    }
                    bVar90 = ~(byte)(1 << ((uint)uVar83 & 0x1f)) & (byte)uVar92;
                    auVar175._4_4_ = local_780._0_4_;
                    auVar175._0_4_ = local_780._0_4_;
                    auVar175._8_4_ = local_780._0_4_;
                    auVar175._12_4_ = local_780._0_4_;
                    auVar175._16_4_ = local_780._0_4_;
                    auVar175._20_4_ = local_780._0_4_;
                    auVar175._24_4_ = local_780._0_4_;
                    auVar175._28_4_ = local_780._0_4_;
                    uVar180 = vcmpps_avx512vl(auVar222._0_32_,auVar175,2);
                    if ((bVar90 & (byte)uVar180) == 0) goto LAB_018b491d;
                    bVar90 = bVar90 & (byte)uVar180;
                    uVar92 = (ulong)bVar90;
                    auVar176._8_4_ = 0x7f800000;
                    auVar176._0_8_ = 0x7f8000007f800000;
                    auVar176._12_4_ = 0x7f800000;
                    auVar176._16_4_ = 0x7f800000;
                    auVar176._20_4_ = 0x7f800000;
                    auVar176._24_4_ = 0x7f800000;
                    auVar176._28_4_ = 0x7f800000;
                    auVar129 = vblendmps_avx512vl(auVar176,auVar222._0_32_);
                    auVar154._0_4_ =
                         (uint)(bVar90 & 1) * auVar129._0_4_ |
                         (uint)!(bool)(bVar90 & 1) * 0x7f800000;
                    bVar13 = (bool)(bVar90 >> 1 & 1);
                    auVar154._4_4_ = (uint)bVar13 * auVar129._4_4_ | (uint)!bVar13 * 0x7f800000;
                    bVar13 = (bool)(bVar90 >> 2 & 1);
                    auVar154._8_4_ = (uint)bVar13 * auVar129._8_4_ | (uint)!bVar13 * 0x7f800000;
                    bVar13 = (bool)(bVar90 >> 3 & 1);
                    auVar154._12_4_ = (uint)bVar13 * auVar129._12_4_ | (uint)!bVar13 * 0x7f800000;
                    bVar13 = (bool)(bVar90 >> 4 & 1);
                    auVar154._16_4_ = (uint)bVar13 * auVar129._16_4_ | (uint)!bVar13 * 0x7f800000;
                    bVar13 = (bool)(bVar90 >> 5 & 1);
                    auVar154._20_4_ = (uint)bVar13 * auVar129._20_4_ | (uint)!bVar13 * 0x7f800000;
                    bVar13 = (bool)(bVar90 >> 6 & 1);
                    auVar154._24_4_ = (uint)bVar13 * auVar129._24_4_ | (uint)!bVar13 * 0x7f800000;
                    auVar154._28_4_ =
                         (uint)(bVar90 >> 7) * auVar129._28_4_ |
                         (uint)!(bool)(bVar90 >> 7) * 0x7f800000;
                    auVar129 = vshufps_avx(auVar154,auVar154,0xb1);
                    auVar129 = vminps_avx(auVar154,auVar129);
                    auVar130 = vshufpd_avx(auVar129,auVar129,5);
                    auVar129 = vminps_avx(auVar129,auVar130);
                    auVar130 = vpermpd_avx2(auVar129,0x4e);
                    auVar129 = vminps_avx(auVar129,auVar130);
                    uVar180 = vcmpps_avx512vl(auVar154,auVar129,0);
                    bVar82 = (byte)uVar180 & bVar90;
                    if (bVar82 != 0) {
                      bVar90 = bVar82;
                    }
                    uVar91 = 0;
                    for (uVar84 = (uint)bVar90; (uVar84 & 1) == 0; uVar84 = uVar84 >> 1 | 0x80000000
                        ) {
                      uVar91 = uVar91 + 1;
                    }
                    uVar83 = (ulong)uVar91;
                  } while( true );
                }
                fVar186 = local_520[uVar83];
                uVar178 = *(undefined4 *)(local_500 + uVar83 * 4);
                fVar226 = 1.0 - fVar186;
                fVar225 = fVar226 * fVar226 * -3.0;
                auVar212 = ZEXT464((uint)fVar225);
                auVar107 = vfmadd231ss_fma(ZEXT416((uint)(fVar226 * fVar226)),
                                           ZEXT416((uint)(fVar186 * fVar226)),ZEXT416(0xc0000000));
                auVar110 = vfmsub132ss_fma(ZEXT416((uint)(fVar186 * fVar226)),
                                           ZEXT416((uint)(fVar186 * fVar186)),ZEXT416(0x40000000));
                fVar226 = auVar107._0_4_ * 3.0;
                fVar179 = auVar110._0_4_ * 3.0;
                fVar185 = fVar186 * fVar186 * 3.0;
                auVar215._0_4_ = fVar185 * fVar27;
                auVar215._4_4_ = fVar185 * fVar65;
                auVar215._8_4_ = fVar185 * fVar66;
                auVar215._12_4_ = fVar185 * fVar67;
                auVar219 = ZEXT1664(auVar215);
                auVar188._4_4_ = fVar179;
                auVar188._0_4_ = fVar179;
                auVar188._8_4_ = fVar179;
                auVar188._12_4_ = fVar179;
                auVar107 = vfmadd132ps_fma(auVar188,auVar215,auVar104);
                auVar200._4_4_ = fVar226;
                auVar200._0_4_ = fVar226;
                auVar200._8_4_ = fVar226;
                auVar200._12_4_ = fVar226;
                auVar107 = vfmadd132ps_fma(auVar200,auVar107,auVar6);
                auVar189._4_4_ = fVar225;
                auVar189._0_4_ = fVar225;
                auVar189._8_4_ = fVar225;
                auVar189._12_4_ = fVar225;
                auVar107 = vfmadd132ps_fma(auVar189,auVar107,auVar108);
                *(undefined4 *)(ray + k * 4 + 0x200) = *(undefined4 *)(local_4e0 + uVar83 * 4);
                *(int *)(ray + k * 4 + 0x300) = auVar107._0_4_;
                uVar9 = vextractps_avx(auVar107,1);
                *(undefined4 *)(ray + k * 4 + 0x340) = uVar9;
                uVar9 = vextractps_avx(auVar107,2);
                *(undefined4 *)(ray + k * 4 + 0x380) = uVar9;
                *(float *)(ray + k * 4 + 0x3c0) = fVar186;
                *(undefined4 *)(ray + k * 4 + 0x400) = uVar178;
                *(uint *)(ray + k * 4 + 0x440) = uVar91;
                *(uint *)(ray + k * 4 + 0x480) = uVar7;
                *(uint *)(ray + k * 4 + 0x4c0) = context->user->instID[0];
                *(uint *)(ray + k * 4 + 0x500) = context->user->instPrimID[0];
              }
            }
          }
        }
      }
    }
LAB_018b491d:
    if (8 < iVar8) {
      local_780 = vpbroadcastd_avx512vl();
      local_7a0._4_4_ = local_800._0_4_;
      local_7a0._0_4_ = local_800._0_4_;
      local_7a0._8_4_ = local_800._0_4_;
      local_7a0._12_4_ = local_800._0_4_;
      local_7a0._16_4_ = local_800._0_4_;
      local_7a0._20_4_ = local_800._0_4_;
      local_7a0._24_4_ = local_800._0_4_;
      local_7a0._28_4_ = local_800._0_4_;
      uStack_75c = local_760;
      uStack_758 = local_760;
      uStack_754 = local_760;
      uStack_750 = local_760;
      uStack_74c = local_760;
      uStack_748 = local_760;
      uStack_744 = local_760;
      local_420 = 1.0 / (float)local_7c0._0_4_;
      fStack_41c = local_420;
      fStack_418 = local_420;
      fStack_414 = local_420;
      fStack_410 = local_420;
      fStack_40c = local_420;
      fStack_408 = local_420;
      fStack_404 = local_420;
      lVar86 = 8;
LAB_018b49b0:
      if (lVar86 < iVar8) {
        auVar129 = vpbroadcastd_avx512vl();
        auVar129 = vpor_avx2(auVar129,_DAT_01fb4ba0);
        uVar30 = vpcmpd_avx512vl(auVar129,local_780,1);
        auVar129 = *(undefined1 (*) [32])(bezier_basis0 + lVar86 * 4 + lVar89);
        auVar130 = *(undefined1 (*) [32])(lVar89 + 0x21fb768 + lVar86 * 4);
        auVar128 = *(undefined1 (*) [32])(lVar89 + 0x21fbbec + lVar86 * 4);
        auVar127 = *(undefined1 (*) [32])(lVar89 + 0x21fc070 + lVar86 * 4);
        fVar186 = auVar127._0_4_;
        auVar220._0_4_ = fVar186 * (float)local_6c0._0_4_;
        fVar225 = auVar127._4_4_;
        auVar220._4_4_ = fVar225 * (float)local_6c0._4_4_;
        fVar226 = auVar127._8_4_;
        auVar220._8_4_ = fVar226 * fStack_6b8;
        fVar179 = auVar127._12_4_;
        auVar220._12_4_ = fVar179 * fStack_6b4;
        fVar185 = auVar127._16_4_;
        auVar220._16_4_ = fVar185 * fStack_6b0;
        fVar194 = auVar127._20_4_;
        auVar220._20_4_ = fVar194 * fStack_6ac;
        auVar220._28_36_ = auVar219._28_36_;
        fVar93 = auVar127._24_4_;
        auVar220._24_4_ = fVar93 * fStack_6a8;
        auVar155._0_4_ = fVar186 * (float)local_6e0._0_4_;
        auVar155._4_4_ = fVar225 * (float)local_6e0._4_4_;
        auVar155._8_4_ = fVar226 * fStack_6d8;
        auVar155._12_4_ = fVar179 * fStack_6d4;
        auVar155._16_4_ = fVar185 * fStack_6d0;
        auVar155._20_4_ = fVar194 * fStack_6cc;
        auVar155._28_36_ = auVar212._28_36_;
        auVar155._24_4_ = fVar93 * fStack_6c8;
        auVar115 = vmulps_avx512vl(local_400,auVar127);
        auVar116 = vfmadd231ps_avx512vl(auVar220._0_32_,auVar128,local_680);
        auVar126 = vfmadd231ps_avx512vl(auVar155._0_32_,auVar128,local_6a0);
        auVar115 = vfmadd231ps_avx512vl(auVar115,auVar128,local_3e0);
        auVar116 = vfmadd231ps_avx512vl(auVar116,auVar130,local_640);
        auVar126 = vfmadd231ps_avx512vl(auVar126,auVar130,local_660);
        auVar125 = vfmadd231ps_avx512vl(auVar115,auVar130,local_3c0);
        auVar107 = vfmadd231ps_fma(auVar116,auVar129,local_600);
        auVar219 = ZEXT1664(auVar107);
        auVar110 = vfmadd231ps_fma(auVar126,auVar129,local_620);
        auVar212 = ZEXT1664(auVar110);
        auVar115 = *(undefined1 (*) [32])(bezier_basis1 + lVar86 * 4 + lVar89);
        auVar116 = *(undefined1 (*) [32])(lVar89 + 0x21fdb88 + lVar86 * 4);
        auVar118 = vfmadd231ps_avx512vl(auVar125,auVar129,local_3a0);
        auVar126 = *(undefined1 (*) [32])(lVar89 + 0x21fe00c + lVar86 * 4);
        auVar125 = *(undefined1 (*) [32])(lVar89 + 0x21fe490 + lVar86 * 4);
        fVar94 = auVar125._0_4_;
        auVar223._0_4_ = fVar94 * (float)local_6c0._0_4_;
        fVar156 = auVar125._4_4_;
        auVar223._4_4_ = fVar156 * (float)local_6c0._4_4_;
        fVar157 = auVar125._8_4_;
        auVar223._8_4_ = fVar157 * fStack_6b8;
        fVar158 = auVar125._12_4_;
        auVar223._12_4_ = fVar158 * fStack_6b4;
        fVar159 = auVar125._16_4_;
        auVar223._16_4_ = fVar159 * fStack_6b0;
        fVar161 = auVar125._20_4_;
        auVar223._20_4_ = fVar161 * fStack_6ac;
        auVar223._28_36_ = auVar222._28_36_;
        fVar162 = auVar125._24_4_;
        auVar223._24_4_ = fVar162 * fStack_6a8;
        auVar45._4_4_ = fVar156 * (float)local_6e0._4_4_;
        auVar45._0_4_ = fVar94 * (float)local_6e0._0_4_;
        auVar45._8_4_ = fVar157 * fStack_6d8;
        auVar45._12_4_ = fVar158 * fStack_6d4;
        auVar45._16_4_ = fVar159 * fStack_6d0;
        auVar45._20_4_ = fVar161 * fStack_6cc;
        auVar45._24_4_ = fVar162 * fStack_6c8;
        auVar45._28_4_ = uStack_6c4;
        auVar117 = vmulps_avx512vl(local_400,auVar125);
        auVar119 = vfmadd231ps_avx512vl(auVar223._0_32_,auVar126,local_680);
        auVar120 = vfmadd231ps_avx512vl(auVar45,auVar126,local_6a0);
        auVar117 = vfmadd231ps_avx512vl(auVar117,auVar126,local_3e0);
        auVar119 = vfmadd231ps_avx512vl(auVar119,auVar116,local_640);
        auVar120 = vfmadd231ps_avx512vl(auVar120,auVar116,local_660);
        auVar117 = vfmadd231ps_avx512vl(auVar117,auVar116,local_3c0);
        auVar109 = vfmadd231ps_fma(auVar119,auVar115,local_600);
        auVar222 = ZEXT1664(auVar109);
        auVar28 = vfmadd231ps_fma(auVar120,auVar115,local_620);
        auVar119 = vfmadd231ps_avx512vl(auVar117,auVar115,local_3a0);
        auVar120 = vmaxps_avx512vl(auVar118,auVar119);
        auVar117 = vsubps_avx(ZEXT1632(auVar109),ZEXT1632(auVar107));
        auVar121 = vsubps_avx512vl(ZEXT1632(auVar28),ZEXT1632(auVar110));
        auVar122 = vmulps_avx512vl(ZEXT1632(auVar110),auVar117);
        auVar123 = vmulps_avx512vl(ZEXT1632(auVar107),auVar121);
        auVar122 = vsubps_avx512vl(auVar122,auVar123);
        auVar123 = vmulps_avx512vl(auVar121,auVar121);
        auVar123 = vfmadd231ps_avx512vl(auVar123,auVar117,auVar117);
        auVar120 = vmulps_avx512vl(auVar120,auVar120);
        auVar120 = vmulps_avx512vl(auVar120,auVar123);
        auVar122 = vmulps_avx512vl(auVar122,auVar122);
        uVar180 = vcmpps_avx512vl(auVar122,auVar120,2);
        bVar90 = (byte)uVar30 & (byte)uVar180;
        if (bVar90 != 0) {
          fVar160 = local_4a0._0_4_;
          fVar163 = local_4a0._4_4_;
          auVar46._4_4_ = fVar163 * fVar156;
          auVar46._0_4_ = fVar160 * fVar94;
          fVar94 = local_4a0._8_4_;
          auVar46._8_4_ = fVar94 * fVar157;
          fVar156 = local_4a0._12_4_;
          auVar46._12_4_ = fVar156 * fVar158;
          fVar157 = local_4a0._16_4_;
          auVar46._16_4_ = fVar157 * fVar159;
          fVar158 = local_4a0._20_4_;
          auVar46._20_4_ = fVar158 * fVar161;
          fVar159 = local_4a0._24_4_;
          auVar46._24_4_ = fVar159 * fVar162;
          auVar46._28_4_ = auVar125._28_4_;
          auVar126 = vfmadd213ps_avx512vl(auVar126,local_480,auVar46);
          auVar116 = vfmadd213ps_avx512vl(auVar116,local_460,auVar126);
          auVar115 = vfmadd213ps_avx512vl(auVar115,local_440,auVar116);
          auVar47._4_4_ = fVar163 * fVar225;
          auVar47._0_4_ = fVar160 * fVar186;
          auVar47._8_4_ = fVar94 * fVar226;
          auVar47._12_4_ = fVar156 * fVar179;
          auVar47._16_4_ = fVar157 * fVar185;
          auVar47._20_4_ = fVar158 * fVar194;
          auVar47._24_4_ = fVar159 * fVar93;
          auVar47._28_4_ = auVar127._28_4_;
          auVar128 = vfmadd213ps_avx512vl(auVar128,local_480,auVar47);
          auVar130 = vfmadd213ps_avx512vl(auVar130,local_460,auVar128);
          auVar116 = vfmadd213ps_avx512vl(auVar129,local_440,auVar130);
          auVar129 = *(undefined1 (*) [32])(lVar89 + 0x21fc4f4 + lVar86 * 4);
          auVar130 = *(undefined1 (*) [32])(lVar89 + 0x21fc978 + lVar86 * 4);
          auVar128 = *(undefined1 (*) [32])(lVar89 + 0x21fcdfc + lVar86 * 4);
          auVar127 = *(undefined1 (*) [32])(lVar89 + 0x21fd280 + lVar86 * 4);
          auVar126 = vmulps_avx512vl(_local_6c0,auVar127);
          auVar125 = vmulps_avx512vl(_local_6e0,auVar127);
          auVar48._4_4_ = fVar163 * auVar127._4_4_;
          auVar48._0_4_ = fVar160 * auVar127._0_4_;
          auVar48._8_4_ = fVar94 * auVar127._8_4_;
          auVar48._12_4_ = fVar156 * auVar127._12_4_;
          auVar48._16_4_ = fVar157 * auVar127._16_4_;
          auVar48._20_4_ = fVar158 * auVar127._20_4_;
          auVar48._24_4_ = fVar159 * auVar127._24_4_;
          auVar48._28_4_ = auVar127._28_4_;
          auVar127 = vfmadd231ps_avx512vl(auVar126,auVar128,local_680);
          auVar126 = vfmadd231ps_avx512vl(auVar125,auVar128,local_6a0);
          auVar128 = vfmadd231ps_avx512vl(auVar48,local_480,auVar128);
          auVar127 = vfmadd231ps_avx512vl(auVar127,auVar130,local_640);
          auVar126 = vfmadd231ps_avx512vl(auVar126,auVar130,local_660);
          auVar130 = vfmadd231ps_avx512vl(auVar128,local_460,auVar130);
          auVar127 = vfmadd231ps_avx512vl(auVar127,auVar129,local_600);
          auVar126 = vfmadd231ps_avx512vl(auVar126,auVar129,local_620);
          auVar125 = vfmadd231ps_avx512vl(auVar130,local_440,auVar129);
          auVar129 = *(undefined1 (*) [32])(lVar89 + 0x21fe914 + lVar86 * 4);
          auVar130 = *(undefined1 (*) [32])(lVar89 + 0x21ff21c + lVar86 * 4);
          auVar128 = *(undefined1 (*) [32])(lVar89 + 0x21ff6a0 + lVar86 * 4);
          auVar120 = vmulps_avx512vl(_local_6c0,auVar128);
          auVar122 = vmulps_avx512vl(_local_6e0,auVar128);
          auVar128 = vmulps_avx512vl(local_4a0,auVar128);
          auVar120 = vfmadd231ps_avx512vl(auVar120,auVar130,local_680);
          auVar122 = vfmadd231ps_avx512vl(auVar122,auVar130,local_6a0);
          auVar128 = vfmadd231ps_avx512vl(auVar128,local_480,auVar130);
          auVar240 = ZEXT1664(auVar240._0_16_);
          auVar130 = *(undefined1 (*) [32])(lVar89 + 0x21fed98 + lVar86 * 4);
          auVar120 = vfmadd231ps_avx512vl(auVar120,auVar130,local_640);
          auVar122 = vfmadd231ps_avx512vl(auVar122,auVar130,local_660);
          auVar130 = vfmadd231ps_avx512vl(auVar128,local_460,auVar130);
          auVar177 = ZEXT1664(auVar177._0_16_);
          auVar128 = vfmadd231ps_avx512vl(auVar120,auVar129,local_600);
          auVar120 = vfmadd231ps_avx512vl(auVar122,auVar129,local_620);
          auVar130 = vfmadd231ps_avx512vl(auVar130,local_440,auVar129);
          auVar122 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          vandps_avx512vl(auVar127,auVar122);
          vandps_avx512vl(auVar126,auVar122);
          auVar129 = vmaxps_avx(auVar122,auVar122);
          vandps_avx512vl(auVar125,auVar122);
          auVar129 = vmaxps_avx(auVar129,auVar122);
          uVar83 = vcmpps_avx512vl(auVar129,local_7a0,1);
          bVar13 = (bool)((byte)uVar83 & 1);
          auVar142._0_4_ = (float)((uint)bVar13 * auVar117._0_4_ | (uint)!bVar13 * auVar127._0_4_);
          bVar13 = (bool)((byte)(uVar83 >> 1) & 1);
          auVar142._4_4_ = (float)((uint)bVar13 * auVar117._4_4_ | (uint)!bVar13 * auVar127._4_4_);
          bVar13 = (bool)((byte)(uVar83 >> 2) & 1);
          auVar142._8_4_ = (float)((uint)bVar13 * auVar117._8_4_ | (uint)!bVar13 * auVar127._8_4_);
          bVar13 = (bool)((byte)(uVar83 >> 3) & 1);
          auVar142._12_4_ =
               (float)((uint)bVar13 * auVar117._12_4_ | (uint)!bVar13 * auVar127._12_4_);
          bVar13 = (bool)((byte)(uVar83 >> 4) & 1);
          auVar142._16_4_ =
               (float)((uint)bVar13 * auVar117._16_4_ | (uint)!bVar13 * auVar127._16_4_);
          bVar13 = (bool)((byte)(uVar83 >> 5) & 1);
          auVar142._20_4_ =
               (float)((uint)bVar13 * auVar117._20_4_ | (uint)!bVar13 * auVar127._20_4_);
          bVar13 = (bool)((byte)(uVar83 >> 6) & 1);
          auVar142._24_4_ =
               (float)((uint)bVar13 * auVar117._24_4_ | (uint)!bVar13 * auVar127._24_4_);
          bVar13 = SUB81(uVar83 >> 7,0);
          auVar142._28_4_ = (uint)bVar13 * auVar117._28_4_ | (uint)!bVar13 * auVar127._28_4_;
          bVar13 = (bool)((byte)uVar83 & 1);
          auVar143._0_4_ = (float)((uint)bVar13 * auVar121._0_4_ | (uint)!bVar13 * auVar126._0_4_);
          bVar13 = (bool)((byte)(uVar83 >> 1) & 1);
          auVar143._4_4_ = (float)((uint)bVar13 * auVar121._4_4_ | (uint)!bVar13 * auVar126._4_4_);
          bVar13 = (bool)((byte)(uVar83 >> 2) & 1);
          auVar143._8_4_ = (float)((uint)bVar13 * auVar121._8_4_ | (uint)!bVar13 * auVar126._8_4_);
          bVar13 = (bool)((byte)(uVar83 >> 3) & 1);
          auVar143._12_4_ =
               (float)((uint)bVar13 * auVar121._12_4_ | (uint)!bVar13 * auVar126._12_4_);
          bVar13 = (bool)((byte)(uVar83 >> 4) & 1);
          auVar143._16_4_ =
               (float)((uint)bVar13 * auVar121._16_4_ | (uint)!bVar13 * auVar126._16_4_);
          bVar13 = (bool)((byte)(uVar83 >> 5) & 1);
          auVar143._20_4_ =
               (float)((uint)bVar13 * auVar121._20_4_ | (uint)!bVar13 * auVar126._20_4_);
          bVar13 = (bool)((byte)(uVar83 >> 6) & 1);
          auVar143._24_4_ =
               (float)((uint)bVar13 * auVar121._24_4_ | (uint)!bVar13 * auVar126._24_4_);
          bVar13 = SUB81(uVar83 >> 7,0);
          auVar143._28_4_ = (uint)bVar13 * auVar121._28_4_ | (uint)!bVar13 * auVar126._28_4_;
          vandps_avx512vl(auVar128,auVar122);
          vandps_avx512vl(auVar120,auVar122);
          auVar129 = vmaxps_avx(auVar143,auVar143);
          vandps_avx512vl(auVar130,auVar122);
          auVar129 = vmaxps_avx(auVar129,auVar143);
          uVar83 = vcmpps_avx512vl(auVar129,local_7a0,1);
          bVar13 = (bool)((byte)uVar83 & 1);
          auVar144._0_4_ = (uint)bVar13 * auVar117._0_4_ | (uint)!bVar13 * auVar128._0_4_;
          bVar13 = (bool)((byte)(uVar83 >> 1) & 1);
          auVar144._4_4_ = (uint)bVar13 * auVar117._4_4_ | (uint)!bVar13 * auVar128._4_4_;
          bVar13 = (bool)((byte)(uVar83 >> 2) & 1);
          auVar144._8_4_ = (uint)bVar13 * auVar117._8_4_ | (uint)!bVar13 * auVar128._8_4_;
          bVar13 = (bool)((byte)(uVar83 >> 3) & 1);
          auVar144._12_4_ = (uint)bVar13 * auVar117._12_4_ | (uint)!bVar13 * auVar128._12_4_;
          bVar13 = (bool)((byte)(uVar83 >> 4) & 1);
          auVar144._16_4_ = (uint)bVar13 * auVar117._16_4_ | (uint)!bVar13 * auVar128._16_4_;
          bVar13 = (bool)((byte)(uVar83 >> 5) & 1);
          auVar144._20_4_ = (uint)bVar13 * auVar117._20_4_ | (uint)!bVar13 * auVar128._20_4_;
          bVar13 = (bool)((byte)(uVar83 >> 6) & 1);
          auVar144._24_4_ = (uint)bVar13 * auVar117._24_4_ | (uint)!bVar13 * auVar128._24_4_;
          bVar13 = SUB81(uVar83 >> 7,0);
          auVar144._28_4_ = (uint)bVar13 * auVar117._28_4_ | (uint)!bVar13 * auVar128._28_4_;
          bVar13 = (bool)((byte)uVar83 & 1);
          auVar145._0_4_ = (float)((uint)bVar13 * auVar121._0_4_ | (uint)!bVar13 * auVar120._0_4_);
          bVar13 = (bool)((byte)(uVar83 >> 1) & 1);
          auVar145._4_4_ = (float)((uint)bVar13 * auVar121._4_4_ | (uint)!bVar13 * auVar120._4_4_);
          bVar13 = (bool)((byte)(uVar83 >> 2) & 1);
          auVar145._8_4_ = (float)((uint)bVar13 * auVar121._8_4_ | (uint)!bVar13 * auVar120._8_4_);
          bVar13 = (bool)((byte)(uVar83 >> 3) & 1);
          auVar145._12_4_ =
               (float)((uint)bVar13 * auVar121._12_4_ | (uint)!bVar13 * auVar120._12_4_);
          bVar13 = (bool)((byte)(uVar83 >> 4) & 1);
          auVar145._16_4_ =
               (float)((uint)bVar13 * auVar121._16_4_ | (uint)!bVar13 * auVar120._16_4_);
          bVar13 = (bool)((byte)(uVar83 >> 5) & 1);
          auVar145._20_4_ =
               (float)((uint)bVar13 * auVar121._20_4_ | (uint)!bVar13 * auVar120._20_4_);
          bVar13 = (bool)((byte)(uVar83 >> 6) & 1);
          auVar145._24_4_ =
               (float)((uint)bVar13 * auVar121._24_4_ | (uint)!bVar13 * auVar120._24_4_);
          bVar13 = SUB81(uVar83 >> 7,0);
          auVar145._28_4_ = (uint)bVar13 * auVar121._28_4_ | (uint)!bVar13 * auVar120._28_4_;
          auVar228._8_4_ = 0x80000000;
          auVar228._0_8_ = 0x8000000080000000;
          auVar228._12_4_ = 0x80000000;
          auVar228._16_4_ = 0x80000000;
          auVar228._20_4_ = 0x80000000;
          auVar228._24_4_ = 0x80000000;
          auVar228._28_4_ = 0x80000000;
          auVar129 = vxorps_avx512vl(auVar144,auVar228);
          auVar114 = vxorps_avx512vl(auVar122._0_16_,auVar122._0_16_);
          auVar130 = vfmadd213ps_avx512vl(auVar142,auVar142,ZEXT1632(auVar114));
          auVar103 = vfmadd231ps_fma(auVar130,auVar143,auVar143);
          auVar130 = vrsqrt14ps_avx512vl(ZEXT1632(auVar103));
          auVar238._8_4_ = 0xbf000000;
          auVar238._0_8_ = 0xbf000000bf000000;
          auVar238._12_4_ = 0xbf000000;
          auVar238._16_4_ = 0xbf000000;
          auVar238._20_4_ = 0xbf000000;
          auVar238._24_4_ = 0xbf000000;
          auVar238._28_4_ = 0xbf000000;
          fVar186 = auVar130._0_4_;
          fVar225 = auVar130._4_4_;
          fVar226 = auVar130._8_4_;
          fVar179 = auVar130._12_4_;
          fVar185 = auVar130._16_4_;
          fVar194 = auVar130._20_4_;
          fVar93 = auVar130._24_4_;
          auVar49._4_4_ = fVar225 * fVar225 * fVar225 * auVar103._4_4_ * -0.5;
          auVar49._0_4_ = fVar186 * fVar186 * fVar186 * auVar103._0_4_ * -0.5;
          auVar49._8_4_ = fVar226 * fVar226 * fVar226 * auVar103._8_4_ * -0.5;
          auVar49._12_4_ = fVar179 * fVar179 * fVar179 * auVar103._12_4_ * -0.5;
          auVar49._16_4_ = fVar185 * fVar185 * fVar185 * -0.0;
          auVar49._20_4_ = fVar194 * fVar194 * fVar194 * -0.0;
          auVar49._24_4_ = fVar93 * fVar93 * fVar93 * -0.0;
          auVar49._28_4_ = auVar143._28_4_;
          auVar128 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
          auVar130 = vfmadd231ps_avx512vl(auVar49,auVar128,auVar130);
          auVar50._4_4_ = auVar143._4_4_ * auVar130._4_4_;
          auVar50._0_4_ = auVar143._0_4_ * auVar130._0_4_;
          auVar50._8_4_ = auVar143._8_4_ * auVar130._8_4_;
          auVar50._12_4_ = auVar143._12_4_ * auVar130._12_4_;
          auVar50._16_4_ = auVar143._16_4_ * auVar130._16_4_;
          auVar50._20_4_ = auVar143._20_4_ * auVar130._20_4_;
          auVar50._24_4_ = auVar143._24_4_ * auVar130._24_4_;
          auVar50._28_4_ = 0;
          auVar51._4_4_ = auVar130._4_4_ * -auVar142._4_4_;
          auVar51._0_4_ = auVar130._0_4_ * -auVar142._0_4_;
          auVar51._8_4_ = auVar130._8_4_ * -auVar142._8_4_;
          auVar51._12_4_ = auVar130._12_4_ * -auVar142._12_4_;
          auVar51._16_4_ = auVar130._16_4_ * -auVar142._16_4_;
          auVar51._20_4_ = auVar130._20_4_ * -auVar142._20_4_;
          auVar51._24_4_ = auVar130._24_4_ * -auVar142._24_4_;
          auVar51._28_4_ = auVar143._28_4_;
          auVar127 = vmulps_avx512vl(auVar130,ZEXT1632(auVar114));
          auVar125 = ZEXT1632(auVar114);
          auVar130 = vfmadd213ps_avx512vl(auVar144,auVar144,auVar125);
          auVar130 = vfmadd231ps_avx512vl(auVar130,auVar145,auVar145);
          auVar126 = vrsqrt14ps_avx512vl(auVar130);
          auVar130 = vmulps_avx512vl(auVar130,auVar238);
          fVar186 = auVar126._0_4_;
          fVar225 = auVar126._4_4_;
          fVar226 = auVar126._8_4_;
          fVar179 = auVar126._12_4_;
          fVar185 = auVar126._16_4_;
          fVar194 = auVar126._20_4_;
          fVar93 = auVar126._24_4_;
          auVar52._4_4_ = fVar225 * fVar225 * fVar225 * auVar130._4_4_;
          auVar52._0_4_ = fVar186 * fVar186 * fVar186 * auVar130._0_4_;
          auVar52._8_4_ = fVar226 * fVar226 * fVar226 * auVar130._8_4_;
          auVar52._12_4_ = fVar179 * fVar179 * fVar179 * auVar130._12_4_;
          auVar52._16_4_ = fVar185 * fVar185 * fVar185 * auVar130._16_4_;
          auVar52._20_4_ = fVar194 * fVar194 * fVar194 * auVar130._20_4_;
          auVar52._24_4_ = fVar93 * fVar93 * fVar93 * auVar130._24_4_;
          auVar52._28_4_ = auVar130._28_4_;
          auVar130 = vfmadd231ps_avx512vl(auVar52,auVar128,auVar126);
          auVar53._4_4_ = auVar145._4_4_ * auVar130._4_4_;
          auVar53._0_4_ = auVar145._0_4_ * auVar130._0_4_;
          auVar53._8_4_ = auVar145._8_4_ * auVar130._8_4_;
          auVar53._12_4_ = auVar145._12_4_ * auVar130._12_4_;
          auVar53._16_4_ = auVar145._16_4_ * auVar130._16_4_;
          auVar53._20_4_ = auVar145._20_4_ * auVar130._20_4_;
          auVar53._24_4_ = auVar145._24_4_ * auVar130._24_4_;
          auVar53._28_4_ = auVar126._28_4_;
          auVar54._4_4_ = auVar130._4_4_ * auVar129._4_4_;
          auVar54._0_4_ = auVar130._0_4_ * auVar129._0_4_;
          auVar54._8_4_ = auVar130._8_4_ * auVar129._8_4_;
          auVar54._12_4_ = auVar130._12_4_ * auVar129._12_4_;
          auVar54._16_4_ = auVar130._16_4_ * auVar129._16_4_;
          auVar54._20_4_ = auVar130._20_4_ * auVar129._20_4_;
          auVar54._24_4_ = auVar130._24_4_ * auVar129._24_4_;
          auVar54._28_4_ = auVar129._28_4_;
          auVar129 = vmulps_avx512vl(auVar130,auVar125);
          auVar103 = vfmadd213ps_fma(auVar50,auVar118,ZEXT1632(auVar107));
          auVar99 = vfmadd213ps_fma(auVar51,auVar118,ZEXT1632(auVar110));
          auVar128 = vfmadd213ps_avx512vl(auVar127,auVar118,auVar116);
          auVar126 = vfmadd213ps_avx512vl(auVar53,auVar119,ZEXT1632(auVar109));
          auVar101 = vfnmadd213ps_fma(auVar50,auVar118,ZEXT1632(auVar107));
          auVar107 = vfmadd213ps_fma(auVar54,auVar119,ZEXT1632(auVar28));
          auVar102 = vfnmadd213ps_fma(auVar51,auVar118,ZEXT1632(auVar110));
          auVar110 = vfmadd213ps_fma(auVar129,auVar119,auVar115);
          auVar239 = vfnmadd231ps_fma(auVar116,auVar118,auVar127);
          auVar105 = vfnmadd213ps_fma(auVar53,auVar119,ZEXT1632(auVar109));
          auVar106 = vfnmadd213ps_fma(auVar54,auVar119,ZEXT1632(auVar28));
          auVar113 = vfnmadd231ps_fma(auVar115,auVar119,auVar129);
          auVar115 = vsubps_avx512vl(auVar126,ZEXT1632(auVar101));
          auVar129 = vsubps_avx(ZEXT1632(auVar107),ZEXT1632(auVar102));
          auVar130 = vsubps_avx(ZEXT1632(auVar110),ZEXT1632(auVar239));
          auVar55._4_4_ = auVar129._4_4_ * auVar239._4_4_;
          auVar55._0_4_ = auVar129._0_4_ * auVar239._0_4_;
          auVar55._8_4_ = auVar129._8_4_ * auVar239._8_4_;
          auVar55._12_4_ = auVar129._12_4_ * auVar239._12_4_;
          auVar55._16_4_ = auVar129._16_4_ * 0.0;
          auVar55._20_4_ = auVar129._20_4_ * 0.0;
          auVar55._24_4_ = auVar129._24_4_ * 0.0;
          auVar55._28_4_ = auVar127._28_4_;
          auVar109 = vfmsub231ps_fma(auVar55,ZEXT1632(auVar102),auVar130);
          auVar56._4_4_ = auVar130._4_4_ * auVar101._4_4_;
          auVar56._0_4_ = auVar130._0_4_ * auVar101._0_4_;
          auVar56._8_4_ = auVar130._8_4_ * auVar101._8_4_;
          auVar56._12_4_ = auVar130._12_4_ * auVar101._12_4_;
          auVar56._16_4_ = auVar130._16_4_ * 0.0;
          auVar56._20_4_ = auVar130._20_4_ * 0.0;
          auVar56._24_4_ = auVar130._24_4_ * 0.0;
          auVar56._28_4_ = auVar130._28_4_;
          auVar28 = vfmsub231ps_fma(auVar56,ZEXT1632(auVar239),auVar115);
          auVar57._4_4_ = auVar102._4_4_ * auVar115._4_4_;
          auVar57._0_4_ = auVar102._0_4_ * auVar115._0_4_;
          auVar57._8_4_ = auVar102._8_4_ * auVar115._8_4_;
          auVar57._12_4_ = auVar102._12_4_ * auVar115._12_4_;
          auVar57._16_4_ = auVar115._16_4_ * 0.0;
          auVar57._20_4_ = auVar115._20_4_ * 0.0;
          auVar57._24_4_ = auVar115._24_4_ * 0.0;
          auVar57._28_4_ = auVar115._28_4_;
          auVar100 = vfmsub231ps_fma(auVar57,ZEXT1632(auVar101),auVar129);
          auVar129 = vfmadd231ps_avx512vl(ZEXT1632(auVar100),auVar125,ZEXT1632(auVar28));
          auVar129 = vfmadd231ps_avx512vl(auVar129,auVar125,ZEXT1632(auVar109));
          auVar122 = ZEXT1632(auVar114);
          uVar83 = vcmpps_avx512vl(auVar129,auVar122,2);
          bVar82 = (byte)uVar83;
          fVar157 = (float)((uint)(bVar82 & 1) * auVar103._0_4_ |
                           (uint)!(bool)(bVar82 & 1) * auVar105._0_4_);
          bVar13 = (bool)((byte)(uVar83 >> 1) & 1);
          fVar159 = (float)((uint)bVar13 * auVar103._4_4_ | (uint)!bVar13 * auVar105._4_4_);
          bVar13 = (bool)((byte)(uVar83 >> 2) & 1);
          fVar162 = (float)((uint)bVar13 * auVar103._8_4_ | (uint)!bVar13 * auVar105._8_4_);
          bVar13 = (bool)((byte)(uVar83 >> 3) & 1);
          fVar163 = (float)((uint)bVar13 * auVar103._12_4_ | (uint)!bVar13 * auVar105._12_4_);
          auVar125 = ZEXT1632(CONCAT412(fVar163,CONCAT48(fVar162,CONCAT44(fVar159,fVar157))));
          fVar158 = (float)((uint)(bVar82 & 1) * auVar99._0_4_ |
                           (uint)!(bool)(bVar82 & 1) * auVar106._0_4_);
          bVar13 = (bool)((byte)(uVar83 >> 1) & 1);
          fVar161 = (float)((uint)bVar13 * auVar99._4_4_ | (uint)!bVar13 * auVar106._4_4_);
          bVar13 = (bool)((byte)(uVar83 >> 2) & 1);
          fVar160 = (float)((uint)bVar13 * auVar99._8_4_ | (uint)!bVar13 * auVar106._8_4_);
          bVar13 = (bool)((byte)(uVar83 >> 3) & 1);
          fVar164 = (float)((uint)bVar13 * auVar99._12_4_ | (uint)!bVar13 * auVar106._12_4_);
          auVar117 = ZEXT1632(CONCAT412(fVar164,CONCAT48(fVar160,CONCAT44(fVar161,fVar158))));
          auVar146._0_4_ =
               (float)((uint)(bVar82 & 1) * auVar128._0_4_ |
                      (uint)!(bool)(bVar82 & 1) * auVar113._0_4_);
          bVar13 = (bool)((byte)(uVar83 >> 1) & 1);
          auVar146._4_4_ = (float)((uint)bVar13 * auVar128._4_4_ | (uint)!bVar13 * auVar113._4_4_);
          bVar13 = (bool)((byte)(uVar83 >> 2) & 1);
          auVar146._8_4_ = (float)((uint)bVar13 * auVar128._8_4_ | (uint)!bVar13 * auVar113._8_4_);
          bVar13 = (bool)((byte)(uVar83 >> 3) & 1);
          auVar146._12_4_ =
               (float)((uint)bVar13 * auVar128._12_4_ | (uint)!bVar13 * auVar113._12_4_);
          fVar186 = (float)((uint)((byte)(uVar83 >> 4) & 1) * auVar128._16_4_);
          auVar146._16_4_ = fVar186;
          fVar225 = (float)((uint)((byte)(uVar83 >> 5) & 1) * auVar128._20_4_);
          auVar146._20_4_ = fVar225;
          fVar226 = (float)((uint)((byte)(uVar83 >> 6) & 1) * auVar128._24_4_);
          auVar146._24_4_ = fVar226;
          iVar1 = (uint)(byte)(uVar83 >> 7) * auVar128._28_4_;
          auVar146._28_4_ = iVar1;
          auVar129 = vblendmps_avx512vl(ZEXT1632(auVar101),auVar126);
          auVar147._0_4_ =
               (uint)(bVar82 & 1) * auVar129._0_4_ | (uint)!(bool)(bVar82 & 1) * auVar109._0_4_;
          bVar13 = (bool)((byte)(uVar83 >> 1) & 1);
          auVar147._4_4_ = (uint)bVar13 * auVar129._4_4_ | (uint)!bVar13 * auVar109._4_4_;
          bVar13 = (bool)((byte)(uVar83 >> 2) & 1);
          auVar147._8_4_ = (uint)bVar13 * auVar129._8_4_ | (uint)!bVar13 * auVar109._8_4_;
          bVar13 = (bool)((byte)(uVar83 >> 3) & 1);
          auVar147._12_4_ = (uint)bVar13 * auVar129._12_4_ | (uint)!bVar13 * auVar109._12_4_;
          auVar147._16_4_ = (uint)((byte)(uVar83 >> 4) & 1) * auVar129._16_4_;
          auVar147._20_4_ = (uint)((byte)(uVar83 >> 5) & 1) * auVar129._20_4_;
          auVar147._24_4_ = (uint)((byte)(uVar83 >> 6) & 1) * auVar129._24_4_;
          auVar147._28_4_ = (uint)(byte)(uVar83 >> 7) * auVar129._28_4_;
          auVar129 = vblendmps_avx512vl(ZEXT1632(auVar102),ZEXT1632(auVar107));
          auVar148._0_4_ =
               (float)((uint)(bVar82 & 1) * auVar129._0_4_ |
                      (uint)!(bool)(bVar82 & 1) * auVar103._0_4_);
          bVar13 = (bool)((byte)(uVar83 >> 1) & 1);
          auVar148._4_4_ = (float)((uint)bVar13 * auVar129._4_4_ | (uint)!bVar13 * auVar103._4_4_);
          bVar13 = (bool)((byte)(uVar83 >> 2) & 1);
          auVar148._8_4_ = (float)((uint)bVar13 * auVar129._8_4_ | (uint)!bVar13 * auVar103._8_4_);
          bVar13 = (bool)((byte)(uVar83 >> 3) & 1);
          auVar148._12_4_ =
               (float)((uint)bVar13 * auVar129._12_4_ | (uint)!bVar13 * auVar103._12_4_);
          fVar194 = (float)((uint)((byte)(uVar83 >> 4) & 1) * auVar129._16_4_);
          auVar148._16_4_ = fVar194;
          fVar179 = (float)((uint)((byte)(uVar83 >> 5) & 1) * auVar129._20_4_);
          auVar148._20_4_ = fVar179;
          fVar185 = (float)((uint)((byte)(uVar83 >> 6) & 1) * auVar129._24_4_);
          auVar148._24_4_ = fVar185;
          auVar148._28_4_ = (uint)(byte)(uVar83 >> 7) * auVar129._28_4_;
          auVar129 = vblendmps_avx512vl(ZEXT1632(auVar239),ZEXT1632(auVar110));
          auVar149._0_4_ =
               (float)((uint)(bVar82 & 1) * auVar129._0_4_ |
                      (uint)!(bool)(bVar82 & 1) * auVar99._0_4_);
          bVar13 = (bool)((byte)(uVar83 >> 1) & 1);
          auVar149._4_4_ = (float)((uint)bVar13 * auVar129._4_4_ | (uint)!bVar13 * auVar99._4_4_);
          bVar13 = (bool)((byte)(uVar83 >> 2) & 1);
          auVar149._8_4_ = (float)((uint)bVar13 * auVar129._8_4_ | (uint)!bVar13 * auVar99._8_4_);
          bVar13 = (bool)((byte)(uVar83 >> 3) & 1);
          auVar149._12_4_ = (float)((uint)bVar13 * auVar129._12_4_ | (uint)!bVar13 * auVar99._12_4_)
          ;
          fVar93 = (float)((uint)((byte)(uVar83 >> 4) & 1) * auVar129._16_4_);
          auVar149._16_4_ = fVar93;
          fVar94 = (float)((uint)((byte)(uVar83 >> 5) & 1) * auVar129._20_4_);
          auVar149._20_4_ = fVar94;
          fVar156 = (float)((uint)((byte)(uVar83 >> 6) & 1) * auVar129._24_4_);
          auVar149._24_4_ = fVar156;
          iVar2 = (uint)(byte)(uVar83 >> 7) * auVar129._28_4_;
          auVar149._28_4_ = iVar2;
          auVar150._0_4_ =
               (uint)(bVar82 & 1) * (int)auVar101._0_4_ | (uint)!(bool)(bVar82 & 1) * auVar126._0_4_
          ;
          bVar13 = (bool)((byte)(uVar83 >> 1) & 1);
          auVar150._4_4_ = (uint)bVar13 * (int)auVar101._4_4_ | (uint)!bVar13 * auVar126._4_4_;
          bVar13 = (bool)((byte)(uVar83 >> 2) & 1);
          auVar150._8_4_ = (uint)bVar13 * (int)auVar101._8_4_ | (uint)!bVar13 * auVar126._8_4_;
          bVar13 = (bool)((byte)(uVar83 >> 3) & 1);
          auVar150._12_4_ = (uint)bVar13 * (int)auVar101._12_4_ | (uint)!bVar13 * auVar126._12_4_;
          auVar150._16_4_ = (uint)!(bool)((byte)(uVar83 >> 4) & 1) * auVar126._16_4_;
          auVar150._20_4_ = (uint)!(bool)((byte)(uVar83 >> 5) & 1) * auVar126._20_4_;
          auVar150._24_4_ = (uint)!(bool)((byte)(uVar83 >> 6) & 1) * auVar126._24_4_;
          auVar150._28_4_ = (uint)!SUB81(uVar83 >> 7,0) * auVar126._28_4_;
          bVar13 = (bool)((byte)(uVar83 >> 1) & 1);
          bVar15 = (bool)((byte)(uVar83 >> 2) & 1);
          bVar17 = (bool)((byte)(uVar83 >> 3) & 1);
          bVar14 = (bool)((byte)(uVar83 >> 1) & 1);
          bVar16 = (bool)((byte)(uVar83 >> 2) & 1);
          bVar18 = (bool)((byte)(uVar83 >> 3) & 1);
          auVar126 = vsubps_avx512vl(auVar150,auVar125);
          auVar130 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar17 * (int)auVar102._12_4_ |
                                                   (uint)!bVar17 * auVar107._12_4_,
                                                   CONCAT48((uint)bVar15 * (int)auVar102._8_4_ |
                                                            (uint)!bVar15 * auVar107._8_4_,
                                                            CONCAT44((uint)bVar13 *
                                                                     (int)auVar102._4_4_ |
                                                                     (uint)!bVar13 * auVar107._4_4_,
                                                                     (uint)(bVar82 & 1) *
                                                                     (int)auVar102._0_4_ |
                                                                     (uint)!(bool)(bVar82 & 1) *
                                                                     auVar107._0_4_)))),auVar117);
          auVar219 = ZEXT3264(auVar130);
          auVar128 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar18 * (int)auVar239._12_4_ |
                                                   (uint)!bVar18 * auVar110._12_4_,
                                                   CONCAT48((uint)bVar16 * (int)auVar239._8_4_ |
                                                            (uint)!bVar16 * auVar110._8_4_,
                                                            CONCAT44((uint)bVar14 *
                                                                     (int)auVar239._4_4_ |
                                                                     (uint)!bVar14 * auVar110._4_4_,
                                                                     (uint)(bVar82 & 1) *
                                                                     (int)auVar239._0_4_ |
                                                                     (uint)!(bool)(bVar82 & 1) *
                                                                     auVar110._0_4_)))),auVar146);
          auVar127 = vsubps_avx(auVar125,auVar147);
          auVar222 = ZEXT3264(auVar127);
          auVar115 = vsubps_avx(auVar117,auVar148);
          auVar116 = vsubps_avx(auVar146,auVar149);
          auVar58._4_4_ = auVar128._4_4_ * fVar159;
          auVar58._0_4_ = auVar128._0_4_ * fVar157;
          auVar58._8_4_ = auVar128._8_4_ * fVar162;
          auVar58._12_4_ = auVar128._12_4_ * fVar163;
          auVar58._16_4_ = auVar128._16_4_ * 0.0;
          auVar58._20_4_ = auVar128._20_4_ * 0.0;
          auVar58._24_4_ = auVar128._24_4_ * 0.0;
          auVar58._28_4_ = 0;
          auVar107 = vfmsub231ps_fma(auVar58,auVar146,auVar126);
          auVar205._0_4_ = fVar158 * auVar126._0_4_;
          auVar205._4_4_ = fVar161 * auVar126._4_4_;
          auVar205._8_4_ = fVar160 * auVar126._8_4_;
          auVar205._12_4_ = fVar164 * auVar126._12_4_;
          auVar205._16_4_ = auVar126._16_4_ * 0.0;
          auVar205._20_4_ = auVar126._20_4_ * 0.0;
          auVar205._24_4_ = auVar126._24_4_ * 0.0;
          auVar205._28_4_ = 0;
          auVar110 = vfmsub231ps_fma(auVar205,auVar125,auVar130);
          auVar129 = vfmadd231ps_avx512vl(ZEXT1632(auVar110),auVar122,ZEXT1632(auVar107));
          auVar210._0_4_ = auVar130._0_4_ * auVar146._0_4_;
          auVar210._4_4_ = auVar130._4_4_ * auVar146._4_4_;
          auVar210._8_4_ = auVar130._8_4_ * auVar146._8_4_;
          auVar210._12_4_ = auVar130._12_4_ * auVar146._12_4_;
          auVar210._16_4_ = auVar130._16_4_ * fVar186;
          auVar210._20_4_ = auVar130._20_4_ * fVar225;
          auVar210._24_4_ = auVar130._24_4_ * fVar226;
          auVar210._28_4_ = 0;
          auVar107 = vfmsub231ps_fma(auVar210,auVar117,auVar128);
          auVar120 = vfmadd231ps_avx512vl(auVar129,auVar122,ZEXT1632(auVar107));
          auVar129 = vmulps_avx512vl(auVar116,auVar147);
          auVar129 = vfmsub231ps_avx512vl(auVar129,auVar127,auVar149);
          auVar59._4_4_ = auVar115._4_4_ * auVar149._4_4_;
          auVar59._0_4_ = auVar115._0_4_ * auVar149._0_4_;
          auVar59._8_4_ = auVar115._8_4_ * auVar149._8_4_;
          auVar59._12_4_ = auVar115._12_4_ * auVar149._12_4_;
          auVar59._16_4_ = auVar115._16_4_ * fVar93;
          auVar59._20_4_ = auVar115._20_4_ * fVar94;
          auVar59._24_4_ = auVar115._24_4_ * fVar156;
          auVar59._28_4_ = iVar2;
          auVar107 = vfmsub231ps_fma(auVar59,auVar148,auVar116);
          auVar211._0_4_ = auVar148._0_4_ * auVar127._0_4_;
          auVar211._4_4_ = auVar148._4_4_ * auVar127._4_4_;
          auVar211._8_4_ = auVar148._8_4_ * auVar127._8_4_;
          auVar211._12_4_ = auVar148._12_4_ * auVar127._12_4_;
          auVar211._16_4_ = fVar194 * auVar127._16_4_;
          auVar211._20_4_ = fVar179 * auVar127._20_4_;
          auVar211._24_4_ = fVar185 * auVar127._24_4_;
          auVar211._28_4_ = 0;
          auVar110 = vfmsub231ps_fma(auVar211,auVar115,auVar147);
          auVar129 = vfmadd231ps_avx512vl(ZEXT1632(auVar110),auVar122,auVar129);
          auVar121 = vfmadd231ps_avx512vl(auVar129,auVar122,ZEXT1632(auVar107));
          auVar212 = ZEXT3264(auVar121);
          auVar129 = vmaxps_avx(auVar120,auVar121);
          uVar180 = vcmpps_avx512vl(auVar129,auVar122,2);
          bVar90 = bVar90 & (byte)uVar180;
          if (bVar90 != 0) {
            auVar60._4_4_ = auVar116._4_4_ * auVar130._4_4_;
            auVar60._0_4_ = auVar116._0_4_ * auVar130._0_4_;
            auVar60._8_4_ = auVar116._8_4_ * auVar130._8_4_;
            auVar60._12_4_ = auVar116._12_4_ * auVar130._12_4_;
            auVar60._16_4_ = auVar116._16_4_ * auVar130._16_4_;
            auVar60._20_4_ = auVar116._20_4_ * auVar130._20_4_;
            auVar60._24_4_ = auVar116._24_4_ * auVar130._24_4_;
            auVar60._28_4_ = auVar129._28_4_;
            auVar28 = vfmsub231ps_fma(auVar60,auVar115,auVar128);
            auVar61._4_4_ = auVar128._4_4_ * auVar127._4_4_;
            auVar61._0_4_ = auVar128._0_4_ * auVar127._0_4_;
            auVar61._8_4_ = auVar128._8_4_ * auVar127._8_4_;
            auVar61._12_4_ = auVar128._12_4_ * auVar127._12_4_;
            auVar61._16_4_ = auVar128._16_4_ * auVar127._16_4_;
            auVar61._20_4_ = auVar128._20_4_ * auVar127._20_4_;
            auVar61._24_4_ = auVar128._24_4_ * auVar127._24_4_;
            auVar61._28_4_ = auVar128._28_4_;
            auVar109 = vfmsub231ps_fma(auVar61,auVar126,auVar116);
            auVar62._4_4_ = auVar115._4_4_ * auVar126._4_4_;
            auVar62._0_4_ = auVar115._0_4_ * auVar126._0_4_;
            auVar62._8_4_ = auVar115._8_4_ * auVar126._8_4_;
            auVar62._12_4_ = auVar115._12_4_ * auVar126._12_4_;
            auVar62._16_4_ = auVar115._16_4_ * auVar126._16_4_;
            auVar62._20_4_ = auVar115._20_4_ * auVar126._20_4_;
            auVar62._24_4_ = auVar115._24_4_ * auVar126._24_4_;
            auVar62._28_4_ = auVar115._28_4_;
            auVar103 = vfmsub231ps_fma(auVar62,auVar127,auVar130);
            auVar107 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar109),ZEXT1632(auVar103));
            auVar110 = vfmadd231ps_fma(ZEXT1632(auVar107),ZEXT1632(auVar28),
                                       ZEXT1232(ZEXT412(0)) << 0x20);
            auVar129 = vrcp14ps_avx512vl(ZEXT1632(auVar110));
            auVar36._8_4_ = 0x3f800000;
            auVar36._0_8_ = 0x3f8000003f800000;
            auVar36._12_4_ = 0x3f800000;
            auVar36._16_4_ = 0x3f800000;
            auVar36._20_4_ = 0x3f800000;
            auVar36._24_4_ = 0x3f800000;
            auVar36._28_4_ = 0x3f800000;
            auVar130 = vfnmadd213ps_avx512vl(auVar129,ZEXT1632(auVar110),auVar36);
            auVar107 = vfmadd132ps_fma(auVar130,auVar129,auVar129);
            auVar219 = ZEXT1664(auVar107);
            auVar63._4_4_ = auVar103._4_4_ * auVar146._4_4_;
            auVar63._0_4_ = auVar103._0_4_ * auVar146._0_4_;
            auVar63._8_4_ = auVar103._8_4_ * auVar146._8_4_;
            auVar63._12_4_ = auVar103._12_4_ * auVar146._12_4_;
            auVar63._16_4_ = fVar186 * 0.0;
            auVar63._20_4_ = fVar225 * 0.0;
            auVar63._24_4_ = fVar226 * 0.0;
            auVar63._28_4_ = iVar1;
            auVar109 = vfmadd231ps_fma(auVar63,auVar117,ZEXT1632(auVar109));
            auVar109 = vfmadd231ps_fma(ZEXT1632(auVar109),auVar125,ZEXT1632(auVar28));
            fVar186 = auVar107._0_4_;
            fVar225 = auVar107._4_4_;
            fVar226 = auVar107._8_4_;
            fVar179 = auVar107._12_4_;
            local_5a0._28_4_ = auVar129._28_4_;
            local_5a0._0_28_ =
                 ZEXT1628(CONCAT412(auVar109._12_4_ * fVar179,
                                    CONCAT48(auVar109._8_4_ * fVar226,
                                             CONCAT44(auVar109._4_4_ * fVar225,
                                                      auVar109._0_4_ * fVar186))));
            auVar222 = ZEXT3264(local_5a0);
            auVar81._4_4_ = uStack_75c;
            auVar81._0_4_ = local_760;
            auVar81._8_4_ = uStack_758;
            auVar81._12_4_ = uStack_754;
            auVar81._16_4_ = uStack_750;
            auVar81._20_4_ = uStack_74c;
            auVar81._24_4_ = uStack_748;
            auVar81._28_4_ = uStack_744;
            uVar180 = vcmpps_avx512vl(local_5a0,auVar81,0xd);
            uVar178 = *(undefined4 *)(ray + k * 4 + 0x200);
            auVar37._4_4_ = uVar178;
            auVar37._0_4_ = uVar178;
            auVar37._8_4_ = uVar178;
            auVar37._12_4_ = uVar178;
            auVar37._16_4_ = uVar178;
            auVar37._20_4_ = uVar178;
            auVar37._24_4_ = uVar178;
            auVar37._28_4_ = uVar178;
            uVar30 = vcmpps_avx512vl(local_5a0,auVar37,2);
            bVar90 = (byte)uVar180 & (byte)uVar30 & bVar90;
            if (bVar90 != 0) {
              uVar92 = vcmpps_avx512vl(ZEXT1632(auVar110),ZEXT1232(ZEXT412(0)) << 0x20,4);
              uVar92 = bVar90 & uVar92;
              if ((char)uVar92 != '\0') {
                fVar185 = auVar120._0_4_ * fVar186;
                fVar194 = auVar120._4_4_ * fVar225;
                auVar64._4_4_ = fVar194;
                auVar64._0_4_ = fVar185;
                fVar93 = auVar120._8_4_ * fVar226;
                auVar64._8_4_ = fVar93;
                fVar94 = auVar120._12_4_ * fVar179;
                auVar64._12_4_ = fVar94;
                fVar156 = auVar120._16_4_ * 0.0;
                auVar64._16_4_ = fVar156;
                fVar157 = auVar120._20_4_ * 0.0;
                auVar64._20_4_ = fVar157;
                fVar158 = auVar120._24_4_ * 0.0;
                auVar64._24_4_ = fVar158;
                auVar64._28_4_ = auVar120._28_4_;
                auVar193._8_4_ = 0x3f800000;
                auVar193._0_8_ = 0x3f8000003f800000;
                auVar193._12_4_ = 0x3f800000;
                auVar193._16_4_ = 0x3f800000;
                auVar193._20_4_ = 0x3f800000;
                auVar193._24_4_ = 0x3f800000;
                auVar193._28_4_ = 0x3f800000;
                auVar129 = vsubps_avx(auVar193,auVar64);
                local_5e0._0_4_ =
                     (float)((uint)(bVar82 & 1) * (int)fVar185 |
                            (uint)!(bool)(bVar82 & 1) * auVar129._0_4_);
                bVar13 = (bool)((byte)(uVar83 >> 1) & 1);
                local_5e0._4_4_ =
                     (float)((uint)bVar13 * (int)fVar194 | (uint)!bVar13 * auVar129._4_4_);
                bVar13 = (bool)((byte)(uVar83 >> 2) & 1);
                local_5e0._8_4_ =
                     (float)((uint)bVar13 * (int)fVar93 | (uint)!bVar13 * auVar129._8_4_);
                bVar13 = (bool)((byte)(uVar83 >> 3) & 1);
                local_5e0._12_4_ =
                     (float)((uint)bVar13 * (int)fVar94 | (uint)!bVar13 * auVar129._12_4_);
                bVar13 = (bool)((byte)(uVar83 >> 4) & 1);
                local_5e0._16_4_ =
                     (float)((uint)bVar13 * (int)fVar156 | (uint)!bVar13 * auVar129._16_4_);
                bVar13 = (bool)((byte)(uVar83 >> 5) & 1);
                local_5e0._20_4_ =
                     (float)((uint)bVar13 * (int)fVar157 | (uint)!bVar13 * auVar129._20_4_);
                bVar13 = (bool)((byte)(uVar83 >> 6) & 1);
                local_5e0._24_4_ =
                     (float)((uint)bVar13 * (int)fVar158 | (uint)!bVar13 * auVar129._24_4_);
                bVar13 = SUB81(uVar83 >> 7,0);
                local_5e0._28_4_ =
                     (float)((uint)bVar13 * auVar120._28_4_ | (uint)!bVar13 * auVar129._28_4_);
                auVar129 = vsubps_avx(auVar119,auVar118);
                auVar107 = vfmadd213ps_fma(auVar129,local_5e0,auVar118);
                uVar178 = *(undefined4 *)((long)local_7e0->ray_space + k * 4 + -0x40);
                auVar38._4_4_ = uVar178;
                auVar38._0_4_ = uVar178;
                auVar38._8_4_ = uVar178;
                auVar38._12_4_ = uVar178;
                auVar38._16_4_ = uVar178;
                auVar38._20_4_ = uVar178;
                auVar38._24_4_ = uVar178;
                auVar38._28_4_ = uVar178;
                auVar129 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar107._12_4_ + auVar107._12_4_,
                                                              CONCAT48(auVar107._8_4_ +
                                                                       auVar107._8_4_,
                                                                       CONCAT44(auVar107._4_4_ +
                                                                                auVar107._4_4_,
                                                                                auVar107._0_4_ +
                                                                                auVar107._0_4_)))),
                                           auVar38);
                uVar29 = vcmpps_avx512vl(local_5a0,auVar129,6);
                uVar92 = uVar92 & uVar29;
                uVar91 = (uint)uVar92;
                bVar90 = (byte)uVar92;
                if (bVar90 != 0) {
                  auVar184._0_4_ = auVar121._0_4_ * fVar186;
                  auVar184._4_4_ = auVar121._4_4_ * fVar225;
                  auVar184._8_4_ = auVar121._8_4_ * fVar226;
                  auVar184._12_4_ = auVar121._12_4_ * fVar179;
                  auVar184._16_4_ = auVar121._16_4_ * 0.0;
                  auVar184._20_4_ = auVar121._20_4_ * 0.0;
                  auVar184._24_4_ = auVar121._24_4_ * 0.0;
                  auVar184._28_4_ = 0;
                  auVar206._8_4_ = 0x3f800000;
                  auVar206._0_8_ = 0x3f8000003f800000;
                  auVar206._12_4_ = 0x3f800000;
                  auVar206._16_4_ = 0x3f800000;
                  auVar206._20_4_ = 0x3f800000;
                  auVar206._24_4_ = 0x3f800000;
                  auVar206._28_4_ = 0x3f800000;
                  auVar129 = vsubps_avx(auVar206,auVar184);
                  auVar151._0_4_ =
                       (uint)(bVar82 & 1) * (int)auVar184._0_4_ |
                       (uint)!(bool)(bVar82 & 1) * auVar129._0_4_;
                  bVar13 = (bool)((byte)(uVar83 >> 1) & 1);
                  auVar151._4_4_ =
                       (uint)bVar13 * (int)auVar184._4_4_ | (uint)!bVar13 * auVar129._4_4_;
                  bVar13 = (bool)((byte)(uVar83 >> 2) & 1);
                  auVar151._8_4_ =
                       (uint)bVar13 * (int)auVar184._8_4_ | (uint)!bVar13 * auVar129._8_4_;
                  bVar13 = (bool)((byte)(uVar83 >> 3) & 1);
                  auVar151._12_4_ =
                       (uint)bVar13 * (int)auVar184._12_4_ | (uint)!bVar13 * auVar129._12_4_;
                  bVar13 = (bool)((byte)(uVar83 >> 4) & 1);
                  auVar151._16_4_ =
                       (uint)bVar13 * (int)auVar184._16_4_ | (uint)!bVar13 * auVar129._16_4_;
                  bVar13 = (bool)((byte)(uVar83 >> 5) & 1);
                  auVar151._20_4_ =
                       (uint)bVar13 * (int)auVar184._20_4_ | (uint)!bVar13 * auVar129._20_4_;
                  bVar13 = (bool)((byte)(uVar83 >> 6) & 1);
                  auVar151._24_4_ =
                       (uint)bVar13 * (int)auVar184._24_4_ | (uint)!bVar13 * auVar129._24_4_;
                  auVar151._28_4_ = (uint)!SUB81(uVar83 >> 7,0) * auVar129._28_4_;
                  auVar39._8_4_ = 0x40000000;
                  auVar39._0_8_ = 0x4000000040000000;
                  auVar39._12_4_ = 0x40000000;
                  auVar39._16_4_ = 0x40000000;
                  auVar39._20_4_ = 0x40000000;
                  auVar39._24_4_ = 0x40000000;
                  auVar39._28_4_ = 0x40000000;
                  local_5c0 = vfmsub132ps_avx512vl(auVar151,auVar206,auVar39);
                  local_580 = (undefined4)lVar86;
                  local_570 = local_840;
                  uStack_568 = uStack_838;
                  local_560 = local_850;
                  uStack_558 = uStack_848;
                  local_550 = local_860;
                  uStack_548 = uStack_858;
                  local_540 = local_870;
                  uStack_538 = uStack_868;
                  pGVar88 = (context->scene->geometries).items[uVar7].ptr;
                  if ((pGVar88->mask & *(uint *)(ray + k * 4 + 0x240)) != 0) {
                    auVar107 = vcvtsi2ss_avx512f(auVar114,local_580);
                    fVar186 = auVar107._0_4_;
                    local_520[0] = (fVar186 + local_5e0._0_4_ + 0.0) * local_420;
                    local_520[1] = (fVar186 + local_5e0._4_4_ + 1.0) * fStack_41c;
                    local_520[2] = (fVar186 + local_5e0._8_4_ + 2.0) * fStack_418;
                    local_520[3] = (fVar186 + local_5e0._12_4_ + 3.0) * fStack_414;
                    fStack_510 = (fVar186 + local_5e0._16_4_ + 4.0) * fStack_410;
                    fStack_50c = (fVar186 + local_5e0._20_4_ + 5.0) * fStack_40c;
                    fStack_508 = (fVar186 + local_5e0._24_4_ + 6.0) * fStack_408;
                    fStack_504 = fVar186 + local_5e0._28_4_ + 7.0;
                    local_500 = local_5c0;
                    local_4e0 = local_5a0;
                    auVar172._8_4_ = 0x7f800000;
                    auVar172._0_8_ = 0x7f8000007f800000;
                    auVar172._12_4_ = 0x7f800000;
                    auVar172._16_4_ = 0x7f800000;
                    auVar172._20_4_ = 0x7f800000;
                    auVar172._24_4_ = 0x7f800000;
                    auVar172._28_4_ = 0x7f800000;
                    auVar129 = vblendmps_avx512vl(auVar172,local_5a0);
                    auVar152._0_4_ =
                         (uint)(bVar90 & 1) * auVar129._0_4_ |
                         (uint)!(bool)(bVar90 & 1) * 0x7f800000;
                    bVar13 = (bool)((byte)(uVar92 >> 1) & 1);
                    auVar152._4_4_ = (uint)bVar13 * auVar129._4_4_ | (uint)!bVar13 * 0x7f800000;
                    bVar13 = (bool)((byte)(uVar92 >> 2) & 1);
                    auVar152._8_4_ = (uint)bVar13 * auVar129._8_4_ | (uint)!bVar13 * 0x7f800000;
                    bVar13 = (bool)((byte)(uVar92 >> 3) & 1);
                    auVar152._12_4_ = (uint)bVar13 * auVar129._12_4_ | (uint)!bVar13 * 0x7f800000;
                    bVar13 = (bool)((byte)(uVar92 >> 4) & 1);
                    auVar152._16_4_ = (uint)bVar13 * auVar129._16_4_ | (uint)!bVar13 * 0x7f800000;
                    bVar13 = (bool)((byte)(uVar92 >> 5) & 1);
                    auVar152._20_4_ = (uint)bVar13 * auVar129._20_4_ | (uint)!bVar13 * 0x7f800000;
                    bVar13 = (bool)((byte)(uVar92 >> 6) & 1);
                    auVar152._24_4_ = (uint)bVar13 * auVar129._24_4_ | (uint)!bVar13 * 0x7f800000;
                    bVar13 = SUB81(uVar92 >> 7,0);
                    auVar152._28_4_ = (uint)bVar13 * auVar129._28_4_ | (uint)!bVar13 * 0x7f800000;
                    auVar129 = vshufps_avx(auVar152,auVar152,0xb1);
                    auVar129 = vminps_avx(auVar152,auVar129);
                    auVar130 = vshufpd_avx(auVar129,auVar129,5);
                    auVar129 = vminps_avx(auVar129,auVar130);
                    auVar130 = vpermpd_avx2(auVar129,0x4e);
                    auVar129 = vminps_avx(auVar129,auVar130);
                    uVar180 = vcmpps_avx512vl(auVar152,auVar129,0);
                    if ((bVar90 & (byte)uVar180) != 0) {
                      uVar91 = (uint)(bVar90 & (byte)uVar180);
                    }
                    uVar84 = 0;
                    for (; (uVar91 & 1) == 0; uVar91 = uVar91 >> 1 | 0x80000000) {
                      uVar84 = uVar84 + 1;
                    }
                    uVar83 = (ulong)uVar84;
                    if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                       (pGVar88->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                      local_800 = ZEXT416(*(uint *)(ray + k * 4 + 0x200));
                      local_7f0 = pGVar88;
                      local_7d8 = uVar85;
                      local_7c0 = local_5a0;
                      local_57c = iVar8;
                      do {
                        local_200 = vbroadcastss_avx512f(ZEXT416((uint)local_520[uVar83]));
                        local_1c0 = vbroadcastss_avx512f(ZEXT416(*(uint *)(local_500 + uVar83 * 4)))
                        ;
                        *(undefined4 *)(ray + k * 4 + 0x200) =
                             *(undefined4 *)(local_4e0 + uVar83 * 4);
                        local_830.context = context->user;
                        fVar179 = local_200._0_4_;
                        fVar225 = 1.0 - fVar179;
                        fVar186 = fVar225 * fVar225 * -3.0;
                        auVar107 = vfmadd231ss_fma(ZEXT416((uint)(fVar225 * fVar225)),
                                                   ZEXT416((uint)(fVar179 * fVar225)),
                                                   ZEXT416(0xc0000000));
                        auVar110 = vfmsub132ss_fma(ZEXT416((uint)(fVar179 * fVar225)),
                                                   ZEXT416((uint)(fVar179 * fVar179)),
                                                   ZEXT416(0x40000000));
                        fVar225 = auVar107._0_4_ * 3.0;
                        fVar226 = auVar110._0_4_ * 3.0;
                        fVar179 = fVar179 * fVar179 * 3.0;
                        auVar217._0_4_ = fVar179 * fVar27;
                        auVar217._4_4_ = fVar179 * fVar65;
                        auVar217._8_4_ = fVar179 * fVar66;
                        auVar217._12_4_ = fVar179 * fVar67;
                        auVar165._4_4_ = fVar226;
                        auVar165._0_4_ = fVar226;
                        auVar165._8_4_ = fVar226;
                        auVar165._12_4_ = fVar226;
                        auVar107 = vfmadd132ps_fma(auVar165,auVar217,auVar104);
                        auVar202._4_4_ = fVar225;
                        auVar202._0_4_ = fVar225;
                        auVar202._8_4_ = fVar225;
                        auVar202._12_4_ = fVar225;
                        auVar107 = vfmadd132ps_fma(auVar202,auVar107,auVar6);
                        auVar166._4_4_ = fVar186;
                        auVar166._0_4_ = fVar186;
                        auVar166._8_4_ = fVar186;
                        auVar166._12_4_ = fVar186;
                        auVar107 = vfmadd132ps_fma(auVar166,auVar107,auVar108);
                        auVar177 = vbroadcastss_avx512f(auVar107);
                        auVar240 = vbroadcastss_avx512f(ZEXT416(1));
                        auVar212 = vpermps_avx512f(auVar240,ZEXT1664(auVar107));
                        auVar219 = vbroadcastss_avx512f(ZEXT416(2));
                        local_240 = vpermps_avx512f(auVar219,ZEXT1664(auVar107));
                        local_2c0[0] = (RTCHitN)auVar177[0];
                        local_2c0[1] = (RTCHitN)auVar177[1];
                        local_2c0[2] = (RTCHitN)auVar177[2];
                        local_2c0[3] = (RTCHitN)auVar177[3];
                        local_2c0[4] = (RTCHitN)auVar177[4];
                        local_2c0[5] = (RTCHitN)auVar177[5];
                        local_2c0[6] = (RTCHitN)auVar177[6];
                        local_2c0[7] = (RTCHitN)auVar177[7];
                        local_2c0[8] = (RTCHitN)auVar177[8];
                        local_2c0[9] = (RTCHitN)auVar177[9];
                        local_2c0[10] = (RTCHitN)auVar177[10];
                        local_2c0[0xb] = (RTCHitN)auVar177[0xb];
                        local_2c0[0xc] = (RTCHitN)auVar177[0xc];
                        local_2c0[0xd] = (RTCHitN)auVar177[0xd];
                        local_2c0[0xe] = (RTCHitN)auVar177[0xe];
                        local_2c0[0xf] = (RTCHitN)auVar177[0xf];
                        local_2c0[0x10] = (RTCHitN)auVar177[0x10];
                        local_2c0[0x11] = (RTCHitN)auVar177[0x11];
                        local_2c0[0x12] = (RTCHitN)auVar177[0x12];
                        local_2c0[0x13] = (RTCHitN)auVar177[0x13];
                        local_2c0[0x14] = (RTCHitN)auVar177[0x14];
                        local_2c0[0x15] = (RTCHitN)auVar177[0x15];
                        local_2c0[0x16] = (RTCHitN)auVar177[0x16];
                        local_2c0[0x17] = (RTCHitN)auVar177[0x17];
                        local_2c0[0x18] = (RTCHitN)auVar177[0x18];
                        local_2c0[0x19] = (RTCHitN)auVar177[0x19];
                        local_2c0[0x1a] = (RTCHitN)auVar177[0x1a];
                        local_2c0[0x1b] = (RTCHitN)auVar177[0x1b];
                        local_2c0[0x1c] = (RTCHitN)auVar177[0x1c];
                        local_2c0[0x1d] = (RTCHitN)auVar177[0x1d];
                        local_2c0[0x1e] = (RTCHitN)auVar177[0x1e];
                        local_2c0[0x1f] = (RTCHitN)auVar177[0x1f];
                        local_2c0[0x20] = (RTCHitN)auVar177[0x20];
                        local_2c0[0x21] = (RTCHitN)auVar177[0x21];
                        local_2c0[0x22] = (RTCHitN)auVar177[0x22];
                        local_2c0[0x23] = (RTCHitN)auVar177[0x23];
                        local_2c0[0x24] = (RTCHitN)auVar177[0x24];
                        local_2c0[0x25] = (RTCHitN)auVar177[0x25];
                        local_2c0[0x26] = (RTCHitN)auVar177[0x26];
                        local_2c0[0x27] = (RTCHitN)auVar177[0x27];
                        local_2c0[0x28] = (RTCHitN)auVar177[0x28];
                        local_2c0[0x29] = (RTCHitN)auVar177[0x29];
                        local_2c0[0x2a] = (RTCHitN)auVar177[0x2a];
                        local_2c0[0x2b] = (RTCHitN)auVar177[0x2b];
                        local_2c0[0x2c] = (RTCHitN)auVar177[0x2c];
                        local_2c0[0x2d] = (RTCHitN)auVar177[0x2d];
                        local_2c0[0x2e] = (RTCHitN)auVar177[0x2e];
                        local_2c0[0x2f] = (RTCHitN)auVar177[0x2f];
                        local_2c0[0x30] = (RTCHitN)auVar177[0x30];
                        local_2c0[0x31] = (RTCHitN)auVar177[0x31];
                        local_2c0[0x32] = (RTCHitN)auVar177[0x32];
                        local_2c0[0x33] = (RTCHitN)auVar177[0x33];
                        local_2c0[0x34] = (RTCHitN)auVar177[0x34];
                        local_2c0[0x35] = (RTCHitN)auVar177[0x35];
                        local_2c0[0x36] = (RTCHitN)auVar177[0x36];
                        local_2c0[0x37] = (RTCHitN)auVar177[0x37];
                        local_2c0[0x38] = (RTCHitN)auVar177[0x38];
                        local_2c0[0x39] = (RTCHitN)auVar177[0x39];
                        local_2c0[0x3a] = (RTCHitN)auVar177[0x3a];
                        local_2c0[0x3b] = (RTCHitN)auVar177[0x3b];
                        local_2c0[0x3c] = (RTCHitN)auVar177[0x3c];
                        local_2c0[0x3d] = (RTCHitN)auVar177[0x3d];
                        local_2c0[0x3e] = (RTCHitN)auVar177[0x3e];
                        local_2c0[0x3f] = (RTCHitN)auVar177[0x3f];
                        local_280 = auVar212;
                        local_180 = local_340._0_8_;
                        uStack_178 = local_340._8_8_;
                        uStack_170 = local_340._16_8_;
                        uStack_168 = local_340._24_8_;
                        uStack_160 = local_340._32_8_;
                        uStack_158 = local_340._40_8_;
                        uStack_150 = local_340._48_8_;
                        uStack_148 = local_340._56_8_;
                        auVar177 = vmovdqa64_avx512f(local_300);
                        local_140 = vmovdqa64_avx512f(auVar177);
                        auVar129 = vpcmpeqd_avx2(auVar177._0_32_,auVar177._0_32_);
                        local_7e8[3] = auVar129;
                        local_7e8[2] = auVar129;
                        local_7e8[1] = auVar129;
                        *local_7e8 = auVar129;
                        local_100 = vbroadcastss_avx512f(ZEXT416((local_830.context)->instID[0]));
                        local_c0 = vbroadcastss_avx512f(ZEXT416((local_830.context)->instPrimID[0]))
                        ;
                        auVar177 = vmovdqa64_avx512f(local_380);
                        local_740 = vmovdqa64_avx512f(auVar177);
                        local_830.valid = (int *)local_740;
                        local_830.geometryUserPtr = pGVar88->userPtr;
                        local_830.hit = local_2c0;
                        local_830.N = 0x10;
                        local_830.ray = (RTCRayN *)ray;
                        if (pGVar88->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                          auVar212 = ZEXT1664(auVar212._0_16_);
                          auVar219 = ZEXT1664(auVar219._0_16_);
                          (*pGVar88->intersectionFilterN)(&local_830);
                          auVar222 = ZEXT3264(local_7c0);
                          auVar177 = vmovdqa64_avx512f(local_740);
                          pGVar88 = local_7f0;
                        }
                        uVar180 = vptestmd_avx512f(auVar177,auVar177);
                        if ((short)uVar180 == 0) {
LAB_018b55af:
                          *(undefined4 *)(ray + k * 4 + 0x200) = local_800._0_4_;
                        }
                        else {
                          p_Var12 = context->args->filter;
                          if ((p_Var12 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar88->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar212 = ZEXT1664(auVar212._0_16_);
                            auVar219 = ZEXT1664(auVar219._0_16_);
                            (*p_Var12)(&local_830);
                            auVar222 = ZEXT3264(local_7c0);
                            auVar177 = vmovdqa64_avx512f(local_740);
                            pGVar88 = local_7f0;
                          }
                          uVar85 = vptestmd_avx512f(auVar177,auVar177);
                          if ((short)uVar85 == 0) goto LAB_018b55af;
                          iVar1 = *(int *)(local_830.hit + 4);
                          iVar2 = *(int *)(local_830.hit + 8);
                          iVar68 = *(int *)(local_830.hit + 0xc);
                          iVar69 = *(int *)(local_830.hit + 0x10);
                          iVar70 = *(int *)(local_830.hit + 0x14);
                          iVar71 = *(int *)(local_830.hit + 0x18);
                          iVar72 = *(int *)(local_830.hit + 0x1c);
                          iVar73 = *(int *)(local_830.hit + 0x20);
                          iVar74 = *(int *)(local_830.hit + 0x24);
                          iVar75 = *(int *)(local_830.hit + 0x28);
                          iVar76 = *(int *)(local_830.hit + 0x2c);
                          iVar77 = *(int *)(local_830.hit + 0x30);
                          iVar78 = *(int *)(local_830.hit + 0x34);
                          iVar79 = *(int *)(local_830.hit + 0x38);
                          iVar80 = *(int *)(local_830.hit + 0x3c);
                          bVar90 = (byte)uVar85;
                          bVar13 = (bool)((byte)(uVar85 >> 1) & 1);
                          bVar14 = (bool)((byte)(uVar85 >> 2) & 1);
                          bVar15 = (bool)((byte)(uVar85 >> 3) & 1);
                          bVar16 = (bool)((byte)(uVar85 >> 4) & 1);
                          bVar17 = (bool)((byte)(uVar85 >> 5) & 1);
                          bVar18 = (bool)((byte)(uVar85 >> 6) & 1);
                          bVar19 = (bool)((byte)(uVar85 >> 7) & 1);
                          bVar82 = (byte)(uVar85 >> 8);
                          bVar20 = (bool)((byte)(uVar85 >> 9) & 1);
                          bVar21 = (bool)((byte)(uVar85 >> 10) & 1);
                          bVar22 = (bool)((byte)(uVar85 >> 0xb) & 1);
                          bVar23 = (bool)((byte)(uVar85 >> 0xc) & 1);
                          bVar24 = (bool)((byte)(uVar85 >> 0xd) & 1);
                          bVar25 = (bool)((byte)(uVar85 >> 0xe) & 1);
                          bVar26 = SUB81(uVar85 >> 0xf,0);
                          *(uint *)(local_830.ray + 0x300) =
                               (uint)(bVar90 & 1) * *(int *)local_830.hit |
                               (uint)!(bool)(bVar90 & 1) * *(int *)(local_830.ray + 0x300);
                          *(uint *)(local_830.ray + 0x304) =
                               (uint)bVar13 * iVar1 |
                               (uint)!bVar13 * *(int *)(local_830.ray + 0x304);
                          *(uint *)(local_830.ray + 0x308) =
                               (uint)bVar14 * iVar2 |
                               (uint)!bVar14 * *(int *)(local_830.ray + 0x308);
                          *(uint *)(local_830.ray + 0x30c) =
                               (uint)bVar15 * iVar68 |
                               (uint)!bVar15 * *(int *)(local_830.ray + 0x30c);
                          *(uint *)(local_830.ray + 0x310) =
                               (uint)bVar16 * iVar69 |
                               (uint)!bVar16 * *(int *)(local_830.ray + 0x310);
                          *(uint *)(local_830.ray + 0x314) =
                               (uint)bVar17 * iVar70 |
                               (uint)!bVar17 * *(int *)(local_830.ray + 0x314);
                          *(uint *)(local_830.ray + 0x318) =
                               (uint)bVar18 * iVar71 |
                               (uint)!bVar18 * *(int *)(local_830.ray + 0x318);
                          *(uint *)(local_830.ray + 0x31c) =
                               (uint)bVar19 * iVar72 |
                               (uint)!bVar19 * *(int *)(local_830.ray + 0x31c);
                          *(uint *)(local_830.ray + 800) =
                               (uint)(bVar82 & 1) * iVar73 |
                               (uint)!(bool)(bVar82 & 1) * *(int *)(local_830.ray + 800);
                          *(uint *)(local_830.ray + 0x324) =
                               (uint)bVar20 * iVar74 |
                               (uint)!bVar20 * *(int *)(local_830.ray + 0x324);
                          *(uint *)(local_830.ray + 0x328) =
                               (uint)bVar21 * iVar75 |
                               (uint)!bVar21 * *(int *)(local_830.ray + 0x328);
                          *(uint *)(local_830.ray + 0x32c) =
                               (uint)bVar22 * iVar76 |
                               (uint)!bVar22 * *(int *)(local_830.ray + 0x32c);
                          *(uint *)(local_830.ray + 0x330) =
                               (uint)bVar23 * iVar77 |
                               (uint)!bVar23 * *(int *)(local_830.ray + 0x330);
                          *(uint *)(local_830.ray + 0x334) =
                               (uint)bVar24 * iVar78 |
                               (uint)!bVar24 * *(int *)(local_830.ray + 0x334);
                          *(uint *)(local_830.ray + 0x338) =
                               (uint)bVar25 * iVar79 |
                               (uint)!bVar25 * *(int *)(local_830.ray + 0x338);
                          *(uint *)(local_830.ray + 0x33c) =
                               (uint)bVar26 * iVar80 |
                               (uint)!bVar26 * *(int *)(local_830.ray + 0x33c);
                          iVar1 = *(int *)(local_830.hit + 0x44);
                          iVar2 = *(int *)(local_830.hit + 0x48);
                          iVar68 = *(int *)(local_830.hit + 0x4c);
                          iVar69 = *(int *)(local_830.hit + 0x50);
                          iVar70 = *(int *)(local_830.hit + 0x54);
                          iVar71 = *(int *)(local_830.hit + 0x58);
                          iVar72 = *(int *)(local_830.hit + 0x5c);
                          iVar73 = *(int *)(local_830.hit + 0x60);
                          iVar74 = *(int *)(local_830.hit + 100);
                          iVar75 = *(int *)(local_830.hit + 0x68);
                          iVar76 = *(int *)(local_830.hit + 0x6c);
                          iVar77 = *(int *)(local_830.hit + 0x70);
                          iVar78 = *(int *)(local_830.hit + 0x74);
                          iVar79 = *(int *)(local_830.hit + 0x78);
                          iVar80 = *(int *)(local_830.hit + 0x7c);
                          bVar13 = (bool)((byte)(uVar85 >> 1) & 1);
                          bVar14 = (bool)((byte)(uVar85 >> 2) & 1);
                          bVar15 = (bool)((byte)(uVar85 >> 3) & 1);
                          bVar16 = (bool)((byte)(uVar85 >> 4) & 1);
                          bVar17 = (bool)((byte)(uVar85 >> 5) & 1);
                          bVar18 = (bool)((byte)(uVar85 >> 6) & 1);
                          bVar19 = (bool)((byte)(uVar85 >> 7) & 1);
                          bVar20 = (bool)((byte)(uVar85 >> 9) & 1);
                          bVar21 = (bool)((byte)(uVar85 >> 10) & 1);
                          bVar22 = (bool)((byte)(uVar85 >> 0xb) & 1);
                          bVar23 = (bool)((byte)(uVar85 >> 0xc) & 1);
                          bVar24 = (bool)((byte)(uVar85 >> 0xd) & 1);
                          bVar25 = (bool)((byte)(uVar85 >> 0xe) & 1);
                          bVar26 = SUB81(uVar85 >> 0xf,0);
                          *(uint *)(local_830.ray + 0x340) =
                               (uint)(bVar90 & 1) * *(int *)(local_830.hit + 0x40) |
                               (uint)!(bool)(bVar90 & 1) * *(int *)(local_830.ray + 0x340);
                          *(uint *)(local_830.ray + 0x344) =
                               (uint)bVar13 * iVar1 |
                               (uint)!bVar13 * *(int *)(local_830.ray + 0x344);
                          *(uint *)(local_830.ray + 0x348) =
                               (uint)bVar14 * iVar2 |
                               (uint)!bVar14 * *(int *)(local_830.ray + 0x348);
                          *(uint *)(local_830.ray + 0x34c) =
                               (uint)bVar15 * iVar68 |
                               (uint)!bVar15 * *(int *)(local_830.ray + 0x34c);
                          *(uint *)(local_830.ray + 0x350) =
                               (uint)bVar16 * iVar69 |
                               (uint)!bVar16 * *(int *)(local_830.ray + 0x350);
                          *(uint *)(local_830.ray + 0x354) =
                               (uint)bVar17 * iVar70 |
                               (uint)!bVar17 * *(int *)(local_830.ray + 0x354);
                          *(uint *)(local_830.ray + 0x358) =
                               (uint)bVar18 * iVar71 |
                               (uint)!bVar18 * *(int *)(local_830.ray + 0x358);
                          *(uint *)(local_830.ray + 0x35c) =
                               (uint)bVar19 * iVar72 |
                               (uint)!bVar19 * *(int *)(local_830.ray + 0x35c);
                          *(uint *)(local_830.ray + 0x360) =
                               (uint)(bVar82 & 1) * iVar73 |
                               (uint)!(bool)(bVar82 & 1) * *(int *)(local_830.ray + 0x360);
                          *(uint *)(local_830.ray + 0x364) =
                               (uint)bVar20 * iVar74 |
                               (uint)!bVar20 * *(int *)(local_830.ray + 0x364);
                          *(uint *)(local_830.ray + 0x368) =
                               (uint)bVar21 * iVar75 |
                               (uint)!bVar21 * *(int *)(local_830.ray + 0x368);
                          *(uint *)(local_830.ray + 0x36c) =
                               (uint)bVar22 * iVar76 |
                               (uint)!bVar22 * *(int *)(local_830.ray + 0x36c);
                          *(uint *)(local_830.ray + 0x370) =
                               (uint)bVar23 * iVar77 |
                               (uint)!bVar23 * *(int *)(local_830.ray + 0x370);
                          *(uint *)(local_830.ray + 0x374) =
                               (uint)bVar24 * iVar78 |
                               (uint)!bVar24 * *(int *)(local_830.ray + 0x374);
                          *(uint *)(local_830.ray + 0x378) =
                               (uint)bVar25 * iVar79 |
                               (uint)!bVar25 * *(int *)(local_830.ray + 0x378);
                          *(uint *)(local_830.ray + 0x37c) =
                               (uint)bVar26 * iVar80 |
                               (uint)!bVar26 * *(int *)(local_830.ray + 0x37c);
                          iVar1 = *(int *)(local_830.hit + 0x84);
                          iVar2 = *(int *)(local_830.hit + 0x88);
                          iVar68 = *(int *)(local_830.hit + 0x8c);
                          iVar69 = *(int *)(local_830.hit + 0x90);
                          iVar70 = *(int *)(local_830.hit + 0x94);
                          iVar71 = *(int *)(local_830.hit + 0x98);
                          iVar72 = *(int *)(local_830.hit + 0x9c);
                          iVar73 = *(int *)(local_830.hit + 0xa0);
                          iVar74 = *(int *)(local_830.hit + 0xa4);
                          iVar75 = *(int *)(local_830.hit + 0xa8);
                          iVar76 = *(int *)(local_830.hit + 0xac);
                          iVar77 = *(int *)(local_830.hit + 0xb0);
                          iVar78 = *(int *)(local_830.hit + 0xb4);
                          iVar79 = *(int *)(local_830.hit + 0xb8);
                          iVar80 = *(int *)(local_830.hit + 0xbc);
                          bVar13 = (bool)((byte)(uVar85 >> 1) & 1);
                          bVar14 = (bool)((byte)(uVar85 >> 2) & 1);
                          bVar15 = (bool)((byte)(uVar85 >> 3) & 1);
                          bVar16 = (bool)((byte)(uVar85 >> 4) & 1);
                          bVar17 = (bool)((byte)(uVar85 >> 5) & 1);
                          bVar18 = (bool)((byte)(uVar85 >> 6) & 1);
                          bVar19 = (bool)((byte)(uVar85 >> 7) & 1);
                          bVar20 = (bool)((byte)(uVar85 >> 9) & 1);
                          bVar21 = (bool)((byte)(uVar85 >> 10) & 1);
                          bVar22 = (bool)((byte)(uVar85 >> 0xb) & 1);
                          bVar23 = (bool)((byte)(uVar85 >> 0xc) & 1);
                          bVar24 = (bool)((byte)(uVar85 >> 0xd) & 1);
                          bVar25 = (bool)((byte)(uVar85 >> 0xe) & 1);
                          bVar26 = SUB81(uVar85 >> 0xf,0);
                          *(uint *)(local_830.ray + 0x380) =
                               (uint)(bVar90 & 1) * *(int *)(local_830.hit + 0x80) |
                               (uint)!(bool)(bVar90 & 1) * *(int *)(local_830.ray + 0x380);
                          *(uint *)(local_830.ray + 900) =
                               (uint)bVar13 * iVar1 | (uint)!bVar13 * *(int *)(local_830.ray + 900);
                          *(uint *)(local_830.ray + 0x388) =
                               (uint)bVar14 * iVar2 |
                               (uint)!bVar14 * *(int *)(local_830.ray + 0x388);
                          *(uint *)(local_830.ray + 0x38c) =
                               (uint)bVar15 * iVar68 |
                               (uint)!bVar15 * *(int *)(local_830.ray + 0x38c);
                          *(uint *)(local_830.ray + 0x390) =
                               (uint)bVar16 * iVar69 |
                               (uint)!bVar16 * *(int *)(local_830.ray + 0x390);
                          *(uint *)(local_830.ray + 0x394) =
                               (uint)bVar17 * iVar70 |
                               (uint)!bVar17 * *(int *)(local_830.ray + 0x394);
                          *(uint *)(local_830.ray + 0x398) =
                               (uint)bVar18 * iVar71 |
                               (uint)!bVar18 * *(int *)(local_830.ray + 0x398);
                          *(uint *)(local_830.ray + 0x39c) =
                               (uint)bVar19 * iVar72 |
                               (uint)!bVar19 * *(int *)(local_830.ray + 0x39c);
                          *(uint *)(local_830.ray + 0x3a0) =
                               (uint)(bVar82 & 1) * iVar73 |
                               (uint)!(bool)(bVar82 & 1) * *(int *)(local_830.ray + 0x3a0);
                          *(uint *)(local_830.ray + 0x3a4) =
                               (uint)bVar20 * iVar74 |
                               (uint)!bVar20 * *(int *)(local_830.ray + 0x3a4);
                          *(uint *)(local_830.ray + 0x3a8) =
                               (uint)bVar21 * iVar75 |
                               (uint)!bVar21 * *(int *)(local_830.ray + 0x3a8);
                          *(uint *)(local_830.ray + 0x3ac) =
                               (uint)bVar22 * iVar76 |
                               (uint)!bVar22 * *(int *)(local_830.ray + 0x3ac);
                          *(uint *)(local_830.ray + 0x3b0) =
                               (uint)bVar23 * iVar77 |
                               (uint)!bVar23 * *(int *)(local_830.ray + 0x3b0);
                          *(uint *)(local_830.ray + 0x3b4) =
                               (uint)bVar24 * iVar78 |
                               (uint)!bVar24 * *(int *)(local_830.ray + 0x3b4);
                          *(uint *)(local_830.ray + 0x3b8) =
                               (uint)bVar25 * iVar79 |
                               (uint)!bVar25 * *(int *)(local_830.ray + 0x3b8);
                          *(uint *)(local_830.ray + 0x3bc) =
                               (uint)bVar26 * iVar80 |
                               (uint)!bVar26 * *(int *)(local_830.ray + 0x3bc);
                          iVar1 = *(int *)(local_830.hit + 0xc4);
                          iVar2 = *(int *)(local_830.hit + 200);
                          iVar68 = *(int *)(local_830.hit + 0xcc);
                          iVar69 = *(int *)(local_830.hit + 0xd0);
                          iVar70 = *(int *)(local_830.hit + 0xd4);
                          iVar71 = *(int *)(local_830.hit + 0xd8);
                          iVar72 = *(int *)(local_830.hit + 0xdc);
                          iVar73 = *(int *)(local_830.hit + 0xe0);
                          iVar74 = *(int *)(local_830.hit + 0xe4);
                          iVar75 = *(int *)(local_830.hit + 0xe8);
                          iVar76 = *(int *)(local_830.hit + 0xec);
                          iVar77 = *(int *)(local_830.hit + 0xf0);
                          iVar78 = *(int *)(local_830.hit + 0xf4);
                          iVar79 = *(int *)(local_830.hit + 0xf8);
                          iVar80 = *(int *)(local_830.hit + 0xfc);
                          bVar13 = (bool)((byte)(uVar85 >> 1) & 1);
                          bVar14 = (bool)((byte)(uVar85 >> 2) & 1);
                          bVar15 = (bool)((byte)(uVar85 >> 3) & 1);
                          bVar16 = (bool)((byte)(uVar85 >> 4) & 1);
                          bVar17 = (bool)((byte)(uVar85 >> 5) & 1);
                          bVar18 = (bool)((byte)(uVar85 >> 6) & 1);
                          bVar19 = (bool)((byte)(uVar85 >> 7) & 1);
                          bVar20 = (bool)((byte)(uVar85 >> 9) & 1);
                          bVar21 = (bool)((byte)(uVar85 >> 10) & 1);
                          bVar22 = (bool)((byte)(uVar85 >> 0xb) & 1);
                          bVar23 = (bool)((byte)(uVar85 >> 0xc) & 1);
                          bVar24 = (bool)((byte)(uVar85 >> 0xd) & 1);
                          bVar25 = (bool)((byte)(uVar85 >> 0xe) & 1);
                          bVar26 = SUB81(uVar85 >> 0xf,0);
                          *(uint *)(local_830.ray + 0x3c0) =
                               (uint)(bVar90 & 1) * *(int *)(local_830.hit + 0xc0) |
                               (uint)!(bool)(bVar90 & 1) * *(int *)(local_830.ray + 0x3c0);
                          *(uint *)(local_830.ray + 0x3c4) =
                               (uint)bVar13 * iVar1 |
                               (uint)!bVar13 * *(int *)(local_830.ray + 0x3c4);
                          *(uint *)(local_830.ray + 0x3c8) =
                               (uint)bVar14 * iVar2 |
                               (uint)!bVar14 * *(int *)(local_830.ray + 0x3c8);
                          *(uint *)(local_830.ray + 0x3cc) =
                               (uint)bVar15 * iVar68 |
                               (uint)!bVar15 * *(int *)(local_830.ray + 0x3cc);
                          *(uint *)(local_830.ray + 0x3d0) =
                               (uint)bVar16 * iVar69 |
                               (uint)!bVar16 * *(int *)(local_830.ray + 0x3d0);
                          *(uint *)(local_830.ray + 0x3d4) =
                               (uint)bVar17 * iVar70 |
                               (uint)!bVar17 * *(int *)(local_830.ray + 0x3d4);
                          *(uint *)(local_830.ray + 0x3d8) =
                               (uint)bVar18 * iVar71 |
                               (uint)!bVar18 * *(int *)(local_830.ray + 0x3d8);
                          *(uint *)(local_830.ray + 0x3dc) =
                               (uint)bVar19 * iVar72 |
                               (uint)!bVar19 * *(int *)(local_830.ray + 0x3dc);
                          *(uint *)(local_830.ray + 0x3e0) =
                               (uint)(bVar82 & 1) * iVar73 |
                               (uint)!(bool)(bVar82 & 1) * *(int *)(local_830.ray + 0x3e0);
                          *(uint *)(local_830.ray + 0x3e4) =
                               (uint)bVar20 * iVar74 |
                               (uint)!bVar20 * *(int *)(local_830.ray + 0x3e4);
                          *(uint *)(local_830.ray + 1000) =
                               (uint)bVar21 * iVar75 |
                               (uint)!bVar21 * *(int *)(local_830.ray + 1000);
                          *(uint *)(local_830.ray + 0x3ec) =
                               (uint)bVar22 * iVar76 |
                               (uint)!bVar22 * *(int *)(local_830.ray + 0x3ec);
                          *(uint *)(local_830.ray + 0x3f0) =
                               (uint)bVar23 * iVar77 |
                               (uint)!bVar23 * *(int *)(local_830.ray + 0x3f0);
                          *(uint *)(local_830.ray + 0x3f4) =
                               (uint)bVar24 * iVar78 |
                               (uint)!bVar24 * *(int *)(local_830.ray + 0x3f4);
                          *(uint *)(local_830.ray + 0x3f8) =
                               (uint)bVar25 * iVar79 |
                               (uint)!bVar25 * *(int *)(local_830.ray + 0x3f8);
                          *(uint *)(local_830.ray + 0x3fc) =
                               (uint)bVar26 * iVar80 |
                               (uint)!bVar26 * *(int *)(local_830.ray + 0x3fc);
                          iVar1 = *(int *)(local_830.hit + 0x104);
                          iVar2 = *(int *)(local_830.hit + 0x108);
                          iVar68 = *(int *)(local_830.hit + 0x10c);
                          iVar69 = *(int *)(local_830.hit + 0x110);
                          iVar70 = *(int *)(local_830.hit + 0x114);
                          iVar71 = *(int *)(local_830.hit + 0x118);
                          iVar72 = *(int *)(local_830.hit + 0x11c);
                          iVar73 = *(int *)(local_830.hit + 0x120);
                          iVar74 = *(int *)(local_830.hit + 0x124);
                          iVar75 = *(int *)(local_830.hit + 0x128);
                          iVar76 = *(int *)(local_830.hit + 300);
                          iVar77 = *(int *)(local_830.hit + 0x130);
                          iVar78 = *(int *)(local_830.hit + 0x134);
                          iVar79 = *(int *)(local_830.hit + 0x138);
                          iVar80 = *(int *)(local_830.hit + 0x13c);
                          bVar13 = (bool)((byte)(uVar85 >> 1) & 1);
                          bVar14 = (bool)((byte)(uVar85 >> 2) & 1);
                          bVar15 = (bool)((byte)(uVar85 >> 3) & 1);
                          bVar16 = (bool)((byte)(uVar85 >> 4) & 1);
                          bVar17 = (bool)((byte)(uVar85 >> 5) & 1);
                          bVar18 = (bool)((byte)(uVar85 >> 6) & 1);
                          bVar19 = (bool)((byte)(uVar85 >> 7) & 1);
                          bVar20 = (bool)((byte)(uVar85 >> 9) & 1);
                          bVar21 = (bool)((byte)(uVar85 >> 10) & 1);
                          bVar22 = (bool)((byte)(uVar85 >> 0xb) & 1);
                          bVar23 = (bool)((byte)(uVar85 >> 0xc) & 1);
                          bVar24 = (bool)((byte)(uVar85 >> 0xd) & 1);
                          bVar25 = (bool)((byte)(uVar85 >> 0xe) & 1);
                          bVar26 = SUB81(uVar85 >> 0xf,0);
                          *(uint *)(local_830.ray + 0x400) =
                               (uint)(bVar90 & 1) * *(int *)(local_830.hit + 0x100) |
                               (uint)!(bool)(bVar90 & 1) * *(int *)(local_830.ray + 0x400);
                          *(uint *)(local_830.ray + 0x404) =
                               (uint)bVar13 * iVar1 |
                               (uint)!bVar13 * *(int *)(local_830.ray + 0x404);
                          *(uint *)(local_830.ray + 0x408) =
                               (uint)bVar14 * iVar2 |
                               (uint)!bVar14 * *(int *)(local_830.ray + 0x408);
                          *(uint *)(local_830.ray + 0x40c) =
                               (uint)bVar15 * iVar68 |
                               (uint)!bVar15 * *(int *)(local_830.ray + 0x40c);
                          *(uint *)(local_830.ray + 0x410) =
                               (uint)bVar16 * iVar69 |
                               (uint)!bVar16 * *(int *)(local_830.ray + 0x410);
                          *(uint *)(local_830.ray + 0x414) =
                               (uint)bVar17 * iVar70 |
                               (uint)!bVar17 * *(int *)(local_830.ray + 0x414);
                          *(uint *)(local_830.ray + 0x418) =
                               (uint)bVar18 * iVar71 |
                               (uint)!bVar18 * *(int *)(local_830.ray + 0x418);
                          *(uint *)(local_830.ray + 0x41c) =
                               (uint)bVar19 * iVar72 |
                               (uint)!bVar19 * *(int *)(local_830.ray + 0x41c);
                          *(uint *)(local_830.ray + 0x420) =
                               (uint)(bVar82 & 1) * iVar73 |
                               (uint)!(bool)(bVar82 & 1) * *(int *)(local_830.ray + 0x420);
                          *(uint *)(local_830.ray + 0x424) =
                               (uint)bVar20 * iVar74 |
                               (uint)!bVar20 * *(int *)(local_830.ray + 0x424);
                          *(uint *)(local_830.ray + 0x428) =
                               (uint)bVar21 * iVar75 |
                               (uint)!bVar21 * *(int *)(local_830.ray + 0x428);
                          *(uint *)(local_830.ray + 0x42c) =
                               (uint)bVar22 * iVar76 |
                               (uint)!bVar22 * *(int *)(local_830.ray + 0x42c);
                          *(uint *)(local_830.ray + 0x430) =
                               (uint)bVar23 * iVar77 |
                               (uint)!bVar23 * *(int *)(local_830.ray + 0x430);
                          *(uint *)(local_830.ray + 0x434) =
                               (uint)bVar24 * iVar78 |
                               (uint)!bVar24 * *(int *)(local_830.ray + 0x434);
                          *(uint *)(local_830.ray + 0x438) =
                               (uint)bVar25 * iVar79 |
                               (uint)!bVar25 * *(int *)(local_830.ray + 0x438);
                          *(uint *)(local_830.ray + 0x43c) =
                               (uint)bVar26 * iVar80 |
                               (uint)!bVar26 * *(int *)(local_830.ray + 0x43c);
                          auVar177 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_830.hit + 0x140)
                                                      );
                          auVar177 = vmovdqu32_avx512f(auVar177);
                          *(undefined1 (*) [64])(local_830.ray + 0x440) = auVar177;
                          auVar177 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_830.hit + 0x180)
                                                      );
                          auVar177 = vmovdqu32_avx512f(auVar177);
                          *(undefined1 (*) [64])(local_830.ray + 0x480) = auVar177;
                          auVar177 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_830.hit + 0x1c0)
                                                      );
                          auVar177 = vmovdqa32_avx512f(auVar177);
                          *(undefined1 (*) [64])(local_830.ray + 0x4c0) = auVar177;
                          auVar177 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_830.hit + 0x200)
                                                      );
                          auVar177 = vmovdqa32_avx512f(auVar177);
                          *(undefined1 (*) [64])(local_830.ray + 0x500) = auVar177;
                          local_800._0_4_ = *(undefined4 *)(ray + k * 4 + 0x200);
                          local_800._4_4_ = 0;
                          local_800._8_4_ = 0;
                          local_800._12_4_ = 0;
                        }
                        bVar90 = ~(byte)(1 << ((uint)uVar83 & 0x1f)) & (byte)uVar92;
                        auVar173._4_4_ = local_800._0_4_;
                        auVar173._0_4_ = local_800._0_4_;
                        auVar173._8_4_ = local_800._0_4_;
                        auVar173._12_4_ = local_800._0_4_;
                        auVar173._16_4_ = local_800._0_4_;
                        auVar173._20_4_ = local_800._0_4_;
                        auVar173._24_4_ = local_800._0_4_;
                        auVar173._28_4_ = local_800._0_4_;
                        uVar180 = vcmpps_avx512vl(auVar222._0_32_,auVar173,2);
                        if ((bVar90 & (byte)uVar180) == 0) goto LAB_018b564f;
                        bVar90 = bVar90 & (byte)uVar180;
                        uVar92 = (ulong)bVar90;
                        auVar174._8_4_ = 0x7f800000;
                        auVar174._0_8_ = 0x7f8000007f800000;
                        auVar174._12_4_ = 0x7f800000;
                        auVar174._16_4_ = 0x7f800000;
                        auVar174._20_4_ = 0x7f800000;
                        auVar174._24_4_ = 0x7f800000;
                        auVar174._28_4_ = 0x7f800000;
                        auVar129 = vblendmps_avx512vl(auVar174,auVar222._0_32_);
                        auVar153._0_4_ =
                             (uint)(bVar90 & 1) * auVar129._0_4_ |
                             (uint)!(bool)(bVar90 & 1) * 0x7f800000;
                        bVar13 = (bool)(bVar90 >> 1 & 1);
                        auVar153._4_4_ = (uint)bVar13 * auVar129._4_4_ | (uint)!bVar13 * 0x7f800000;
                        bVar13 = (bool)(bVar90 >> 2 & 1);
                        auVar153._8_4_ = (uint)bVar13 * auVar129._8_4_ | (uint)!bVar13 * 0x7f800000;
                        bVar13 = (bool)(bVar90 >> 3 & 1);
                        auVar153._12_4_ =
                             (uint)bVar13 * auVar129._12_4_ | (uint)!bVar13 * 0x7f800000;
                        bVar13 = (bool)(bVar90 >> 4 & 1);
                        auVar153._16_4_ =
                             (uint)bVar13 * auVar129._16_4_ | (uint)!bVar13 * 0x7f800000;
                        bVar13 = (bool)(bVar90 >> 5 & 1);
                        auVar153._20_4_ =
                             (uint)bVar13 * auVar129._20_4_ | (uint)!bVar13 * 0x7f800000;
                        bVar13 = (bool)(bVar90 >> 6 & 1);
                        auVar153._24_4_ =
                             (uint)bVar13 * auVar129._24_4_ | (uint)!bVar13 * 0x7f800000;
                        auVar153._28_4_ =
                             (uint)(bVar90 >> 7) * auVar129._28_4_ |
                             (uint)!(bool)(bVar90 >> 7) * 0x7f800000;
                        auVar129 = vshufps_avx(auVar153,auVar153,0xb1);
                        auVar129 = vminps_avx(auVar153,auVar129);
                        auVar130 = vshufpd_avx(auVar129,auVar129,5);
                        auVar129 = vminps_avx(auVar129,auVar130);
                        auVar130 = vpermpd_avx2(auVar129,0x4e);
                        auVar129 = vminps_avx(auVar129,auVar130);
                        uVar180 = vcmpps_avx512vl(auVar153,auVar129,0);
                        bVar82 = (byte)uVar180 & bVar90;
                        if (bVar82 != 0) {
                          bVar90 = bVar82;
                        }
                        uVar91 = 0;
                        for (uVar84 = (uint)bVar90; (uVar84 & 1) == 0;
                            uVar84 = uVar84 >> 1 | 0x80000000) {
                          uVar91 = uVar91 + 1;
                        }
                        uVar83 = (ulong)uVar91;
                      } while( true );
                    }
                    fVar186 = local_520[uVar83];
                    uVar178 = *(undefined4 *)(local_500 + uVar83 * 4);
                    fVar226 = 1.0 - fVar186;
                    fVar225 = fVar226 * fVar226 * -3.0;
                    auVar212 = ZEXT464((uint)fVar225);
                    auVar107 = vfmadd231ss_fma(ZEXT416((uint)(fVar226 * fVar226)),
                                               ZEXT416((uint)(fVar186 * fVar226)),
                                               ZEXT416(0xc0000000));
                    auVar110 = vfmsub132ss_fma(ZEXT416((uint)(fVar186 * fVar226)),
                                               ZEXT416((uint)(fVar186 * fVar186)),
                                               ZEXT416(0x40000000));
                    fVar226 = auVar107._0_4_ * 3.0;
                    fVar179 = auVar110._0_4_ * 3.0;
                    fVar185 = fVar186 * fVar186 * 3.0;
                    auVar216._0_4_ = fVar185 * fVar27;
                    auVar216._4_4_ = fVar185 * fVar65;
                    auVar216._8_4_ = fVar185 * fVar66;
                    auVar216._12_4_ = fVar185 * fVar67;
                    auVar219 = ZEXT1664(auVar216);
                    auVar190._4_4_ = fVar179;
                    auVar190._0_4_ = fVar179;
                    auVar190._8_4_ = fVar179;
                    auVar190._12_4_ = fVar179;
                    auVar107 = vfmadd132ps_fma(auVar190,auVar216,auVar104);
                    auVar201._4_4_ = fVar226;
                    auVar201._0_4_ = fVar226;
                    auVar201._8_4_ = fVar226;
                    auVar201._12_4_ = fVar226;
                    auVar107 = vfmadd132ps_fma(auVar201,auVar107,auVar6);
                    auVar191._4_4_ = fVar225;
                    auVar191._0_4_ = fVar225;
                    auVar191._8_4_ = fVar225;
                    auVar191._12_4_ = fVar225;
                    auVar107 = vfmadd132ps_fma(auVar191,auVar107,auVar108);
                    *(undefined4 *)(ray + k * 4 + 0x200) = *(undefined4 *)(local_4e0 + uVar83 * 4);
                    *(int *)(ray + k * 4 + 0x300) = auVar107._0_4_;
                    uVar9 = vextractps_avx(auVar107,1);
                    *(undefined4 *)(ray + k * 4 + 0x340) = uVar9;
                    uVar9 = vextractps_avx(auVar107,2);
                    *(undefined4 *)(ray + k * 4 + 0x380) = uVar9;
                    *(float *)(ray + k * 4 + 0x3c0) = fVar186;
                    *(undefined4 *)(ray + k * 4 + 0x400) = uVar178;
                    *(int *)(ray + k * 4 + 0x440) = (int)uVar85;
                    *(uint *)(ray + k * 4 + 0x480) = uVar7;
                    *(uint *)(ray + k * 4 + 0x4c0) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x500) = context->user->instPrimID[0];
                  }
                }
              }
            }
          }
        }
        goto LAB_018b528c;
      }
    }
    uVar178 = *(undefined4 *)(ray + k * 4 + 0x200);
    auVar32._4_4_ = uVar178;
    auVar32._0_4_ = uVar178;
    auVar32._8_4_ = uVar178;
    auVar32._12_4_ = uVar178;
    uVar180 = vcmpps_avx512vl(local_4b0,auVar32,2);
    local_7c8 = (ulong)((uint)local_7c8 & (uint)local_7c8 + 0xf & (uint)uVar180);
  } while( true );
LAB_018b564f:
  auVar107 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar240 = ZEXT1664(auVar107);
  auVar177 = ZEXT464(0xbf800000);
  uVar85 = local_7d8;
LAB_018b528c:
  lVar86 = lVar86 + 8;
  goto LAB_018b49b0;
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time()[k]);

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }